

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O3

void embree::avx::CurveNiMBIntersectorK<4,4>::
     intersect_hn<embree::avx::OrientedCurve1IntersectorK<embree::HermiteCurveT,4>,embree::avx::Intersect1KEpilog1<4,true>>
               (Precalculations *pre,RayHitK<4> *ray,size_t k,RayQueryContext *context,
               Primitive *prim)

{
  float *pfVar1;
  float *pfVar2;
  undefined4 uVar3;
  undefined8 uVar4;
  Primitive PVar5;
  uint uVar6;
  Geometry *pGVar7;
  __int_type_conflict _Var8;
  long lVar9;
  RTCFilterFunctionN p_Var10;
  long lVar11;
  __int_type_conflict _Var12;
  long lVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [16];
  undefined1 auVar53 [12];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  uint uVar63;
  uint uVar64;
  ulong uVar65;
  long lVar66;
  ulong uVar67;
  long lVar68;
  byte bVar69;
  uint uVar70;
  uint uVar71;
  float fVar111;
  vint4 bi_1;
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar89 [16];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  float fVar112;
  undefined8 extraout_XMM1_Qa;
  vint4 bi;
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [32];
  undefined1 auVar130 [16];
  undefined1 auVar148 [32];
  undefined1 auVar149 [32];
  undefined1 auVar150 [32];
  undefined1 extraout_var [56];
  float fVar151;
  float fVar186;
  float fVar187;
  vint4 bi_2;
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [32];
  undefined1 auVar185 [32];
  float fVar188;
  float fVar208;
  float fVar209;
  vint4 ai_1;
  undefined1 auVar189 [16];
  float fVar211;
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  float fVar210;
  float fVar212;
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [32];
  float fVar213;
  float fVar235;
  float fVar236;
  vint4 ai_2;
  undefined1 auVar214 [16];
  float fVar237;
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [32];
  undefined1 auVar234 [32];
  float fVar238;
  float fVar250;
  float fVar251;
  undefined1 auVar239 [16];
  float fVar252;
  undefined1 auVar240 [16];
  undefined1 auVar241 [16];
  undefined1 auVar242 [16];
  undefined1 auVar243 [16];
  undefined1 auVar244 [16];
  undefined1 auVar245 [16];
  undefined1 auVar246 [16];
  undefined1 auVar247 [16];
  undefined1 auVar248 [32];
  undefined1 auVar249 [32];
  float fVar263;
  vfloat4 a0_1;
  undefined1 auVar253 [16];
  undefined1 auVar254 [16];
  undefined1 auVar255 [16];
  float fVar264;
  undefined1 auVar256 [16];
  undefined1 auVar257 [16];
  undefined1 auVar258 [16];
  undefined1 auVar259 [16];
  undefined1 auVar260 [16];
  undefined1 auVar261 [16];
  undefined1 auVar265 [16];
  vint4 ai;
  undefined1 auVar266 [16];
  undefined1 auVar267 [16];
  undefined1 auVar268 [16];
  undefined1 auVar269 [16];
  undefined1 auVar270 [16];
  undefined1 auVar271 [16];
  undefined1 auVar272 [16];
  undefined1 auVar273 [16];
  undefined1 auVar274 [16];
  undefined1 auVar275 [16];
  undefined1 auVar276 [16];
  undefined1 auVar277 [16];
  undefined1 auVar278 [16];
  undefined1 auVar279 [16];
  undefined1 auVar280 [16];
  undefined1 auVar281 [32];
  undefined1 auVar282 [16];
  undefined1 auVar283 [16];
  undefined1 auVar284 [16];
  undefined1 auVar285 [16];
  undefined1 auVar286 [16];
  undefined1 auVar287 [16];
  undefined1 auVar288 [16];
  undefined1 auVar289 [16];
  undefined1 auVar290 [32];
  float fVar291;
  float fVar301;
  float fVar303;
  undefined1 auVar292 [16];
  undefined1 auVar293 [16];
  undefined1 auVar294 [16];
  undefined1 auVar295 [16];
  undefined1 auVar296 [16];
  undefined1 auVar297 [16];
  undefined1 auVar298 [16];
  float fVar306;
  float fVar307;
  float fVar308;
  undefined1 auVar299 [32];
  float fVar302;
  float fVar304;
  float fVar305;
  undefined1 auVar300 [32];
  undefined1 auVar309 [16];
  undefined1 auVar310 [16];
  undefined1 auVar311 [16];
  undefined1 auVar312 [16];
  undefined1 auVar313 [16];
  undefined1 auVar314 [16];
  undefined1 auVar315 [32];
  undefined1 auVar316 [16];
  undefined1 auVar322 [32];
  undefined1 auVar317 [16];
  undefined1 auVar318 [16];
  undefined1 auVar319 [16];
  undefined1 auVar320 [16];
  undefined1 auVar321 [16];
  float fVar324;
  undefined1 auVar323 [64];
  float fVar325;
  float fVar331;
  float fVar332;
  undefined1 auVar326 [16];
  float fVar333;
  undefined1 auVar327 [16];
  undefined1 auVar328 [16];
  undefined1 auVar329 [16];
  undefined1 auVar330 [16];
  float fVar334;
  float fVar335;
  float fVar336;
  float fVar337;
  float fVar338;
  float fVar345;
  float fVar346;
  undefined1 auVar339 [16];
  float fVar347;
  undefined1 auVar340 [16];
  undefined1 auVar341 [16];
  undefined1 auVar342 [16];
  undefined1 auVar343 [16];
  undefined1 auVar344 [16];
  float fVar348;
  float fVar349;
  float fVar356;
  float fVar357;
  float fVar358;
  undefined1 auVar350 [16];
  undefined1 auVar351 [16];
  undefined1 auVar352 [16];
  undefined1 auVar353 [16];
  undefined1 auVar354 [16];
  float fVar359;
  float fVar360;
  float fVar364;
  float fVar366;
  vfloat4 a0;
  float fVar369;
  undefined1 auVar361 [16];
  float fVar368;
  undefined1 auVar362 [16];
  float fVar365;
  float fVar367;
  float fVar370;
  undefined1 auVar363 [64];
  vfloat_impl<4> p01;
  vfloat_impl<4> p00;
  vfloat_impl<4> p02;
  vfloat_impl<4> p03;
  RTCFilterFunctionNArguments args;
  uint mask_stack [4];
  BBox1f cu_stack [4];
  BBox1f cv_stack [4];
  float local_5d8;
  float fStack_5d4;
  float fStack_5d0;
  float fStack_5cc;
  undefined1 local_5c8 [8];
  float fStack_5c0;
  float fStack_5bc;
  float local_588;
  float fStack_584;
  float fStack_580;
  float fStack_57c;
  float local_558;
  float fStack_554;
  float fStack_550;
  float fStack_54c;
  float fStack_548;
  float fStack_544;
  float fStack_540;
  float local_538;
  float fStack_534;
  float fStack_530;
  float fStack_52c;
  float fStack_528;
  float fStack_524;
  float fStack_520;
  undefined1 local_518 [8];
  float fStack_510;
  float fStack_50c;
  float local_4f8;
  float fStack_4f4;
  float fStack_4f0;
  float fStack_4ec;
  float fStack_4e8;
  float fStack_4e4;
  float fStack_4e0;
  float local_4d8;
  float fStack_4d4;
  float fStack_4d0;
  float fStack_4cc;
  undefined1 local_458 [8];
  float fStack_450;
  float fStack_44c;
  float local_448;
  float fStack_444;
  float fStack_440;
  float fStack_43c;
  undefined1 local_438 [16];
  undefined1 (*local_420) [16];
  Primitive *local_418;
  ulong local_410;
  RTCFilterFunctionNArguments local_408;
  float local_3d8;
  float fStack_3d4;
  float fStack_3d0;
  float fStack_3cc;
  undefined1 local_3c8 [8];
  float fStack_3c0;
  float fStack_3bc;
  undefined1 local_3b8 [8];
  float fStack_3b0;
  float fStack_3ac;
  undefined1 local_3a8 [8];
  float fStack_3a0;
  float fStack_39c;
  undefined1 local_398 [8];
  float fStack_390;
  float fStack_38c;
  uint auStack_388 [4];
  undefined1 local_378 [16];
  undefined1 local_368 [16];
  undefined1 local_358 [16];
  undefined1 local_348 [8];
  float fStack_340;
  float fStack_33c;
  undefined1 local_338 [8];
  float fStack_330;
  float fStack_32c;
  undefined1 local_328 [8];
  float fStack_320;
  float fStack_31c;
  undefined1 local_318 [8];
  float fStack_310;
  float fStack_30c;
  undefined1 local_308 [16];
  undefined1 local_2f8 [16];
  undefined1 local_2e8 [16];
  undefined1 local_2d8 [16];
  undefined1 local_2c8 [16];
  undefined1 local_2b8 [16];
  undefined1 local_2a8 [16];
  undefined1 local_298 [16];
  undefined1 local_288 [16];
  undefined1 local_278 [8];
  float fStack_270;
  float fStack_26c;
  undefined1 local_268 [8];
  float fStack_260;
  float fStack_25c;
  undefined1 local_258 [8];
  float fStack_250;
  float fStack_24c;
  undefined1 local_248 [32];
  undefined1 local_228 [32];
  float afStack_208 [8];
  RTCHitN local_1e8 [16];
  undefined1 local_1d8 [16];
  undefined1 local_1c8 [16];
  undefined1 local_1b8 [16];
  undefined1 local_1a8 [16];
  undefined8 local_198;
  undefined8 uStack_190;
  undefined8 local_188;
  undefined8 uStack_180;
  uint local_178;
  uint uStack_174;
  uint uStack_170;
  uint uStack_16c;
  uint uStack_168;
  uint uStack_164;
  uint uStack_160;
  uint uStack_15c;
  undefined1 local_158 [32];
  float local_138;
  float fStack_134;
  float fStack_130;
  float fStack_12c;
  float fStack_128;
  float fStack_124;
  float fStack_120;
  float fStack_11c;
  float local_118;
  float fStack_114;
  float fStack_110;
  float fStack_10c;
  float fStack_108;
  float fStack_104;
  float fStack_100;
  float fStack_fc;
  float local_f8;
  float fStack_f4;
  float fStack_f0;
  float fStack_ec;
  float fStack_e8;
  float fStack_e4;
  float fStack_e0;
  float fStack_dc;
  float local_d8;
  float fStack_d4;
  float fStack_d0;
  float fStack_cc;
  float fStack_c8;
  float fStack_c4;
  float fStack_c0;
  float fStack_bc;
  undefined1 local_b8 [32];
  undefined1 local_98 [32];
  undefined1 local_78 [32];
  ulong auStack_58 [5];
  undefined1 auVar262 [32];
  undefined1 auVar355 [32];
  
  PVar5 = prim[1];
  uVar65 = (ulong)(byte)PVar5;
  lVar66 = uVar65 * 0x25;
  fVar112 = *(float *)(prim + lVar66 + 0x12);
  auVar83 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                          0x10);
  auVar83 = vinsertps_avx(auVar83,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x20);
  auVar119 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                           ZEXT416(*(uint *)(ray + k * 4 + 0x50)),0x10);
  auVar119 = vinsertps_avx(auVar119,ZEXT416(*(uint *)(ray + k * 4 + 0x60)),0x20);
  auVar83 = vsubps_avx(auVar83,*(undefined1 (*) [16])(prim + lVar66 + 6));
  auVar113._0_4_ = fVar112 * auVar83._0_4_;
  auVar113._4_4_ = fVar112 * auVar83._4_4_;
  auVar113._8_4_ = fVar112 * auVar83._8_4_;
  auVar113._12_4_ = fVar112 * auVar83._12_4_;
  auVar266._0_4_ = fVar112 * auVar119._0_4_;
  auVar266._4_4_ = fVar112 * auVar119._4_4_;
  auVar266._8_4_ = fVar112 * auVar119._8_4_;
  auVar266._12_4_ = fVar112 * auVar119._12_4_;
  auVar83 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar65 * 4 + 6)));
  auVar83 = vcvtdq2ps_avx(auVar83);
  auVar119 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar65 * 5 + 6)));
  auVar119 = vcvtdq2ps_avx(auVar119);
  auVar183 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar65 * 6 + 6)));
  auVar183 = vcvtdq2ps_avx(auVar183);
  auVar14 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar65 * 0xf + 6)));
  auVar15 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)PVar5 * 0x10 + 6)));
  auVar14 = vcvtdq2ps_avx(auVar14);
  auVar200 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)PVar5 * 0x10 + uVar65 + 6)));
  auVar15 = vcvtdq2ps_avx(auVar15);
  auVar200 = vcvtdq2ps_avx(auVar200);
  auVar120 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar65 * 0x1a + 6)));
  auVar120 = vcvtdq2ps_avx(auVar120);
  auVar143 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar65 * 0x1b + 6)));
  auVar143 = vcvtdq2ps_avx(auVar143);
  auVar132 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar65 * 0x1c + 6)));
  auVar132 = vcvtdq2ps_avx(auVar132);
  auVar169 = vshufps_avx(auVar266,auVar266,0);
  auVar82 = vshufps_avx(auVar266,auVar266,0x55);
  auVar265 = vshufps_avx(auVar266,auVar266,0xaa);
  fVar112 = auVar265._0_4_;
  fVar151 = auVar265._4_4_;
  fVar186 = auVar265._8_4_;
  fVar187 = auVar265._12_4_;
  fVar213 = auVar82._0_4_;
  fVar235 = auVar82._4_4_;
  fVar236 = auVar82._8_4_;
  fVar237 = auVar82._12_4_;
  fVar188 = auVar169._0_4_;
  fVar208 = auVar169._4_4_;
  fVar209 = auVar169._8_4_;
  fVar211 = auVar169._12_4_;
  auVar326._0_4_ = fVar188 * auVar83._0_4_ + fVar213 * auVar119._0_4_ + fVar112 * auVar183._0_4_;
  auVar326._4_4_ = fVar208 * auVar83._4_4_ + fVar235 * auVar119._4_4_ + fVar151 * auVar183._4_4_;
  auVar326._8_4_ = fVar209 * auVar83._8_4_ + fVar236 * auVar119._8_4_ + fVar186 * auVar183._8_4_;
  auVar326._12_4_ = fVar211 * auVar83._12_4_ + fVar237 * auVar119._12_4_ + fVar187 * auVar183._12_4_
  ;
  auVar339._0_4_ = fVar188 * auVar14._0_4_ + fVar213 * auVar15._0_4_ + auVar200._0_4_ * fVar112;
  auVar339._4_4_ = fVar208 * auVar14._4_4_ + fVar235 * auVar15._4_4_ + auVar200._4_4_ * fVar151;
  auVar339._8_4_ = fVar209 * auVar14._8_4_ + fVar236 * auVar15._8_4_ + auVar200._8_4_ * fVar186;
  auVar339._12_4_ = fVar211 * auVar14._12_4_ + fVar237 * auVar15._12_4_ + auVar200._12_4_ * fVar187;
  auVar267._0_4_ = fVar188 * auVar120._0_4_ + fVar213 * auVar143._0_4_ + auVar132._0_4_ * fVar112;
  auVar267._4_4_ = fVar208 * auVar120._4_4_ + fVar235 * auVar143._4_4_ + auVar132._4_4_ * fVar151;
  auVar267._8_4_ = fVar209 * auVar120._8_4_ + fVar236 * auVar143._8_4_ + auVar132._8_4_ * fVar186;
  auVar267._12_4_ =
       fVar211 * auVar120._12_4_ + fVar237 * auVar143._12_4_ + auVar132._12_4_ * fVar187;
  auVar169 = vshufps_avx(auVar113,auVar113,0);
  auVar82 = vshufps_avx(auVar113,auVar113,0x55);
  auVar265 = vshufps_avx(auVar113,auVar113,0xaa);
  fVar112 = auVar265._0_4_;
  fVar151 = auVar265._4_4_;
  fVar186 = auVar265._8_4_;
  fVar187 = auVar265._12_4_;
  fVar213 = auVar82._0_4_;
  fVar235 = auVar82._4_4_;
  fVar236 = auVar82._8_4_;
  fVar237 = auVar82._12_4_;
  fVar188 = auVar169._0_4_;
  fVar208 = auVar169._4_4_;
  fVar209 = auVar169._8_4_;
  fVar211 = auVar169._12_4_;
  auVar114._0_4_ = fVar188 * auVar83._0_4_ + fVar213 * auVar119._0_4_ + fVar112 * auVar183._0_4_;
  auVar114._4_4_ = fVar208 * auVar83._4_4_ + fVar235 * auVar119._4_4_ + fVar151 * auVar183._4_4_;
  auVar114._8_4_ = fVar209 * auVar83._8_4_ + fVar236 * auVar119._8_4_ + fVar186 * auVar183._8_4_;
  auVar114._12_4_ = fVar211 * auVar83._12_4_ + fVar237 * auVar119._12_4_ + fVar187 * auVar183._12_4_
  ;
  auVar72._0_4_ = fVar188 * auVar14._0_4_ + auVar200._0_4_ * fVar112 + fVar213 * auVar15._0_4_;
  auVar72._4_4_ = fVar208 * auVar14._4_4_ + auVar200._4_4_ * fVar151 + fVar235 * auVar15._4_4_;
  auVar72._8_4_ = fVar209 * auVar14._8_4_ + auVar200._8_4_ * fVar186 + fVar236 * auVar15._8_4_;
  auVar72._12_4_ = fVar211 * auVar14._12_4_ + auVar200._12_4_ * fVar187 + fVar237 * auVar15._12_4_;
  auVar282._8_4_ = 0x7fffffff;
  auVar282._0_8_ = 0x7fffffff7fffffff;
  auVar282._12_4_ = 0x7fffffff;
  auVar83 = vandps_avx(auVar326,auVar282);
  auVar214._8_4_ = 0x219392ef;
  auVar214._0_8_ = 0x219392ef219392ef;
  auVar214._12_4_ = 0x219392ef;
  auVar83 = vcmpps_avx(auVar83,auVar214,1);
  auVar119 = vblendvps_avx(auVar326,auVar214,auVar83);
  auVar83 = vandps_avx(auVar339,auVar282);
  auVar83 = vcmpps_avx(auVar83,auVar214,1);
  auVar183 = vblendvps_avx(auVar339,auVar214,auVar83);
  auVar83 = vandps_avx(auVar282,auVar267);
  auVar83 = vcmpps_avx(auVar83,auVar214,1);
  auVar83 = vblendvps_avx(auVar267,auVar214,auVar83);
  auVar152._0_4_ = fVar188 * auVar120._0_4_ + fVar213 * auVar143._0_4_ + auVar132._0_4_ * fVar112;
  auVar152._4_4_ = fVar208 * auVar120._4_4_ + fVar235 * auVar143._4_4_ + auVar132._4_4_ * fVar151;
  auVar152._8_4_ = fVar209 * auVar120._8_4_ + fVar236 * auVar143._8_4_ + auVar132._8_4_ * fVar186;
  auVar152._12_4_ =
       fVar211 * auVar120._12_4_ + fVar237 * auVar143._12_4_ + auVar132._12_4_ * fVar187;
  auVar14 = vrcpps_avx(auVar119);
  fVar188 = auVar14._0_4_;
  auVar189._0_4_ = fVar188 * auVar119._0_4_;
  fVar208 = auVar14._4_4_;
  auVar189._4_4_ = fVar208 * auVar119._4_4_;
  fVar209 = auVar14._8_4_;
  auVar189._8_4_ = fVar209 * auVar119._8_4_;
  fVar211 = auVar14._12_4_;
  auVar189._12_4_ = fVar211 * auVar119._12_4_;
  auVar283._8_4_ = 0x3f800000;
  auVar283._0_8_ = 0x3f8000003f800000;
  auVar283._12_4_ = 0x3f800000;
  auVar119 = vsubps_avx(auVar283,auVar189);
  fVar188 = fVar188 + fVar188 * auVar119._0_4_;
  fVar208 = fVar208 + fVar208 * auVar119._4_4_;
  fVar209 = fVar209 + fVar209 * auVar119._8_4_;
  fVar211 = fVar211 + fVar211 * auVar119._12_4_;
  auVar119 = vrcpps_avx(auVar183);
  fVar213 = auVar119._0_4_;
  auVar239._0_4_ = fVar213 * auVar183._0_4_;
  fVar235 = auVar119._4_4_;
  auVar239._4_4_ = fVar235 * auVar183._4_4_;
  fVar236 = auVar119._8_4_;
  auVar239._8_4_ = fVar236 * auVar183._8_4_;
  fVar237 = auVar119._12_4_;
  auVar239._12_4_ = fVar237 * auVar183._12_4_;
  auVar119 = vsubps_avx(auVar283,auVar239);
  fVar213 = fVar213 + fVar213 * auVar119._0_4_;
  fVar235 = fVar235 + fVar235 * auVar119._4_4_;
  fVar236 = fVar236 + fVar236 * auVar119._8_4_;
  fVar237 = fVar237 + fVar237 * auVar119._12_4_;
  auVar119 = vrcpps_avx(auVar83);
  fVar238 = auVar119._0_4_;
  auVar253._0_4_ = fVar238 * auVar83._0_4_;
  fVar250 = auVar119._4_4_;
  auVar253._4_4_ = fVar250 * auVar83._4_4_;
  fVar251 = auVar119._8_4_;
  auVar253._8_4_ = fVar251 * auVar83._8_4_;
  fVar252 = auVar119._12_4_;
  auVar253._12_4_ = fVar252 * auVar83._12_4_;
  auVar83 = vsubps_avx(auVar283,auVar253);
  fVar238 = fVar238 + fVar238 * auVar83._0_4_;
  fVar250 = fVar250 + fVar250 * auVar83._4_4_;
  fVar251 = fVar251 + fVar251 * auVar83._8_4_;
  fVar252 = fVar252 + fVar252 * auVar83._12_4_;
  auVar83 = ZEXT416((uint)((*(float *)(ray + k * 4 + 0x70) - *(float *)(prim + lVar66 + 0x16)) *
                          *(float *)(prim + lVar66 + 0x1a)));
  auVar183 = vshufps_avx(auVar83,auVar83,0);
  auVar83._8_8_ = 0;
  auVar83._0_8_ = *(ulong *)(prim + uVar65 * 7 + 6);
  auVar83 = vpmovsxwd_avx(auVar83);
  auVar83 = vcvtdq2ps_avx(auVar83);
  auVar119._8_8_ = 0;
  auVar119._0_8_ = *(ulong *)(prim + uVar65 * 0xb + 6);
  auVar119 = vpmovsxwd_avx(auVar119);
  auVar119 = vcvtdq2ps_avx(auVar119);
  auVar14 = vsubps_avx(auVar119,auVar83);
  fVar112 = auVar183._0_4_;
  fVar151 = auVar183._4_4_;
  fVar186 = auVar183._8_4_;
  fVar187 = auVar183._12_4_;
  auVar183._8_8_ = 0;
  auVar183._0_8_ = *(ulong *)(prim + uVar65 * 9 + 6);
  auVar119 = vpmovsxwd_avx(auVar183);
  auVar268._0_4_ = auVar14._0_4_ * fVar112 + auVar83._0_4_;
  auVar268._4_4_ = auVar14._4_4_ * fVar151 + auVar83._4_4_;
  auVar268._8_4_ = auVar14._8_4_ * fVar186 + auVar83._8_4_;
  auVar268._12_4_ = auVar14._12_4_ * fVar187 + auVar83._12_4_;
  auVar14._8_8_ = 0;
  auVar14._0_8_ = *(ulong *)(prim + uVar65 * 0xd + 6);
  auVar183 = vpmovsxwd_avx(auVar14);
  auVar83 = vcvtdq2ps_avx(auVar119);
  auVar119 = vcvtdq2ps_avx(auVar183);
  auVar119 = vsubps_avx(auVar119,auVar83);
  auVar284._0_4_ = auVar119._0_4_ * fVar112 + auVar83._0_4_;
  auVar284._4_4_ = auVar119._4_4_ * fVar151 + auVar83._4_4_;
  auVar284._8_4_ = auVar119._8_4_ * fVar186 + auVar83._8_4_;
  auVar284._12_4_ = auVar119._12_4_ * fVar187 + auVar83._12_4_;
  auVar15._8_8_ = 0;
  auVar15._0_8_ = *(ulong *)(prim + uVar65 * 0x12 + 6);
  auVar83 = vpmovsxwd_avx(auVar15);
  uVar67 = (ulong)(uint)((int)(uVar65 * 5) << 2);
  auVar200._8_8_ = 0;
  auVar200._0_8_ = *(ulong *)(prim + uVar65 * 2 + uVar67 + 6);
  auVar119 = vpmovsxwd_avx(auVar200);
  auVar83 = vcvtdq2ps_avx(auVar83);
  auVar119 = vcvtdq2ps_avx(auVar119);
  auVar119 = vsubps_avx(auVar119,auVar83);
  auVar292._0_4_ = auVar119._0_4_ * fVar112 + auVar83._0_4_;
  auVar292._4_4_ = auVar119._4_4_ * fVar151 + auVar83._4_4_;
  auVar292._8_4_ = auVar119._8_4_ * fVar186 + auVar83._8_4_;
  auVar292._12_4_ = auVar119._12_4_ * fVar187 + auVar83._12_4_;
  auVar120._8_8_ = 0;
  auVar120._0_8_ = *(ulong *)(prim + uVar67 + 6);
  auVar83 = vpmovsxwd_avx(auVar120);
  auVar83 = vcvtdq2ps_avx(auVar83);
  auVar143._8_8_ = 0;
  auVar143._0_8_ = *(ulong *)(prim + uVar65 * 0x18 + 6);
  auVar119 = vpmovsxwd_avx(auVar143);
  auVar119 = vcvtdq2ps_avx(auVar119);
  auVar183 = vsubps_avx(auVar119,auVar83);
  auVar132._8_8_ = 0;
  auVar132._0_8_ = *(ulong *)(prim + uVar65 * 0x1d + 6);
  auVar119 = vpmovsxwd_avx(auVar132);
  auVar309._0_4_ = auVar183._0_4_ * fVar112 + auVar83._0_4_;
  auVar309._4_4_ = auVar183._4_4_ * fVar151 + auVar83._4_4_;
  auVar309._8_4_ = auVar183._8_4_ * fVar186 + auVar83._8_4_;
  auVar309._12_4_ = auVar183._12_4_ * fVar187 + auVar83._12_4_;
  auVar83 = vcvtdq2ps_avx(auVar119);
  auVar169._8_8_ = 0;
  auVar169._0_8_ = *(ulong *)(prim + uVar65 + (ulong)(byte)PVar5 * 0x20 + 6);
  auVar119 = vpmovsxwd_avx(auVar169);
  auVar119 = vcvtdq2ps_avx(auVar119);
  auVar119 = vsubps_avx(auVar119,auVar83);
  auVar316._0_4_ = auVar119._0_4_ * fVar112 + auVar83._0_4_;
  auVar316._4_4_ = auVar119._4_4_ * fVar151 + auVar83._4_4_;
  auVar316._8_4_ = auVar119._8_4_ * fVar186 + auVar83._8_4_;
  auVar316._12_4_ = auVar119._12_4_ * fVar187 + auVar83._12_4_;
  auVar82._8_8_ = 0;
  auVar82._0_8_ = *(ulong *)(prim + ((ulong)(byte)PVar5 * 0x20 - uVar65) + 6);
  auVar83 = vpmovsxwd_avx(auVar82);
  auVar83 = vcvtdq2ps_avx(auVar83);
  auVar265._8_8_ = 0;
  auVar265._0_8_ = *(ulong *)(prim + uVar65 * 0x23 + 6);
  auVar119 = vpmovsxwd_avx(auVar265);
  auVar119 = vcvtdq2ps_avx(auVar119);
  auVar119 = vsubps_avx(auVar119,auVar83);
  auVar254._0_4_ = auVar83._0_4_ + auVar119._0_4_ * fVar112;
  auVar254._4_4_ = auVar83._4_4_ + auVar119._4_4_ * fVar151;
  auVar254._8_4_ = auVar83._8_4_ + auVar119._8_4_ * fVar186;
  auVar254._12_4_ = auVar83._12_4_ + auVar119._12_4_ * fVar187;
  auVar83 = vsubps_avx(auVar268,auVar114);
  auVar269._0_4_ = fVar188 * auVar83._0_4_;
  auVar269._4_4_ = fVar208 * auVar83._4_4_;
  auVar269._8_4_ = fVar209 * auVar83._8_4_;
  auVar269._12_4_ = fVar211 * auVar83._12_4_;
  auVar83 = vsubps_avx(auVar284,auVar114);
  auVar115._0_4_ = fVar188 * auVar83._0_4_;
  auVar115._4_4_ = fVar208 * auVar83._4_4_;
  auVar115._8_4_ = fVar209 * auVar83._8_4_;
  auVar115._12_4_ = fVar211 * auVar83._12_4_;
  auVar83 = vsubps_avx(auVar292,auVar72);
  auVar190._0_4_ = fVar213 * auVar83._0_4_;
  auVar190._4_4_ = fVar235 * auVar83._4_4_;
  auVar190._8_4_ = fVar236 * auVar83._8_4_;
  auVar190._12_4_ = fVar237 * auVar83._12_4_;
  auVar83 = vsubps_avx(auVar309,auVar72);
  auVar73._0_4_ = fVar213 * auVar83._0_4_;
  auVar73._4_4_ = fVar235 * auVar83._4_4_;
  auVar73._8_4_ = fVar236 * auVar83._8_4_;
  auVar73._12_4_ = fVar237 * auVar83._12_4_;
  auVar83 = vsubps_avx(auVar316,auVar152);
  auVar215._0_4_ = fVar238 * auVar83._0_4_;
  auVar215._4_4_ = fVar250 * auVar83._4_4_;
  auVar215._8_4_ = fVar251 * auVar83._8_4_;
  auVar215._12_4_ = fVar252 * auVar83._12_4_;
  auVar83 = vsubps_avx(auVar254,auVar152);
  auVar153._0_4_ = fVar238 * auVar83._0_4_;
  auVar153._4_4_ = fVar250 * auVar83._4_4_;
  auVar153._8_4_ = fVar251 * auVar83._8_4_;
  auVar153._12_4_ = fVar252 * auVar83._12_4_;
  auVar83 = vpminsd_avx(auVar269,auVar115);
  auVar119 = vpminsd_avx(auVar190,auVar73);
  auVar83 = vmaxps_avx(auVar83,auVar119);
  auVar119 = vpminsd_avx(auVar215,auVar153);
  uVar3 = *(undefined4 *)(ray + k * 4 + 0x30);
  auVar285._4_4_ = uVar3;
  auVar285._0_4_ = uVar3;
  auVar285._8_4_ = uVar3;
  auVar285._12_4_ = uVar3;
  auVar119 = vmaxps_avx(auVar119,auVar285);
  auVar83 = vmaxps_avx(auVar83,auVar119);
  local_358._0_4_ = auVar83._0_4_ * 0.99999964;
  local_358._4_4_ = auVar83._4_4_ * 0.99999964;
  local_358._8_4_ = auVar83._8_4_ * 0.99999964;
  local_358._12_4_ = auVar83._12_4_ * 0.99999964;
  auVar83 = vpmaxsd_avx(auVar269,auVar115);
  auVar119 = vpmaxsd_avx(auVar190,auVar73);
  auVar83 = vminps_avx(auVar83,auVar119);
  auVar119 = vpmaxsd_avx(auVar215,auVar153);
  uVar3 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar154._4_4_ = uVar3;
  auVar154._0_4_ = uVar3;
  auVar154._8_4_ = uVar3;
  auVar154._12_4_ = uVar3;
  auVar119 = vminps_avx(auVar119,auVar154);
  auVar83 = vminps_avx(auVar83,auVar119);
  auVar74._0_4_ = auVar83._0_4_ * 1.0000004;
  auVar74._4_4_ = auVar83._4_4_ * 1.0000004;
  auVar74._8_4_ = auVar83._8_4_ * 1.0000004;
  auVar74._12_4_ = auVar83._12_4_ * 1.0000004;
  auVar83 = vpshufd_avx(ZEXT116((byte)PVar5),0);
  auVar119 = vpcmpgtd_avx(auVar83,_DAT_01f7fcf0);
  auVar83 = vcmpps_avx(local_358,auVar74,2);
  auVar83 = vandps_avx(auVar83,auVar119);
  uVar63 = vmovmskps_avx(auVar83);
  if (uVar63 == 0) {
    return;
  }
  uVar63 = uVar63 & 0xff;
  auVar105._16_16_ = mm_lookupmask_ps._240_16_;
  auVar105._0_16_ = mm_lookupmask_ps._240_16_;
  local_158 = vblendps_avx(auVar105,ZEXT832(0) << 0x20,0x80);
  local_420 = (undefined1 (*) [16])(mm_lookupmask_ps + (long)(1 << ((byte)k & 0x1f)) * 0x10);
  auVar53 = ZEXT412(0);
  local_418 = prim;
  do {
    auVar55._12_4_ = 0;
    auVar55._0_12_ = auVar53;
    local_410 = (ulong)uVar63;
    lVar66 = 0;
    if (local_410 != 0) {
      for (; (uVar63 >> lVar66 & 1) == 0; lVar66 = lVar66 + 1) {
      }
    }
    uVar64 = *(uint *)(local_418 + 2);
    pGVar7 = (context->scene->geometries).items[uVar64].ptr;
    fVar112 = (pGVar7->time_range).lower;
    fVar112 = pGVar7->fnumTimeSegments *
              ((*(float *)(ray + k * 4 + 0x70) - fVar112) / ((pGVar7->time_range).upper - fVar112));
    auVar83 = vroundss_avx(ZEXT416((uint)fVar112),ZEXT416((uint)fVar112),9);
    auVar83 = vminss_avx(auVar83,ZEXT416((uint)(pGVar7->fnumTimeSegments + -1.0)));
    auVar183 = vmaxss_avx(auVar55 << 0x20,auVar83);
    uVar6 = *(uint *)(local_418 + lVar66 * 4 + 6);
    uVar65 = (ulong)*(uint *)(*(long *)&pGVar7->field_0x58 +
                             (ulong)uVar6 *
                             pGVar7[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                             _M_i);
    _Var8 = pGVar7[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
    lVar68 = (long)(int)auVar183._0_4_ * 0x38;
    lVar9 = *(long *)(_Var8 + 0x10 + lVar68);
    pfVar1 = (float *)(*(long *)(_Var8 + lVar68) + lVar9 * uVar65);
    fVar151 = *pfVar1;
    fVar186 = pfVar1[1];
    fVar187 = pfVar1[2];
    fVar188 = pfVar1[3];
    lVar66 = uVar65 + 1;
    auVar83 = *(undefined1 (*) [16])(*(long *)(_Var8 + lVar68) + lVar9 * lVar66);
    p_Var10 = pGVar7[4].occlusionFilterN;
    lVar9 = *(long *)&pGVar7[4].fnumTimeSegments;
    lVar11 = *(long *)(lVar9 + 0x10 + lVar68);
    pfVar1 = (float *)(*(long *)(lVar9 + lVar68) + lVar11 * uVar65);
    fVar208 = *pfVar1;
    fVar209 = pfVar1[1];
    fVar211 = pfVar1[2];
    fVar213 = pfVar1[3];
    auVar119 = *(undefined1 (*) [16])(*(long *)(lVar9 + lVar68) + lVar11 * lVar66);
    _Var12 = pGVar7[5].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
    pfVar1 = (float *)(*(long *)(p_Var10 + lVar68) + *(long *)(p_Var10 + lVar68 + 0x10) * uVar65);
    pfVar2 = (float *)(*(long *)(p_Var10 + lVar68) + *(long *)(p_Var10 + lVar68 + 0x10) * lVar66);
    auVar270._0_4_ = *pfVar2 * 0.33333334;
    auVar270._4_4_ = pfVar2[1] * 0.33333334;
    auVar270._8_4_ = pfVar2[2] * 0.33333334;
    auVar270._12_4_ = pfVar2[3] * 0.33333334;
    lVar11 = *(long *)(_Var12 + 0x10 + lVar68);
    pfVar2 = (float *)(*(long *)(_Var12 + lVar68) + lVar11 * uVar65);
    fVar112 = fVar112 - auVar183._0_4_;
    fVar235 = fVar151 + *pfVar1 * 0.33333334;
    fVar236 = fVar186 + pfVar1[1] * 0.33333334;
    fVar237 = fVar187 + pfVar1[2] * 0.33333334;
    fVar238 = fVar188 + pfVar1[3] * 0.33333334;
    auVar183 = vsubps_avx(auVar83,auVar270);
    pfVar1 = (float *)(*(long *)(_Var12 + lVar68) + lVar11 * lVar66);
    auVar75._0_4_ = *pfVar1 * 0.33333334;
    auVar75._4_4_ = pfVar1[1] * 0.33333334;
    auVar75._8_4_ = pfVar1[2] * 0.33333334;
    auVar75._12_4_ = pfVar1[3] * 0.33333334;
    fVar250 = *pfVar2 * 0.33333334 + fVar208;
    fVar251 = pfVar2[1] * 0.33333334 + fVar209;
    fVar252 = pfVar2[2] * 0.33333334 + fVar211;
    fVar324 = pfVar2[3] * 0.33333334 + fVar213;
    auVar14 = vsubps_avx(auVar119,auVar75);
    fVar210 = auVar83._0_4_;
    fVar263 = auVar83._4_4_;
    fVar212 = auVar83._8_4_;
    fVar264 = auVar83._12_4_;
    fVar325 = auVar183._0_4_ * 0.0;
    fVar331 = auVar183._4_4_ * 0.0;
    fVar332 = auVar183._8_4_ * 0.0;
    fVar333 = auVar183._12_4_ * 0.0;
    fVar349 = fVar325 + fVar210 * 0.0;
    fVar356 = fVar331 + fVar263 * 0.0;
    fVar357 = fVar332 + fVar212 * 0.0;
    fVar358 = fVar333 + fVar264 * 0.0;
    auVar76._0_4_ = fVar349 + fVar235 * 3.0;
    auVar76._4_4_ = fVar356 + fVar236 * 3.0;
    auVar76._8_4_ = fVar357 + fVar237 * 3.0;
    auVar76._12_4_ = fVar358 + fVar238 * 3.0;
    auVar116._0_4_ = fVar151 * 3.0;
    auVar116._4_4_ = fVar186 * 3.0;
    auVar116._8_4_ = fVar187 * 3.0;
    auVar116._12_4_ = fVar188 * 3.0;
    auVar143 = vsubps_avx(auVar76,auVar116);
    fVar291 = auVar119._0_4_;
    fVar111 = auVar119._4_4_;
    fVar301 = auVar119._8_4_;
    fVar303 = auVar119._12_4_;
    fVar338 = auVar14._0_4_ * 0.0;
    fVar345 = auVar14._4_4_ * 0.0;
    fVar346 = auVar14._8_4_ * 0.0;
    fVar347 = auVar14._12_4_ * 0.0;
    fVar359 = fVar338 + fVar291 * 0.0;
    fVar364 = fVar345 + fVar111 * 0.0;
    fVar366 = fVar346 + fVar301 * 0.0;
    fVar369 = fVar347 + fVar303 * 0.0;
    auVar77._0_4_ = fVar359 + fVar250 * 3.0;
    auVar77._4_4_ = fVar364 + fVar251 * 3.0;
    auVar77._8_4_ = fVar366 + fVar252 * 3.0;
    auVar77._12_4_ = fVar369 + fVar324 * 3.0;
    auVar286._0_4_ = fVar208 * 3.0;
    auVar286._4_4_ = fVar209 * 3.0;
    auVar286._8_4_ = fVar211 * 3.0;
    auVar286._12_4_ = fVar213 * 3.0;
    auVar15 = vsubps_avx(auVar77,auVar286);
    lVar11 = *(long *)(_Var8 + 0x38 + lVar68);
    lVar13 = *(long *)(_Var8 + 0x48 + lVar68);
    auVar72 = *(undefined1 (*) [16])(lVar11 + lVar13 * uVar65);
    fVar235 = fVar235 * 0.0;
    fVar236 = fVar236 * 0.0;
    fVar237 = fVar237 * 0.0;
    fVar238 = fVar238 * 0.0;
    auVar350._0_4_ = fVar349 + fVar235 + fVar151;
    auVar350._4_4_ = fVar356 + fVar236 + fVar186;
    auVar350._8_4_ = fVar357 + fVar237 + fVar187;
    auVar350._12_4_ = fVar358 + fVar238 + fVar188;
    fVar250 = fVar250 * 0.0;
    fVar251 = fVar251 * 0.0;
    fVar252 = fVar252 * 0.0;
    fVar324 = fVar324 * 0.0;
    auVar361._0_4_ = fVar359 + fVar250 + fVar208;
    auVar361._4_4_ = fVar364 + fVar251 + fVar209;
    auVar361._8_4_ = fVar366 + fVar252 + fVar211;
    auVar361._12_4_ = fVar369 + fVar324 + fVar213;
    auVar155._0_4_ = fVar151 * 0.0;
    auVar155._4_4_ = fVar186 * 0.0;
    auVar155._8_4_ = fVar187 * 0.0;
    auVar155._12_4_ = fVar188 * 0.0;
    auVar310._0_4_ = fVar325 + fVar210 + fVar235 + auVar155._0_4_;
    auVar310._4_4_ = fVar331 + fVar263 + fVar236 + auVar155._4_4_;
    auVar310._8_4_ = fVar332 + fVar212 + fVar237 + auVar155._8_4_;
    auVar310._12_4_ = fVar333 + fVar264 + fVar238 + auVar155._12_4_;
    auVar191._0_4_ = fVar210 * 3.0;
    auVar191._4_4_ = fVar263 * 3.0;
    auVar191._8_4_ = fVar212 * 3.0;
    auVar191._12_4_ = fVar264 * 3.0;
    auVar271._0_4_ = auVar183._0_4_ * 3.0;
    auVar271._4_4_ = auVar183._4_4_ * 3.0;
    auVar271._8_4_ = auVar183._8_4_ * 3.0;
    auVar271._12_4_ = auVar183._12_4_ * 3.0;
    auVar83 = vsubps_avx(auVar191,auVar271);
    auVar78._0_4_ = fVar235 + auVar83._0_4_;
    auVar78._4_4_ = fVar236 + auVar83._4_4_;
    auVar78._8_4_ = fVar237 + auVar83._8_4_;
    auVar78._12_4_ = fVar238 + auVar83._12_4_;
    auVar132 = vsubps_avx(auVar78,auVar155);
    auVar156._0_4_ = fVar208 * 0.0;
    auVar156._4_4_ = fVar209 * 0.0;
    auVar156._8_4_ = fVar211 * 0.0;
    auVar156._12_4_ = fVar213 * 0.0;
    auVar79._0_4_ = auVar156._0_4_ + fVar250 + fVar338 + fVar291;
    auVar79._4_4_ = auVar156._4_4_ + fVar251 + fVar345 + fVar111;
    auVar79._8_4_ = auVar156._8_4_ + fVar252 + fVar346 + fVar301;
    auVar79._12_4_ = auVar156._12_4_ + fVar324 + fVar347 + fVar303;
    auVar192._0_4_ = fVar291 * 3.0;
    auVar192._4_4_ = fVar111 * 3.0;
    auVar192._8_4_ = fVar301 * 3.0;
    auVar192._12_4_ = fVar303 * 3.0;
    auVar216._0_4_ = auVar14._0_4_ * 3.0;
    auVar216._4_4_ = auVar14._4_4_ * 3.0;
    auVar216._8_4_ = auVar14._8_4_ * 3.0;
    auVar216._12_4_ = auVar14._12_4_ * 3.0;
    auVar83 = vsubps_avx(auVar192,auVar216);
    auVar117._0_4_ = fVar250 + auVar83._0_4_;
    auVar117._4_4_ = fVar251 + auVar83._4_4_;
    auVar117._8_4_ = fVar252 + auVar83._8_4_;
    auVar117._12_4_ = fVar324 + auVar83._12_4_;
    auVar200 = vsubps_avx(auVar117,auVar156);
    auVar83 = vshufps_avx(auVar143,auVar143,0xc9);
    auVar119 = vshufps_avx(auVar361,auVar361,0xc9);
    fVar111 = auVar143._0_4_;
    auVar193._0_4_ = fVar111 * auVar119._0_4_;
    fVar325 = auVar143._4_4_;
    auVar193._4_4_ = fVar325 * auVar119._4_4_;
    fVar331 = auVar143._8_4_;
    auVar193._8_4_ = fVar331 * auVar119._8_4_;
    fVar332 = auVar143._12_4_;
    auVar193._12_4_ = fVar332 * auVar119._12_4_;
    auVar217._0_4_ = auVar361._0_4_ * auVar83._0_4_;
    auVar217._4_4_ = auVar361._4_4_ * auVar83._4_4_;
    auVar217._8_4_ = auVar361._8_4_ * auVar83._8_4_;
    auVar217._12_4_ = auVar361._12_4_ * auVar83._12_4_;
    auVar119 = vsubps_avx(auVar217,auVar193);
    auVar183 = vshufps_avx(auVar119,auVar119,0xc9);
    auVar119 = vshufps_avx(auVar15,auVar15,0xc9);
    auVar194._0_4_ = fVar111 * auVar119._0_4_;
    auVar194._4_4_ = fVar325 * auVar119._4_4_;
    auVar194._8_4_ = fVar331 * auVar119._8_4_;
    auVar194._12_4_ = fVar332 * auVar119._12_4_;
    auVar157._0_4_ = auVar83._0_4_ * auVar15._0_4_;
    auVar157._4_4_ = auVar83._4_4_ * auVar15._4_4_;
    auVar157._8_4_ = auVar83._8_4_ * auVar15._8_4_;
    auVar157._12_4_ = auVar83._12_4_ * auVar15._12_4_;
    auVar83 = vsubps_avx(auVar157,auVar194);
    auVar14 = vshufps_avx(auVar83,auVar83,0xc9);
    auVar119 = vshufps_avx(auVar132,auVar132,0xc9);
    auVar83 = vshufps_avx(auVar79,auVar79,0xc9);
    fVar338 = auVar132._0_4_;
    auVar158._0_4_ = fVar338 * auVar83._0_4_;
    fVar346 = auVar132._4_4_;
    auVar158._4_4_ = fVar346 * auVar83._4_4_;
    fVar349 = auVar132._8_4_;
    auVar158._8_4_ = fVar349 * auVar83._8_4_;
    fVar357 = auVar132._12_4_;
    auVar158._12_4_ = fVar357 * auVar83._12_4_;
    auVar80._0_4_ = auVar119._0_4_ * auVar79._0_4_;
    auVar80._4_4_ = auVar119._4_4_ * auVar79._4_4_;
    auVar80._8_4_ = auVar119._8_4_ * auVar79._8_4_;
    auVar80._12_4_ = auVar119._12_4_ * auVar79._12_4_;
    auVar83 = vsubps_avx(auVar80,auVar158);
    auVar15 = vshufps_avx(auVar83,auVar83,0xc9);
    auVar83 = vshufps_avx(auVar200,auVar200,0xc9);
    auVar81._0_4_ = fVar338 * auVar83._0_4_;
    auVar81._4_4_ = fVar346 * auVar83._4_4_;
    auVar81._8_4_ = fVar349 * auVar83._8_4_;
    auVar81._12_4_ = fVar357 * auVar83._12_4_;
    auVar83 = vdpps_avx(auVar183,auVar183,0x7f);
    auVar118._0_4_ = auVar119._0_4_ * auVar200._0_4_;
    auVar118._4_4_ = auVar119._4_4_ * auVar200._4_4_;
    auVar118._8_4_ = auVar119._8_4_ * auVar200._8_4_;
    auVar118._12_4_ = auVar119._12_4_ * auVar200._12_4_;
    auVar120 = vsubps_avx(auVar118,auVar81);
    fVar186 = auVar83._0_4_;
    auVar82 = ZEXT416((uint)fVar186);
    auVar119 = vrsqrtss_avx(auVar82,auVar82);
    fVar151 = auVar119._0_4_;
    auVar119 = ZEXT416((uint)(fVar151 * 1.5 - fVar186 * 0.5 * fVar151 * fVar151 * fVar151));
    auVar200 = vshufps_avx(auVar119,auVar119,0);
    fVar208 = auVar200._0_4_ * auVar183._0_4_;
    fVar209 = auVar200._4_4_ * auVar183._4_4_;
    fVar211 = auVar200._8_4_ * auVar183._8_4_;
    fVar213 = auVar200._12_4_ * auVar183._12_4_;
    auVar119 = vdpps_avx(auVar183,auVar14,0x7f);
    auVar83 = vshufps_avx(auVar83,auVar83,0);
    auVar255._0_4_ = auVar83._0_4_ * auVar14._0_4_;
    auVar255._4_4_ = auVar83._4_4_ * auVar14._4_4_;
    auVar255._8_4_ = auVar83._8_4_ * auVar14._8_4_;
    auVar255._12_4_ = auVar83._12_4_ * auVar14._12_4_;
    auVar83 = vshufps_avx(auVar119,auVar119,0);
    auVar240._0_4_ = auVar83._0_4_ * auVar183._0_4_;
    auVar240._4_4_ = auVar83._4_4_ * auVar183._4_4_;
    auVar240._8_4_ = auVar83._8_4_ * auVar183._8_4_;
    auVar240._12_4_ = auVar83._12_4_ * auVar183._12_4_;
    auVar169 = vsubps_avx(auVar255,auVar240);
    auVar83 = vrcpss_avx(auVar82,auVar82);
    auVar83 = ZEXT416((uint)(auVar83._0_4_ * (2.0 - fVar186 * auVar83._0_4_)));
    auVar183 = vshufps_avx(auVar83,auVar83,0);
    auVar119 = vdpps_avx(auVar15,auVar15,0x7f);
    fVar235 = auVar119._0_4_;
    auVar265 = ZEXT416((uint)fVar235);
    auVar83 = vrsqrtss_avx(auVar265,auVar265);
    fVar151 = auVar83._0_4_;
    auVar83 = *(undefined1 (*) [16])(lVar11 + lVar13 * lVar66);
    pfVar1 = (float *)(*(long *)(p_Var10 + lVar68 + 0x38) +
                      *(long *)(p_Var10 + lVar68 + 0x48) * uVar65);
    auVar14 = vshufps_avx(auVar120,auVar120,0xc9);
    auVar120 = ZEXT416((uint)(fVar151 * 1.5 - fVar151 * fVar151 * fVar235 * 0.5 * fVar151));
    auVar120 = vshufps_avx(auVar120,auVar120,0);
    auVar119 = vshufps_avx(auVar119,auVar119,0);
    auVar340._0_4_ = auVar119._0_4_ * auVar14._0_4_;
    auVar340._4_4_ = auVar119._4_4_ * auVar14._4_4_;
    auVar340._8_4_ = auVar119._8_4_ * auVar14._8_4_;
    auVar340._12_4_ = auVar119._12_4_ * auVar14._12_4_;
    auVar119 = vdpps_avx(auVar15,auVar14,0x7f);
    auVar119 = vshufps_avx(auVar119,auVar119,0);
    auVar218._0_4_ = auVar119._0_4_ * auVar15._0_4_;
    auVar218._4_4_ = auVar119._4_4_ * auVar15._4_4_;
    auVar218._8_4_ = auVar119._8_4_ * auVar15._8_4_;
    auVar218._12_4_ = auVar119._12_4_ * auVar15._12_4_;
    fVar151 = auVar15._0_4_ * auVar120._0_4_;
    fVar186 = auVar15._4_4_ * auVar120._4_4_;
    fVar187 = auVar15._8_4_ * auVar120._8_4_;
    fVar188 = auVar15._12_4_ * auVar120._12_4_;
    auVar82 = vsubps_avx(auVar340,auVar218);
    auVar119 = vrcpss_avx(auVar265,auVar265);
    auVar119 = ZEXT416((uint)(auVar119._0_4_ * (2.0 - fVar235 * auVar119._0_4_)));
    auVar119 = vshufps_avx(auVar119,auVar119,0);
    auVar14 = vshufps_avx(auVar350,auVar350,0xff);
    auVar341._0_4_ = auVar14._0_4_ * fVar208;
    auVar341._4_4_ = auVar14._4_4_ * fVar209;
    auVar341._8_4_ = auVar14._8_4_ * fVar211;
    auVar341._12_4_ = auVar14._12_4_ * fVar213;
    auVar265 = vsubps_avx(auVar350,auVar341);
    auVar15 = vshufps_avx(auVar143,auVar143,0xff);
    auVar195._0_4_ =
         auVar15._0_4_ * fVar208 + auVar14._0_4_ * auVar200._0_4_ * auVar183._0_4_ * auVar169._0_4_;
    auVar195._4_4_ =
         auVar15._4_4_ * fVar209 + auVar14._4_4_ * auVar200._4_4_ * auVar183._4_4_ * auVar169._4_4_;
    auVar195._8_4_ =
         auVar15._8_4_ * fVar211 + auVar14._8_4_ * auVar200._8_4_ * auVar183._8_4_ * auVar169._8_4_;
    auVar195._12_4_ =
         auVar15._12_4_ * fVar213 +
         auVar14._12_4_ * auVar200._12_4_ * auVar183._12_4_ * auVar169._12_4_;
    auVar143 = vsubps_avx(auVar143,auVar195);
    auVar183 = vshufps_avx(auVar310,auVar310,0xff);
    auVar293._0_4_ = auVar183._0_4_ * fVar151;
    auVar293._4_4_ = auVar183._4_4_ * fVar186;
    auVar293._8_4_ = auVar183._8_4_ * fVar187;
    auVar293._12_4_ = auVar183._12_4_ * fVar188;
    auVar169 = vsubps_avx(auVar310,auVar293);
    auVar14 = vshufps_avx(auVar132,auVar132,0xff);
    auVar121._0_4_ =
         auVar14._0_4_ * fVar151 + auVar183._0_4_ * auVar120._0_4_ * auVar82._0_4_ * auVar119._0_4_;
    auVar121._4_4_ =
         auVar14._4_4_ * fVar186 + auVar183._4_4_ * auVar120._4_4_ * auVar82._4_4_ * auVar119._4_4_;
    auVar121._8_4_ =
         auVar14._8_4_ * fVar187 + auVar183._8_4_ * auVar120._8_4_ * auVar82._8_4_ * auVar119._8_4_;
    auVar121._12_4_ =
         auVar14._12_4_ * fVar188 +
         auVar183._12_4_ * auVar120._12_4_ * auVar82._12_4_ * auVar119._12_4_;
    auVar120 = vsubps_avx(auVar132,auVar121);
    local_458._4_4_ = auVar310._4_4_ + auVar293._4_4_;
    local_458._0_4_ = auVar310._0_4_ + auVar293._0_4_;
    fStack_450 = auVar310._8_4_ + auVar293._8_4_;
    fStack_44c = auVar310._12_4_ + auVar293._12_4_;
    local_518._0_4_ = auVar72._0_4_;
    local_518._4_4_ = auVar72._4_4_;
    fStack_510 = auVar72._8_4_;
    fStack_50c = auVar72._12_4_;
    fVar291 = (float)local_518._0_4_ + *pfVar1 * 0.33333334;
    fVar301 = (float)local_518._4_4_ + pfVar1[1] * 0.33333334;
    fVar303 = fStack_510 + pfVar1[2] * 0.33333334;
    fVar333 = fStack_50c + pfVar1[3] * 0.33333334;
    pfVar1 = (float *)(*(long *)(p_Var10 + lVar68 + 0x38) +
                      *(long *)(p_Var10 + lVar68 + 0x48) * lVar66);
    auVar84._0_4_ = *pfVar1 * 0.33333334;
    auVar84._4_4_ = pfVar1[1] * 0.33333334;
    auVar84._8_4_ = pfVar1[2] * 0.33333334;
    auVar84._12_4_ = pfVar1[3] * 0.33333334;
    auVar119 = vsubps_avx(auVar83,auVar84);
    fVar359 = auVar83._0_4_;
    fVar364 = auVar83._4_4_;
    fVar366 = auVar83._8_4_;
    fVar369 = auVar83._12_4_;
    fVar250 = auVar119._0_4_ * 0.0;
    fVar252 = auVar119._4_4_ * 0.0;
    fVar210 = auVar119._8_4_ * 0.0;
    fVar212 = auVar119._12_4_ * 0.0;
    fVar360 = fVar359 * 0.0 + fVar250;
    fVar365 = fVar364 * 0.0 + fVar252;
    fVar367 = fVar366 * 0.0 + fVar210;
    fVar370 = fVar369 * 0.0 + fVar212;
    auVar122._0_4_ = fVar360 + fVar291 * 3.0;
    auVar122._4_4_ = fVar365 + fVar301 * 3.0;
    auVar122._8_4_ = fVar367 + fVar303 * 3.0;
    auVar122._12_4_ = fVar370 + fVar333 * 3.0;
    auVar159._0_4_ = (float)local_518._0_4_ * 3.0;
    auVar159._4_4_ = (float)local_518._4_4_ * 3.0;
    auVar159._8_4_ = fStack_510 * 3.0;
    auVar159._12_4_ = fStack_50c * 3.0;
    auVar132 = vsubps_avx(auVar122,auVar159);
    lVar11 = *(long *)(lVar9 + 0x38 + lVar68);
    lVar9 = *(long *)(lVar9 + 0x48 + lVar68);
    lVar13 = *(long *)(_Var12 + 0x38 + lVar68);
    lVar68 = *(long *)(_Var12 + 0x48 + lVar68);
    pfVar1 = (float *)(lVar11 + lVar9 * uVar65);
    fVar151 = *pfVar1;
    fVar186 = pfVar1[1];
    fVar187 = pfVar1[2];
    fVar188 = pfVar1[3];
    pfVar1 = (float *)(lVar13 + uVar65 * lVar68);
    fVar251 = fVar151 + *pfVar1 * 0.33333334;
    fVar324 = fVar186 + pfVar1[1] * 0.33333334;
    fVar263 = fVar187 + pfVar1[2] * 0.33333334;
    fVar264 = fVar188 + pfVar1[3] * 0.33333334;
    auVar83 = *(undefined1 (*) [16])(lVar11 + lVar9 * lVar66);
    pfVar1 = (float *)(lVar13 + lVar68 * lVar66);
    auVar160._0_4_ = *pfVar1 * 0.33333334;
    auVar160._4_4_ = pfVar1[1] * 0.33333334;
    auVar160._8_4_ = pfVar1[2] * 0.33333334;
    auVar160._12_4_ = pfVar1[3] * 0.33333334;
    auVar183 = vsubps_avx(auVar83,auVar160);
    fVar345 = auVar83._0_4_;
    fVar347 = auVar83._4_4_;
    fVar356 = auVar83._8_4_;
    fVar358 = auVar83._12_4_;
    fVar208 = auVar183._0_4_ * 0.0;
    fVar209 = auVar183._4_4_ * 0.0;
    fVar211 = auVar183._8_4_ * 0.0;
    fVar213 = auVar183._12_4_ * 0.0;
    fVar235 = fVar345 * 0.0 + fVar208;
    fVar236 = fVar347 * 0.0 + fVar209;
    fVar237 = fVar356 * 0.0 + fVar211;
    fVar238 = fVar358 * 0.0 + fVar213;
    auVar241._0_4_ = fVar251 * 3.0 + fVar235;
    auVar241._4_4_ = fVar324 * 3.0 + fVar236;
    auVar241._8_4_ = fVar263 * 3.0 + fVar237;
    auVar241._12_4_ = fVar264 * 3.0 + fVar238;
    auVar272._0_4_ = fVar151 * 3.0;
    auVar272._4_4_ = fVar186 * 3.0;
    auVar272._8_4_ = fVar187 * 3.0;
    auVar272._12_4_ = fVar188 * 3.0;
    auVar14 = vsubps_avx(auVar241,auVar272);
    auVar273._0_4_ = fVar359 * 3.0;
    auVar273._4_4_ = fVar364 * 3.0;
    auVar273._8_4_ = fVar366 * 3.0;
    auVar273._12_4_ = fVar369 * 3.0;
    auVar327._0_4_ = auVar119._0_4_ * 3.0;
    auVar327._4_4_ = auVar119._4_4_ * 3.0;
    auVar327._8_4_ = auVar119._8_4_ * 3.0;
    auVar327._12_4_ = auVar119._12_4_ * 3.0;
    auVar83 = vsubps_avx(auVar273,auVar327);
    fVar291 = fVar291 * 0.0;
    fVar301 = fVar301 * 0.0;
    fVar303 = fVar303 * 0.0;
    fVar333 = fVar333 * 0.0;
    auVar274._0_4_ = fVar291 + auVar83._0_4_;
    auVar274._4_4_ = fVar301 + auVar83._4_4_;
    auVar274._8_4_ = fVar303 + auVar83._8_4_;
    auVar274._12_4_ = fVar333 + auVar83._12_4_;
    auVar328._0_4_ = (float)local_518._0_4_ + fVar291 + fVar360;
    auVar328._4_4_ = (float)local_518._4_4_ + fVar301 + fVar365;
    auVar328._8_4_ = fStack_510 + fVar303 + fVar367;
    auVar328._12_4_ = fStack_50c + fVar333 + fVar370;
    auVar294._0_4_ = (float)local_518._0_4_ * 0.0;
    auVar294._4_4_ = (float)local_518._4_4_ * 0.0;
    auVar294._8_4_ = fStack_510 * 0.0;
    auVar294._12_4_ = fStack_50c * 0.0;
    local_518._0_4_ = auVar294._0_4_ + fVar291 + fVar359 + fVar250;
    local_518._4_4_ = auVar294._4_4_ + fVar301 + fVar364 + fVar252;
    fStack_510 = auVar294._8_4_ + fVar303 + fVar366 + fVar210;
    fStack_50c = auVar294._12_4_ + fVar333 + fVar369 + fVar212;
    auVar82 = vsubps_avx(auVar274,auVar294);
    auVar196._0_4_ = fVar345 * 3.0;
    auVar196._4_4_ = fVar347 * 3.0;
    auVar196._8_4_ = fVar356 * 3.0;
    auVar196._12_4_ = fVar358 * 3.0;
    auVar123._0_4_ = auVar183._0_4_ * 3.0;
    auVar123._4_4_ = auVar183._4_4_ * 3.0;
    auVar123._8_4_ = auVar183._8_4_ * 3.0;
    auVar123._12_4_ = auVar183._12_4_ * 3.0;
    auVar83 = vsubps_avx(auVar196,auVar123);
    fVar251 = fVar251 * 0.0;
    fVar324 = fVar324 * 0.0;
    fVar263 = fVar263 * 0.0;
    fVar264 = fVar264 * 0.0;
    auVar124._0_4_ = fVar251 + auVar83._0_4_;
    auVar124._4_4_ = fVar324 + auVar83._4_4_;
    auVar124._8_4_ = fVar263 + auVar83._8_4_;
    auVar124._12_4_ = fVar264 + auVar83._12_4_;
    auVar161._0_4_ = fVar151 + fVar251 + fVar235;
    auVar161._4_4_ = fVar186 + fVar324 + fVar236;
    auVar161._8_4_ = fVar187 + fVar263 + fVar237;
    auVar161._12_4_ = fVar188 + fVar264 + fVar238;
    auVar197._0_4_ = fVar151 * 0.0;
    auVar197._4_4_ = fVar186 * 0.0;
    auVar197._8_4_ = fVar187 * 0.0;
    auVar197._12_4_ = fVar188 * 0.0;
    auVar85._0_4_ = auVar197._0_4_ + fVar251 + fVar345 + fVar208;
    auVar85._4_4_ = auVar197._4_4_ + fVar324 + fVar347 + fVar209;
    auVar85._8_4_ = auVar197._8_4_ + fVar263 + fVar356 + fVar211;
    auVar85._12_4_ = auVar197._12_4_ + fVar264 + fVar358 + fVar213;
    auVar119 = vsubps_avx(auVar124,auVar197);
    auVar83 = vshufps_avx(auVar161,auVar161,0xc9);
    fVar251 = auVar132._0_4_;
    auVar198._0_4_ = fVar251 * auVar83._0_4_;
    fVar252 = auVar132._4_4_;
    auVar198._4_4_ = fVar252 * auVar83._4_4_;
    fVar263 = auVar132._8_4_;
    auVar198._8_4_ = fVar263 * auVar83._8_4_;
    fVar212 = auVar132._12_4_;
    auVar198._12_4_ = fVar212 * auVar83._12_4_;
    auVar83 = vshufps_avx(auVar132,auVar132,0xc9);
    auVar162._0_4_ = auVar83._0_4_ * auVar161._0_4_;
    auVar162._4_4_ = auVar83._4_4_ * auVar161._4_4_;
    auVar162._8_4_ = auVar83._8_4_ * auVar161._8_4_;
    auVar162._12_4_ = auVar83._12_4_ * auVar161._12_4_;
    auVar183 = vsubps_avx(auVar162,auVar198);
    auVar199._0_4_ = auVar83._0_4_ * auVar14._0_4_;
    auVar199._4_4_ = auVar83._4_4_ * auVar14._4_4_;
    auVar199._8_4_ = auVar83._8_4_ * auVar14._8_4_;
    auVar199._12_4_ = auVar83._12_4_ * auVar14._12_4_;
    auVar83 = vshufps_avx(auVar14,auVar14,0xc9);
    auVar219._0_4_ = fVar251 * auVar83._0_4_;
    auVar219._4_4_ = fVar252 * auVar83._4_4_;
    auVar219._8_4_ = fVar263 * auVar83._8_4_;
    auVar219._12_4_ = fVar212 * auVar83._12_4_;
    auVar14 = vsubps_avx(auVar199,auVar219);
    auVar83 = vshufps_avx(auVar85,auVar85,0xc9);
    fVar235 = auVar82._0_4_;
    auVar220._0_4_ = fVar235 * auVar83._0_4_;
    fVar236 = auVar82._4_4_;
    auVar220._4_4_ = fVar236 * auVar83._4_4_;
    fVar237 = auVar82._8_4_;
    auVar220._8_4_ = fVar237 * auVar83._8_4_;
    fVar250 = auVar82._12_4_;
    auVar220._12_4_ = fVar250 * auVar83._12_4_;
    auVar83 = vshufps_avx(auVar82,auVar82,0xc9);
    auVar86._0_4_ = auVar83._0_4_ * auVar85._0_4_;
    auVar86._4_4_ = auVar83._4_4_ * auVar85._4_4_;
    auVar86._8_4_ = auVar83._8_4_ * auVar85._8_4_;
    auVar86._12_4_ = auVar83._12_4_ * auVar85._12_4_;
    auVar15 = vsubps_avx(auVar86,auVar220);
    auVar183 = vshufps_avx(auVar183,auVar183,0xc9);
    auVar163._0_4_ = auVar83._0_4_ * auVar119._0_4_;
    auVar163._4_4_ = auVar83._4_4_ * auVar119._4_4_;
    auVar163._8_4_ = auVar83._8_4_ * auVar119._8_4_;
    auVar163._12_4_ = auVar83._12_4_ * auVar119._12_4_;
    auVar119 = vshufps_avx(auVar119,auVar119,0xc9);
    auVar83 = vdpps_avx(auVar183,auVar183,0x7f);
    auVar125._0_4_ = fVar235 * auVar119._0_4_;
    auVar125._4_4_ = fVar236 * auVar119._4_4_;
    auVar125._8_4_ = fVar237 * auVar119._8_4_;
    auVar125._12_4_ = fVar250 * auVar119._12_4_;
    auVar72 = vsubps_avx(auVar163,auVar125);
    auVar14 = vshufps_avx(auVar14,auVar14,0xc9);
    fVar151 = auVar83._0_4_;
    auVar200 = ZEXT416((uint)fVar151);
    auVar119 = vrsqrtss_avx(auVar200,auVar200);
    fVar186 = auVar119._0_4_;
    auVar119 = vdpps_avx(auVar183,auVar14,0x7f);
    auVar83 = vshufps_avx(auVar83,auVar83,0);
    auVar126._0_4_ = auVar83._0_4_ * auVar14._0_4_;
    auVar126._4_4_ = auVar83._4_4_ * auVar14._4_4_;
    auVar126._8_4_ = auVar83._8_4_ * auVar14._8_4_;
    auVar126._12_4_ = auVar83._12_4_ * auVar14._12_4_;
    auVar83 = vshufps_avx(auVar119,auVar119,0);
    auVar275._0_4_ = auVar83._0_4_ * auVar183._0_4_;
    auVar275._4_4_ = auVar83._4_4_ * auVar183._4_4_;
    auVar275._8_4_ = auVar83._8_4_ * auVar183._8_4_;
    auVar275._12_4_ = auVar83._12_4_ * auVar183._12_4_;
    auVar73 = vsubps_avx(auVar126,auVar275);
    auVar83 = vrcpss_avx(auVar200,auVar200);
    auVar83 = ZEXT416((uint)(auVar83._0_4_ * (2.0 - fVar151 * auVar83._0_4_)));
    auVar14 = vshufps_avx(auVar83,auVar83,0);
    auVar15 = vshufps_avx(auVar15,auVar15,0xc9);
    auVar83 = ZEXT416((uint)(fVar186 * 1.5 - fVar186 * fVar186 * fVar151 * 0.5 * fVar186));
    auVar200 = vshufps_avx(auVar83,auVar83,0);
    auVar83 = vdpps_avx(auVar15,auVar15,0x7f);
    fVar151 = auVar200._0_4_ * auVar183._0_4_;
    fVar186 = auVar200._4_4_ * auVar183._4_4_;
    fVar187 = auVar200._8_4_ * auVar183._8_4_;
    fVar188 = auVar200._12_4_ * auVar183._12_4_;
    auVar183 = vshufps_avx(auVar72,auVar72,0xc9);
    fVar209 = auVar83._0_4_;
    auVar74 = ZEXT416((uint)fVar209);
    auVar119 = vrsqrtss_avx(auVar74,auVar74);
    fVar208 = auVar119._0_4_;
    auVar119 = vdpps_avx(auVar15,auVar183,0x7f);
    auVar83 = vshufps_avx(auVar83,auVar83,0);
    auVar164._0_4_ = auVar83._0_4_ * auVar183._0_4_;
    auVar164._4_4_ = auVar83._4_4_ * auVar183._4_4_;
    auVar164._8_4_ = auVar83._8_4_ * auVar183._8_4_;
    auVar164._12_4_ = auVar83._12_4_ * auVar183._12_4_;
    auVar83 = vshufps_avx(auVar119,auVar119,0);
    auVar276._0_4_ = auVar83._0_4_ * auVar15._0_4_;
    auVar276._4_4_ = auVar83._4_4_ * auVar15._4_4_;
    auVar276._8_4_ = auVar83._8_4_ * auVar15._8_4_;
    auVar276._12_4_ = auVar83._12_4_ * auVar15._12_4_;
    auVar72 = vsubps_avx(auVar164,auVar276);
    auVar83 = vrcpss_avx(auVar74,auVar74);
    auVar83 = ZEXT416((uint)(auVar83._0_4_ * (2.0 - fVar209 * auVar83._0_4_)));
    auVar83 = vshufps_avx(auVar83,auVar83,0);
    auVar119 = ZEXT416((uint)(fVar208 * 1.5 - fVar208 * fVar208 * fVar209 * 0.5 * fVar208));
    auVar119 = vshufps_avx(auVar119,auVar119,0);
    fVar208 = auVar15._0_4_ * auVar119._0_4_;
    fVar209 = auVar15._4_4_ * auVar119._4_4_;
    fVar211 = auVar15._8_4_ * auVar119._8_4_;
    fVar213 = auVar15._12_4_ * auVar119._12_4_;
    auVar183 = vshufps_avx(auVar132,auVar132,0xff);
    auVar15 = vshufps_avx(auVar328,auVar328,0xff);
    auVar87._0_4_ = auVar15._0_4_ * fVar151;
    auVar87._4_4_ = auVar15._4_4_ * fVar186;
    auVar87._8_4_ = auVar15._8_4_ * fVar187;
    auVar87._12_4_ = auVar15._12_4_ * fVar188;
    auVar201._0_4_ =
         auVar183._0_4_ * fVar151 + auVar200._0_4_ * auVar14._0_4_ * auVar73._0_4_ * auVar15._0_4_;
    auVar201._4_4_ =
         auVar183._4_4_ * fVar186 + auVar200._4_4_ * auVar14._4_4_ * auVar73._4_4_ * auVar15._4_4_;
    auVar201._8_4_ =
         auVar183._8_4_ * fVar187 + auVar200._8_4_ * auVar14._8_4_ * auVar73._8_4_ * auVar15._8_4_;
    auVar201._12_4_ =
         auVar183._12_4_ * fVar188 +
         auVar200._12_4_ * auVar14._12_4_ * auVar73._12_4_ * auVar15._12_4_;
    auVar15 = vsubps_avx(auVar328,auVar87);
    auVar200 = vsubps_avx(auVar132,auVar201);
    auVar183 = vshufps_avx(auVar82,auVar82,0xff);
    auVar14 = vshufps_avx(_local_518,_local_518,0xff);
    auVar127._0_4_ = auVar14._0_4_ * fVar208;
    auVar127._4_4_ = auVar14._4_4_ * fVar209;
    auVar127._8_4_ = auVar14._8_4_ * fVar211;
    auVar127._12_4_ = auVar14._12_4_ * fVar213;
    auVar165._0_4_ =
         auVar183._0_4_ * fVar208 + auVar14._0_4_ * auVar119._0_4_ * auVar72._0_4_ * auVar83._0_4_;
    auVar165._4_4_ =
         auVar183._4_4_ * fVar209 + auVar14._4_4_ * auVar119._4_4_ * auVar72._4_4_ * auVar83._4_4_;
    auVar165._8_4_ =
         auVar183._8_4_ * fVar211 + auVar14._8_4_ * auVar119._8_4_ * auVar72._8_4_ * auVar83._8_4_;
    auVar165._12_4_ =
         auVar183._12_4_ * fVar213 +
         auVar14._12_4_ * auVar119._12_4_ * auVar72._12_4_ * auVar83._12_4_;
    auVar183 = vsubps_avx(_local_518,auVar127);
    auVar342._0_4_ = (float)local_518._0_4_ + auVar127._0_4_;
    auVar342._4_4_ = (float)local_518._4_4_ + auVar127._4_4_;
    auVar342._8_4_ = fStack_510 + auVar127._8_4_;
    auVar342._12_4_ = fStack_50c + auVar127._12_4_;
    auVar14 = vsubps_avx(auVar82,auVar165);
    local_588 = auVar143._0_4_;
    fStack_584 = auVar143._4_4_;
    fStack_580 = auVar143._8_4_;
    fStack_57c = auVar143._12_4_;
    local_4f8 = auVar265._0_4_;
    fStack_4f4 = auVar265._4_4_;
    fStack_4f0 = auVar265._8_4_;
    fStack_4ec = auVar265._12_4_;
    auVar83 = vshufps_avx(ZEXT416((uint)fVar112),ZEXT416((uint)fVar112),0);
    auVar119 = vshufps_avx(ZEXT416((uint)(1.0 - fVar112)),ZEXT416((uint)(1.0 - fVar112)),0);
    fVar112 = auVar83._0_4_;
    fVar151 = auVar83._4_4_;
    fVar186 = auVar83._8_4_;
    fVar187 = auVar83._12_4_;
    fVar188 = auVar119._0_4_;
    fVar208 = auVar119._4_4_;
    fVar209 = auVar119._8_4_;
    fVar211 = auVar119._12_4_;
    local_398._0_4_ = fVar188 * local_4f8 + fVar112 * auVar15._0_4_;
    local_398._4_4_ = fVar208 * fStack_4f4 + fVar151 * auVar15._4_4_;
    fStack_390 = fVar209 * fStack_4f0 + fVar186 * auVar15._8_4_;
    fStack_38c = fVar211 * fStack_4ec + fVar187 * auVar15._12_4_;
    fVar238 = fVar188 * (local_4f8 + local_588 * 0.33333334) +
              fVar112 * (auVar15._0_4_ + auVar200._0_4_ * 0.33333334);
    fVar324 = fVar208 * (fStack_4f4 + fStack_584 * 0.33333334) +
              fVar151 * (auVar15._4_4_ + auVar200._4_4_ * 0.33333334);
    fVar264 = fVar209 * (fStack_4f0 + fStack_580 * 0.33333334) +
              fVar186 * (auVar15._8_4_ + auVar200._8_4_ * 0.33333334);
    fVar301 = fVar211 * (fStack_4ec + fStack_57c * 0.33333334) +
              fVar187 * (auVar15._12_4_ + auVar200._12_4_ * 0.33333334);
    local_558 = auVar120._0_4_;
    fStack_554 = auVar120._4_4_;
    fStack_550 = auVar120._8_4_;
    fStack_54c = auVar120._12_4_;
    auVar221._0_4_ = local_558 * 0.33333334;
    auVar221._4_4_ = fStack_554 * 0.33333334;
    auVar221._8_4_ = fStack_550 * 0.33333334;
    auVar221._12_4_ = fStack_54c * 0.33333334;
    auVar83 = vsubps_avx(auVar169,auVar221);
    auVar277._0_4_ = (fVar338 + auVar121._0_4_) * 0.33333334;
    auVar277._4_4_ = (fVar346 + auVar121._4_4_) * 0.33333334;
    auVar277._8_4_ = (fVar349 + auVar121._8_4_) * 0.33333334;
    auVar277._12_4_ = (fVar357 + auVar121._12_4_) * 0.33333334;
    auVar119 = vsubps_avx(_local_458,auVar277);
    auVar202._0_4_ = auVar14._0_4_ * 0.33333334;
    auVar202._4_4_ = auVar14._4_4_ * 0.33333334;
    auVar202._8_4_ = auVar14._8_4_ * 0.33333334;
    auVar202._12_4_ = auVar14._12_4_ * 0.33333334;
    auVar14 = vsubps_avx(auVar183,auVar202);
    auVar128._0_4_ = (fVar235 + auVar165._0_4_) * 0.33333334;
    auVar128._4_4_ = (fVar236 + auVar165._4_4_) * 0.33333334;
    auVar128._8_4_ = (fVar237 + auVar165._8_4_) * 0.33333334;
    auVar128._12_4_ = (fVar250 + auVar165._12_4_) * 0.33333334;
    auVar15 = vsubps_avx(auVar342,auVar128);
    local_3a8._0_4_ = fVar188 * auVar83._0_4_ + fVar112 * auVar14._0_4_;
    local_3a8._4_4_ = fVar208 * auVar83._4_4_ + fVar151 * auVar14._4_4_;
    fStack_3a0 = fVar209 * auVar83._8_4_ + fVar186 * auVar14._8_4_;
    fStack_39c = fVar211 * auVar83._12_4_ + fVar187 * auVar14._12_4_;
    local_3b8._0_4_ = auVar183._0_4_ * fVar112 + fVar188 * auVar169._0_4_;
    local_3b8._4_4_ = auVar183._4_4_ * fVar151 + fVar208 * auVar169._4_4_;
    fStack_3b0 = auVar183._8_4_ * fVar186 + fVar209 * auVar169._8_4_;
    fStack_3ac = auVar183._12_4_ * fVar187 + fVar211 * auVar169._12_4_;
    fVar250 = fVar188 * (auVar350._0_4_ + auVar341._0_4_) +
              fVar112 * (auVar328._0_4_ + auVar87._0_4_);
    fVar210 = fVar208 * (auVar350._4_4_ + auVar341._4_4_) +
              fVar151 * (auVar328._4_4_ + auVar87._4_4_);
    fVar291 = fVar209 * (auVar350._8_4_ + auVar341._8_4_) +
              fVar186 * (auVar328._8_4_ + auVar87._8_4_);
    fVar303 = fVar211 * (auVar350._12_4_ + auVar341._12_4_) +
              fVar187 * (auVar328._12_4_ + auVar87._12_4_);
    local_3c8._0_4_ =
         fVar188 * (auVar350._0_4_ + auVar341._0_4_ + (fVar111 + auVar195._0_4_) * 0.33333334) +
         ((fVar251 + auVar201._0_4_) * 0.33333334 + auVar328._0_4_ + auVar87._0_4_) * fVar112;
    local_3c8._4_4_ =
         fVar208 * (auVar350._4_4_ + auVar341._4_4_ + (fVar325 + auVar195._4_4_) * 0.33333334) +
         ((fVar252 + auVar201._4_4_) * 0.33333334 + auVar328._4_4_ + auVar87._4_4_) * fVar151;
    fStack_3c0 = fVar209 * (auVar350._8_4_ + auVar341._8_4_ +
                           (fVar331 + auVar195._8_4_) * 0.33333334) +
                 ((fVar263 + auVar201._8_4_) * 0.33333334 + auVar328._8_4_ + auVar87._8_4_) *
                 fVar186;
    fStack_3bc = fVar211 * (auVar350._12_4_ + auVar341._12_4_ +
                           (fVar332 + auVar195._12_4_) * 0.33333334) +
                 ((fVar212 + auVar201._12_4_) * 0.33333334 + auVar328._12_4_ + auVar87._12_4_) *
                 fVar187;
    fVar251 = fVar188 * auVar119._0_4_ + fVar112 * auVar15._0_4_;
    fVar263 = fVar208 * auVar119._4_4_ + fVar151 * auVar15._4_4_;
    fVar111 = fVar209 * auVar119._8_4_ + fVar186 * auVar15._8_4_;
    fVar325 = fVar211 * auVar119._12_4_ + fVar187 * auVar15._12_4_;
    auVar83 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                            0x1c);
    auVar83 = vinsertps_avx(auVar83,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x28);
    local_3d8 = fVar188 * (auVar310._0_4_ + auVar293._0_4_) + auVar342._0_4_ * fVar112;
    fStack_3d4 = fVar208 * (auVar310._4_4_ + auVar293._4_4_) + auVar342._4_4_ * fVar151;
    fStack_3d0 = fVar209 * (auVar310._8_4_ + auVar293._8_4_) + auVar342._8_4_ * fVar186;
    fStack_3cc = fVar211 * (auVar310._12_4_ + auVar293._12_4_) + auVar342._12_4_ * fVar187;
    local_288 = vsubps_avx(_local_398,auVar83);
    auVar183 = vmovsldup_avx(local_288);
    auVar119 = vmovshdup_avx(local_288);
    auVar14 = vshufps_avx(local_288,local_288,0xaa);
    fVar112 = pre->ray_space[k].vx.field_0.m128[0];
    fVar151 = pre->ray_space[k].vx.field_0.m128[1];
    fVar186 = pre->ray_space[k].vx.field_0.m128[2];
    fVar187 = pre->ray_space[k].vx.field_0.m128[3];
    fVar188 = pre->ray_space[k].vy.field_0.m128[0];
    fVar208 = pre->ray_space[k].vy.field_0.m128[1];
    fVar209 = pre->ray_space[k].vy.field_0.m128[2];
    fVar211 = pre->ray_space[k].vy.field_0.m128[3];
    fVar213 = pre->ray_space[k].vz.field_0.m128[0];
    fVar235 = pre->ray_space[k].vz.field_0.m128[1];
    fVar236 = pre->ray_space[k].vz.field_0.m128[2];
    fVar237 = pre->ray_space[k].vz.field_0.m128[3];
    fVar252 = fVar112 * auVar183._0_4_ + fVar188 * auVar119._0_4_ + fVar213 * auVar14._0_4_;
    fVar212 = fVar151 * auVar183._4_4_ + fVar208 * auVar119._4_4_ + fVar235 * auVar14._4_4_;
    local_5c8._4_4_ = fVar212;
    local_5c8._0_4_ = fVar252;
    fStack_5c0 = fVar186 * auVar183._8_4_ + fVar209 * auVar119._8_4_ + fVar236 * auVar14._8_4_;
    fStack_5bc = fVar187 * auVar183._12_4_ + fVar211 * auVar119._12_4_ + fVar237 * auVar14._12_4_;
    auVar60._4_4_ = fVar324;
    auVar60._0_4_ = fVar238;
    auVar60._8_4_ = fVar264;
    auVar60._12_4_ = fVar301;
    local_298 = vsubps_avx(auVar60,auVar83);
    auVar14 = vshufps_avx(local_298,local_298,0xaa);
    auVar119 = vmovshdup_avx(local_298);
    auVar183 = vmovsldup_avx(local_298);
    auVar351._0_4_ = fVar112 * auVar183._0_4_ + fVar188 * auVar119._0_4_ + fVar213 * auVar14._0_4_;
    auVar351._4_4_ = fVar151 * auVar183._4_4_ + fVar208 * auVar119._4_4_ + fVar235 * auVar14._4_4_;
    auVar351._8_4_ = fVar186 * auVar183._8_4_ + fVar209 * auVar119._8_4_ + fVar236 * auVar14._8_4_;
    auVar351._12_4_ =
         fVar187 * auVar183._12_4_ + fVar211 * auVar119._12_4_ + fVar237 * auVar14._12_4_;
    local_2a8 = vsubps_avx(_local_3a8,auVar83);
    auVar14 = vshufps_avx(local_2a8,local_2a8,0xaa);
    auVar119 = vmovshdup_avx(local_2a8);
    auVar183 = vmovsldup_avx(local_2a8);
    auVar343._0_4_ = fVar112 * auVar183._0_4_ + fVar188 * auVar119._0_4_ + fVar213 * auVar14._0_4_;
    auVar343._4_4_ = fVar151 * auVar183._4_4_ + fVar208 * auVar119._4_4_ + fVar235 * auVar14._4_4_;
    auVar343._8_4_ = fVar186 * auVar183._8_4_ + fVar209 * auVar119._8_4_ + fVar236 * auVar14._8_4_;
    auVar343._12_4_ =
         fVar187 * auVar183._12_4_ + fVar211 * auVar119._12_4_ + fVar237 * auVar14._12_4_;
    local_2b8 = vsubps_avx(_local_3b8,auVar83);
    auVar14 = vshufps_avx(local_2b8,local_2b8,0xaa);
    auVar119 = vmovshdup_avx(local_2b8);
    auVar183 = vmovsldup_avx(local_2b8);
    auVar129._0_4_ = auVar183._0_4_ * fVar112 + auVar119._0_4_ * fVar188 + fVar213 * auVar14._0_4_;
    auVar129._4_4_ = auVar183._4_4_ * fVar151 + auVar119._4_4_ * fVar208 + fVar235 * auVar14._4_4_;
    auVar129._8_4_ = auVar183._8_4_ * fVar186 + auVar119._8_4_ * fVar209 + fVar236 * auVar14._8_4_;
    auVar129._12_4_ =
         auVar183._12_4_ * fVar187 + auVar119._12_4_ * fVar211 + fVar237 * auVar14._12_4_;
    auVar58._4_4_ = fVar210;
    auVar58._0_4_ = fVar250;
    auVar58._8_4_ = fVar291;
    auVar58._12_4_ = fVar303;
    local_2c8 = vsubps_avx(auVar58,auVar83);
    auVar14 = vshufps_avx(local_2c8,local_2c8,0xaa);
    auVar119 = vmovshdup_avx(local_2c8);
    auVar183 = vmovsldup_avx(local_2c8);
    auVar287._0_4_ = auVar183._0_4_ * fVar112 + auVar119._0_4_ * fVar188 + auVar14._0_4_ * fVar213;
    auVar287._4_4_ = auVar183._4_4_ * fVar151 + auVar119._4_4_ * fVar208 + auVar14._4_4_ * fVar235;
    auVar287._8_4_ = auVar183._8_4_ * fVar186 + auVar119._8_4_ * fVar209 + auVar14._8_4_ * fVar236;
    auVar287._12_4_ =
         auVar183._12_4_ * fVar187 + auVar119._12_4_ * fVar211 + auVar14._12_4_ * fVar237;
    local_2d8 = vsubps_avx(_local_3c8,auVar83);
    auVar14 = vshufps_avx(local_2d8,local_2d8,0xaa);
    auVar119 = vmovshdup_avx(local_2d8);
    auVar183 = vmovsldup_avx(local_2d8);
    auVar295._0_4_ = auVar183._0_4_ * fVar112 + auVar119._0_4_ * fVar188 + auVar14._0_4_ * fVar213;
    auVar295._4_4_ = auVar183._4_4_ * fVar151 + auVar119._4_4_ * fVar208 + auVar14._4_4_ * fVar235;
    auVar295._8_4_ = auVar183._8_4_ * fVar186 + auVar119._8_4_ * fVar209 + auVar14._8_4_ * fVar236;
    auVar295._12_4_ =
         auVar183._12_4_ * fVar187 + auVar119._12_4_ * fVar211 + auVar14._12_4_ * fVar237;
    auVar56._4_4_ = fVar263;
    auVar56._0_4_ = fVar251;
    auVar56._8_4_ = fVar111;
    auVar56._12_4_ = fVar325;
    local_2e8 = vsubps_avx(auVar56,auVar83);
    auVar14 = vshufps_avx(local_2e8,local_2e8,0xaa);
    auVar119 = vmovshdup_avx(local_2e8);
    auVar183 = vmovsldup_avx(local_2e8);
    auVar311._0_4_ = auVar183._0_4_ * fVar112 + auVar119._0_4_ * fVar188 + auVar14._0_4_ * fVar213;
    auVar311._4_4_ = auVar183._4_4_ * fVar151 + auVar119._4_4_ * fVar208 + auVar14._4_4_ * fVar235;
    auVar311._8_4_ = auVar183._8_4_ * fVar186 + auVar119._8_4_ * fVar209 + auVar14._8_4_ * fVar236;
    auVar311._12_4_ =
         auVar183._12_4_ * fVar187 + auVar119._12_4_ * fVar211 + auVar14._12_4_ * fVar237;
    auVar62._4_4_ = fStack_3d4;
    auVar62._0_4_ = local_3d8;
    auVar62._8_4_ = fStack_3d0;
    auVar62._12_4_ = fStack_3cc;
    local_2f8 = vsubps_avx(auVar62,auVar83);
    auVar183 = vshufps_avx(local_2f8,local_2f8,0xaa);
    auVar83 = vmovshdup_avx(local_2f8);
    auVar119 = vmovsldup_avx(local_2f8);
    auVar88._0_4_ = fVar112 * auVar119._0_4_ + fVar188 * auVar83._0_4_ + fVar213 * auVar183._0_4_;
    auVar88._4_4_ = fVar151 * auVar119._4_4_ + fVar208 * auVar83._4_4_ + fVar235 * auVar183._4_4_;
    auVar88._8_4_ = fVar186 * auVar119._8_4_ + fVar209 * auVar83._8_4_ + fVar236 * auVar183._8_4_;
    auVar88._12_4_ =
         fVar187 * auVar119._12_4_ + fVar211 * auVar83._12_4_ + fVar237 * auVar183._12_4_;
    auVar14 = vmovlhps_avx(_local_5c8,auVar287);
    auVar15 = vmovlhps_avx(auVar351,auVar295);
    auVar200 = vmovlhps_avx(auVar343,auVar311);
    auVar120 = vmovlhps_avx(auVar129,auVar88);
    auVar83 = vminps_avx(auVar14,auVar15);
    auVar119 = vminps_avx(auVar200,auVar120);
    auVar183 = vminps_avx(auVar83,auVar119);
    auVar83 = vmaxps_avx(auVar14,auVar15);
    auVar119 = vmaxps_avx(auVar200,auVar120);
    auVar83 = vmaxps_avx(auVar83,auVar119);
    auVar119 = vshufpd_avx(auVar183,auVar183,3);
    auVar183 = vminps_avx(auVar183,auVar119);
    auVar119 = vshufpd_avx(auVar83,auVar83,3);
    auVar119 = vmaxps_avx(auVar83,auVar119);
    auVar256._8_4_ = 0x7fffffff;
    auVar256._0_8_ = 0x7fffffff7fffffff;
    auVar256._12_4_ = 0x7fffffff;
    auVar83 = vandps_avx(auVar183,auVar256);
    auVar119 = vandps_avx(auVar119,auVar256);
    auVar83 = vmaxps_avx(auVar83,auVar119);
    auVar119 = vmovshdup_avx(auVar83);
    auVar83 = vmaxss_avx(auVar119,auVar83);
    fVar151 = auVar83._0_4_ * 9.536743e-07;
    auVar83 = vshufps_avx(ZEXT416((uint)fVar151),ZEXT416((uint)fVar151),0);
    local_228._16_16_ = auVar83;
    local_228._0_16_ = auVar83;
    auVar89._0_8_ = auVar83._0_8_ ^ 0x8000000080000000;
    auVar89._8_4_ = auVar83._8_4_ ^ 0x80000000;
    auVar89._12_4_ = auVar83._12_4_ ^ 0x80000000;
    local_248._16_16_ = auVar89;
    local_248._0_16_ = auVar89;
    local_368 = vpshufd_avx(ZEXT416(uVar64),0);
    local_378 = vpshufd_avx(ZEXT416(uVar6),0);
    uVar71 = 0;
    fVar112 = *(float *)(ray + k * 4 + 0x30);
    _local_258 = vsubps_avx(auVar15,auVar14);
    _local_268 = vsubps_avx(auVar200,auVar15);
    _local_278 = vsubps_avx(auVar120,auVar200);
    auVar59._4_4_ = fVar210;
    auVar59._0_4_ = fVar250;
    auVar59._8_4_ = fVar291;
    auVar59._12_4_ = fVar303;
    _local_318 = vsubps_avx(auVar59,_local_398);
    auVar61._4_4_ = fVar324;
    auVar61._0_4_ = fVar238;
    auVar61._8_4_ = fVar264;
    auVar61._12_4_ = fVar301;
    _local_328 = vsubps_avx(_local_3c8,auVar61);
    auVar57._4_4_ = fVar263;
    auVar57._0_4_ = fVar251;
    auVar57._8_4_ = fVar111;
    auVar57._12_4_ = fVar325;
    _local_338 = vsubps_avx(auVar57,_local_3a8);
    _local_348 = vsubps_avx(auVar62,_local_3b8);
    auVar323 = ZEXT1664(ZEXT816(0x3f80000000000000));
    auVar363 = ZEXT1664(ZEXT816(0x3f80000000000000));
LAB_00f86099:
    auVar113 = auVar363._0_16_;
    local_308 = auVar113;
    auVar74 = auVar323._0_16_;
    auVar83 = vshufps_avx(auVar74,auVar74,0x50);
    auVar352._8_4_ = 0x3f800000;
    auVar352._0_8_ = 0x3f8000003f800000;
    auVar352._12_4_ = 0x3f800000;
    auVar355._16_4_ = 0x3f800000;
    auVar355._0_16_ = auVar352;
    auVar355._20_4_ = 0x3f800000;
    auVar355._24_4_ = 0x3f800000;
    auVar355._28_4_ = 0x3f800000;
    auVar119 = vsubps_avx(auVar352,auVar83);
    fVar186 = auVar83._0_4_;
    fVar187 = auVar83._4_4_;
    fVar188 = auVar83._8_4_;
    fVar208 = auVar83._12_4_;
    fVar209 = auVar119._0_4_;
    fVar211 = auVar119._4_4_;
    fVar213 = auVar119._8_4_;
    fVar235 = auVar119._12_4_;
    auVar203._0_4_ = auVar287._0_4_ * fVar186 + fVar209 * fVar252;
    auVar203._4_4_ = auVar287._4_4_ * fVar187 + fVar211 * fVar212;
    auVar203._8_4_ = auVar287._0_4_ * fVar188 + fVar213 * fVar252;
    auVar203._12_4_ = auVar287._4_4_ * fVar208 + fVar235 * fVar212;
    auVar166._0_4_ = auVar295._0_4_ * fVar186 + fVar209 * auVar351._0_4_;
    auVar166._4_4_ = auVar295._4_4_ * fVar187 + fVar211 * auVar351._4_4_;
    auVar166._8_4_ = auVar295._0_4_ * fVar188 + fVar213 * auVar351._0_4_;
    auVar166._12_4_ = auVar295._4_4_ * fVar208 + fVar235 * auVar351._4_4_;
    auVar278._0_4_ = auVar311._0_4_ * fVar186 + auVar343._0_4_ * fVar209;
    auVar278._4_4_ = auVar311._4_4_ * fVar187 + auVar343._4_4_ * fVar211;
    auVar278._8_4_ = auVar311._0_4_ * fVar188 + auVar343._0_4_ * fVar213;
    auVar278._12_4_ = auVar311._4_4_ * fVar208 + auVar343._4_4_ * fVar235;
    auVar222._0_4_ = auVar88._0_4_ * fVar186 + auVar129._0_4_ * fVar209;
    auVar222._4_4_ = auVar88._4_4_ * fVar187 + auVar129._4_4_ * fVar211;
    auVar222._8_4_ = auVar88._0_4_ * fVar188 + auVar129._0_4_ * fVar213;
    auVar222._12_4_ = auVar88._4_4_ * fVar208 + auVar129._4_4_ * fVar235;
    auVar83 = vmovshdup_avx(auVar113);
    auVar119 = vshufps_avx(auVar113,auVar113,0);
    auVar299._16_16_ = auVar119;
    auVar299._0_16_ = auVar119;
    auVar183 = vshufps_avx(auVar113,auVar113,0x55);
    auVar106._16_16_ = auVar183;
    auVar106._0_16_ = auVar183;
    auVar105 = vsubps_avx(auVar106,auVar299);
    auVar183 = vshufps_avx(auVar203,auVar203,0);
    auVar143 = vshufps_avx(auVar203,auVar203,0x55);
    auVar132 = vshufps_avx(auVar166,auVar166,0);
    auVar169 = vshufps_avx(auVar166,auVar166,0x55);
    auVar82 = vshufps_avx(auVar278,auVar278,0);
    auVar265 = vshufps_avx(auVar278,auVar278,0x55);
    auVar72 = vshufps_avx(auVar222,auVar222,0);
    auVar73 = vshufps_avx(auVar222,auVar222,0x55);
    auVar83 = ZEXT416((uint)((auVar83._0_4_ - auVar363._0_4_) * 0.04761905));
    auVar83 = vshufps_avx(auVar83,auVar83,0);
    auVar315._0_4_ = auVar119._0_4_ + auVar105._0_4_ * 0.0;
    auVar315._4_4_ = auVar119._4_4_ + auVar105._4_4_ * 0.14285715;
    auVar315._8_4_ = auVar119._8_4_ + auVar105._8_4_ * 0.2857143;
    auVar315._12_4_ = auVar119._12_4_ + auVar105._12_4_ * 0.42857146;
    auVar315._16_4_ = auVar119._0_4_ + auVar105._16_4_ * 0.5714286;
    auVar315._20_4_ = auVar119._4_4_ + auVar105._20_4_ * 0.71428573;
    auVar315._24_4_ = auVar119._8_4_ + auVar105._24_4_ * 0.8571429;
    auVar315._28_4_ = auVar119._12_4_ + auVar105._28_4_;
    auVar16 = vsubps_avx(auVar355,auVar315);
    fVar186 = auVar132._0_4_;
    fVar188 = auVar132._4_4_;
    fVar209 = auVar132._8_4_;
    fVar213 = auVar132._12_4_;
    fVar370 = auVar16._0_4_;
    fVar302 = auVar16._4_4_;
    fVar304 = auVar16._8_4_;
    fVar305 = auVar16._12_4_;
    fVar306 = auVar16._16_4_;
    fVar307 = auVar16._20_4_;
    fVar308 = auVar16._24_4_;
    fVar358 = auVar169._0_4_;
    fVar364 = auVar169._4_4_;
    fVar369 = auVar169._8_4_;
    fVar365 = auVar169._12_4_;
    fVar348 = auVar143._12_4_ + 1.0;
    fVar347 = auVar82._0_4_;
    fVar349 = auVar82._4_4_;
    fVar356 = auVar82._8_4_;
    fVar357 = auVar82._12_4_;
    fVar236 = fVar347 * auVar315._0_4_ + fVar370 * fVar186;
    fVar237 = fVar349 * auVar315._4_4_ + fVar302 * fVar188;
    fVar331 = fVar356 * auVar315._8_4_ + fVar304 * fVar209;
    fVar332 = fVar357 * auVar315._12_4_ + fVar305 * fVar213;
    fVar333 = fVar347 * auVar315._16_4_ + fVar306 * fVar186;
    fVar338 = fVar349 * auVar315._20_4_ + fVar307 * fVar188;
    fVar345 = fVar356 * auVar315._24_4_ + fVar308 * fVar209;
    fVar187 = auVar265._0_4_;
    fVar208 = auVar265._4_4_;
    fVar211 = auVar265._8_4_;
    fVar235 = auVar265._12_4_;
    fVar359 = fVar358 * fVar370 + auVar315._0_4_ * fVar187;
    fVar366 = fVar364 * fVar302 + auVar315._4_4_ * fVar208;
    fVar360 = fVar369 * fVar304 + auVar315._8_4_ * fVar211;
    fVar367 = fVar365 * fVar305 + auVar315._12_4_ * fVar235;
    fVar334 = fVar358 * fVar306 + auVar315._16_4_ * fVar187;
    fVar335 = fVar364 * fVar307 + auVar315._20_4_ * fVar208;
    fVar336 = fVar369 * fVar308 + auVar315._24_4_ * fVar211;
    fVar337 = fVar365 + fVar213;
    auVar119 = vshufps_avx(auVar203,auVar203,0xaa);
    auVar132 = vshufps_avx(auVar203,auVar203,0xff);
    fVar346 = fVar357 + 0.0;
    auVar169 = vshufps_avx(auVar166,auVar166,0xaa);
    auVar82 = vshufps_avx(auVar166,auVar166,0xff);
    auVar233._0_4_ =
         fVar370 * (auVar315._0_4_ * fVar186 + fVar370 * auVar183._0_4_) + auVar315._0_4_ * fVar236;
    auVar233._4_4_ =
         fVar302 * (auVar315._4_4_ * fVar188 + fVar302 * auVar183._4_4_) + auVar315._4_4_ * fVar237;
    auVar233._8_4_ =
         fVar304 * (auVar315._8_4_ * fVar209 + fVar304 * auVar183._8_4_) + auVar315._8_4_ * fVar331;
    auVar233._12_4_ =
         fVar305 * (auVar315._12_4_ * fVar213 + fVar305 * auVar183._12_4_) +
         auVar315._12_4_ * fVar332;
    auVar233._16_4_ =
         fVar306 * (auVar315._16_4_ * fVar186 + fVar306 * auVar183._0_4_) +
         auVar315._16_4_ * fVar333;
    auVar233._20_4_ =
         fVar307 * (auVar315._20_4_ * fVar188 + fVar307 * auVar183._4_4_) +
         auVar315._20_4_ * fVar338;
    auVar233._24_4_ =
         fVar308 * (auVar315._24_4_ * fVar209 + fVar308 * auVar183._8_4_) +
         auVar315._24_4_ * fVar345;
    auVar233._28_4_ = auVar183._12_4_ + 1.0 + fVar235;
    auVar248._0_4_ =
         fVar370 * (fVar358 * auVar315._0_4_ + auVar143._0_4_ * fVar370) + auVar315._0_4_ * fVar359;
    auVar248._4_4_ =
         fVar302 * (fVar364 * auVar315._4_4_ + auVar143._4_4_ * fVar302) + auVar315._4_4_ * fVar366;
    auVar248._8_4_ =
         fVar304 * (fVar369 * auVar315._8_4_ + auVar143._8_4_ * fVar304) + auVar315._8_4_ * fVar360;
    auVar248._12_4_ =
         fVar305 * (fVar365 * auVar315._12_4_ + auVar143._12_4_ * fVar305) +
         auVar315._12_4_ * fVar367;
    auVar248._16_4_ =
         fVar306 * (fVar358 * auVar315._16_4_ + auVar143._0_4_ * fVar306) +
         auVar315._16_4_ * fVar334;
    auVar248._20_4_ =
         fVar307 * (fVar364 * auVar315._20_4_ + auVar143._4_4_ * fVar307) +
         auVar315._20_4_ * fVar335;
    auVar248._24_4_ =
         fVar308 * (fVar369 * auVar315._24_4_ + auVar143._8_4_ * fVar308) +
         auVar315._24_4_ * fVar336;
    auVar248._28_4_ = auVar73._12_4_ + fVar235;
    auVar107._0_4_ =
         fVar370 * fVar236 + auVar315._0_4_ * (fVar347 * fVar370 + auVar72._0_4_ * auVar315._0_4_);
    auVar107._4_4_ =
         fVar302 * fVar237 + auVar315._4_4_ * (fVar349 * fVar302 + auVar72._4_4_ * auVar315._4_4_);
    auVar107._8_4_ =
         fVar304 * fVar331 + auVar315._8_4_ * (fVar356 * fVar304 + auVar72._8_4_ * auVar315._8_4_);
    auVar107._12_4_ =
         fVar305 * fVar332 +
         auVar315._12_4_ * (fVar357 * fVar305 + auVar72._12_4_ * auVar315._12_4_);
    auVar107._16_4_ =
         fVar306 * fVar333 + auVar315._16_4_ * (fVar347 * fVar306 + auVar72._0_4_ * auVar315._16_4_)
    ;
    auVar107._20_4_ =
         fVar307 * fVar338 + auVar315._20_4_ * (fVar349 * fVar307 + auVar72._4_4_ * auVar315._20_4_)
    ;
    auVar107._24_4_ =
         fVar308 * fVar345 + auVar315._24_4_ * (fVar356 * fVar308 + auVar72._8_4_ * auVar315._24_4_)
    ;
    auVar107._28_4_ = fVar213 + 1.0 + fVar346;
    auVar322._0_4_ =
         fVar370 * fVar359 + auVar315._0_4_ * (auVar73._0_4_ * auVar315._0_4_ + fVar370 * fVar187);
    auVar322._4_4_ =
         fVar302 * fVar366 + auVar315._4_4_ * (auVar73._4_4_ * auVar315._4_4_ + fVar302 * fVar208);
    auVar322._8_4_ =
         fVar304 * fVar360 + auVar315._8_4_ * (auVar73._8_4_ * auVar315._8_4_ + fVar304 * fVar211);
    auVar322._12_4_ =
         fVar305 * fVar367 +
         auVar315._12_4_ * (auVar73._12_4_ * auVar315._12_4_ + fVar305 * fVar235);
    auVar322._16_4_ =
         fVar306 * fVar334 + auVar315._16_4_ * (auVar73._0_4_ * auVar315._16_4_ + fVar306 * fVar187)
    ;
    auVar322._20_4_ =
         fVar307 * fVar335 + auVar315._20_4_ * (auVar73._4_4_ * auVar315._20_4_ + fVar307 * fVar208)
    ;
    auVar322._24_4_ =
         fVar308 * fVar336 + auVar315._24_4_ * (auVar73._8_4_ * auVar315._24_4_ + fVar308 * fVar211)
    ;
    auVar322._28_4_ = fVar346 + fVar235 + 0.0;
    local_98._0_4_ = fVar370 * auVar233._0_4_ + auVar315._0_4_ * auVar107._0_4_;
    local_98._4_4_ = fVar302 * auVar233._4_4_ + auVar315._4_4_ * auVar107._4_4_;
    local_98._8_4_ = fVar304 * auVar233._8_4_ + auVar315._8_4_ * auVar107._8_4_;
    local_98._12_4_ = fVar305 * auVar233._12_4_ + auVar315._12_4_ * auVar107._12_4_;
    local_98._16_4_ = fVar306 * auVar233._16_4_ + auVar315._16_4_ * auVar107._16_4_;
    local_98._20_4_ = fVar307 * auVar233._20_4_ + auVar315._20_4_ * auVar107._20_4_;
    local_98._24_4_ = fVar308 * auVar233._24_4_ + auVar315._24_4_ * auVar107._24_4_;
    local_98._28_4_ = fVar337 + fVar235 + 0.0;
    auVar207._0_4_ = fVar370 * auVar248._0_4_ + auVar315._0_4_ * auVar322._0_4_;
    auVar207._4_4_ = fVar302 * auVar248._4_4_ + auVar315._4_4_ * auVar322._4_4_;
    auVar207._8_4_ = fVar304 * auVar248._8_4_ + auVar315._8_4_ * auVar322._8_4_;
    auVar207._12_4_ = fVar305 * auVar248._12_4_ + auVar315._12_4_ * auVar322._12_4_;
    auVar207._16_4_ = fVar306 * auVar248._16_4_ + auVar315._16_4_ * auVar322._16_4_;
    auVar207._20_4_ = fVar307 * auVar248._20_4_ + auVar315._20_4_ * auVar322._20_4_;
    auVar207._24_4_ = fVar308 * auVar248._24_4_ + auVar315._24_4_ * auVar322._24_4_;
    auVar207._28_4_ = fVar337 + fVar346;
    auVar17 = vsubps_avx(auVar107,auVar233);
    auVar105 = vsubps_avx(auVar322,auVar248);
    local_538 = auVar83._0_4_;
    fStack_534 = auVar83._4_4_;
    fStack_530 = auVar83._8_4_;
    fStack_52c = auVar83._12_4_;
    local_d8 = local_538 * auVar17._0_4_ * 3.0;
    fStack_d4 = fStack_534 * auVar17._4_4_ * 3.0;
    auVar18._4_4_ = fStack_d4;
    auVar18._0_4_ = local_d8;
    fStack_d0 = fStack_530 * auVar17._8_4_ * 3.0;
    auVar18._8_4_ = fStack_d0;
    fStack_cc = fStack_52c * auVar17._12_4_ * 3.0;
    auVar18._12_4_ = fStack_cc;
    fStack_c8 = local_538 * auVar17._16_4_ * 3.0;
    auVar18._16_4_ = fStack_c8;
    fStack_c4 = fStack_534 * auVar17._20_4_ * 3.0;
    auVar18._20_4_ = fStack_c4;
    fStack_c0 = fStack_530 * auVar17._24_4_ * 3.0;
    auVar18._24_4_ = fStack_c0;
    auVar18._28_4_ = auVar17._28_4_;
    local_f8 = local_538 * auVar105._0_4_ * 3.0;
    fStack_f4 = fStack_534 * auVar105._4_4_ * 3.0;
    auVar19._4_4_ = fStack_f4;
    auVar19._0_4_ = local_f8;
    fStack_f0 = fStack_530 * auVar105._8_4_ * 3.0;
    auVar19._8_4_ = fStack_f0;
    fStack_ec = fStack_52c * auVar105._12_4_ * 3.0;
    auVar19._12_4_ = fStack_ec;
    fStack_e8 = local_538 * auVar105._16_4_ * 3.0;
    auVar19._16_4_ = fStack_e8;
    fStack_e4 = fStack_534 * auVar105._20_4_ * 3.0;
    auVar19._20_4_ = fStack_e4;
    fStack_e0 = fStack_530 * auVar105._24_4_ * 3.0;
    auVar19._24_4_ = fStack_e0;
    auVar19._28_4_ = fVar337;
    auVar18 = vsubps_avx(local_98,auVar18);
    auVar105 = vperm2f128_avx(auVar18,auVar18,1);
    auVar105 = vshufps_avx(auVar105,auVar18,0x30);
    auVar105 = vshufps_avx(auVar18,auVar105,0x29);
    auVar19 = vsubps_avx(auVar207,auVar19);
    auVar18 = vperm2f128_avx(auVar19,auVar19,1);
    auVar18 = vshufps_avx(auVar18,auVar19,0x30);
    auVar19 = vshufps_avx(auVar19,auVar18,0x29);
    fVar335 = auVar169._0_4_;
    fVar336 = auVar169._4_4_;
    fVar368 = auVar169._8_4_;
    fVar213 = auVar119._12_4_;
    fVar349 = auVar82._0_4_;
    fVar357 = auVar82._4_4_;
    fVar359 = auVar82._8_4_;
    fVar366 = auVar82._12_4_;
    auVar83 = vshufps_avx(auVar278,auVar278,0xaa);
    fVar186 = auVar83._0_4_;
    fVar188 = auVar83._4_4_;
    fVar209 = auVar83._8_4_;
    fVar235 = auVar83._12_4_;
    fVar331 = auVar315._0_4_ * fVar186 + fVar335 * fVar370;
    fVar332 = auVar315._4_4_ * fVar188 + fVar336 * fVar302;
    fVar333 = auVar315._8_4_ * fVar209 + fVar368 * fVar304;
    fVar338 = auVar315._12_4_ * fVar235 + auVar169._12_4_ * fVar305;
    fVar345 = auVar315._16_4_ * fVar186 + fVar335 * fVar306;
    fVar346 = auVar315._20_4_ * fVar188 + fVar336 * fVar307;
    fVar347 = auVar315._24_4_ * fVar209 + fVar368 * fVar308;
    auVar83 = vshufps_avx(auVar278,auVar278,0xff);
    fVar187 = auVar83._0_4_;
    fVar208 = auVar83._4_4_;
    fVar211 = auVar83._8_4_;
    fVar236 = auVar83._12_4_;
    fVar356 = auVar315._0_4_ * fVar187 + fVar349 * fVar370;
    fVar358 = auVar315._4_4_ * fVar208 + fVar357 * fVar302;
    fVar364 = auVar315._8_4_ * fVar211 + fVar359 * fVar304;
    fVar369 = auVar315._12_4_ * fVar236 + fVar366 * fVar305;
    fVar360 = auVar315._16_4_ * fVar187 + fVar349 * fVar306;
    fVar365 = auVar315._20_4_ * fVar208 + fVar357 * fVar307;
    fVar367 = auVar315._24_4_ * fVar211 + fVar359 * fVar308;
    auVar83 = vshufps_avx(auVar222,auVar222,0xaa);
    fVar334 = auVar83._12_4_ + fVar235;
    auVar183 = vshufps_avx(auVar222,auVar222,0xff);
    fVar237 = auVar183._12_4_;
    auVar108._0_4_ =
         fVar370 * (fVar335 * auVar315._0_4_ + fVar370 * auVar119._0_4_) + auVar315._0_4_ * fVar331;
    auVar108._4_4_ =
         fVar302 * (fVar336 * auVar315._4_4_ + fVar302 * auVar119._4_4_) + auVar315._4_4_ * fVar332;
    auVar108._8_4_ =
         fVar304 * (fVar368 * auVar315._8_4_ + fVar304 * auVar119._8_4_) + auVar315._8_4_ * fVar333;
    auVar108._12_4_ =
         fVar305 * (auVar169._12_4_ * auVar315._12_4_ + fVar305 * fVar213) +
         auVar315._12_4_ * fVar338;
    auVar108._16_4_ =
         fVar306 * (fVar335 * auVar315._16_4_ + fVar306 * auVar119._0_4_) +
         auVar315._16_4_ * fVar345;
    auVar108._20_4_ =
         fVar307 * (fVar336 * auVar315._20_4_ + fVar307 * auVar119._4_4_) +
         auVar315._20_4_ * fVar346;
    auVar108._24_4_ =
         fVar308 * (fVar368 * auVar315._24_4_ + fVar308 * auVar119._8_4_) +
         auVar315._24_4_ * fVar347;
    auVar108._28_4_ = auVar19._28_4_ + fVar213 + fVar237;
    auVar147._0_4_ =
         fVar370 * (fVar349 * auVar315._0_4_ + auVar132._0_4_ * fVar370) + auVar315._0_4_ * fVar356;
    auVar147._4_4_ =
         fVar302 * (fVar357 * auVar315._4_4_ + auVar132._4_4_ * fVar302) + auVar315._4_4_ * fVar358;
    auVar147._8_4_ =
         fVar304 * (fVar359 * auVar315._8_4_ + auVar132._8_4_ * fVar304) + auVar315._8_4_ * fVar364;
    auVar147._12_4_ =
         fVar305 * (fVar366 * auVar315._12_4_ + auVar132._12_4_ * fVar305) +
         auVar315._12_4_ * fVar369;
    auVar147._16_4_ =
         fVar306 * (fVar349 * auVar315._16_4_ + auVar132._0_4_ * fVar306) +
         auVar315._16_4_ * fVar360;
    auVar147._20_4_ =
         fVar307 * (fVar357 * auVar315._20_4_ + auVar132._4_4_ * fVar307) +
         auVar315._20_4_ * fVar365;
    auVar147._24_4_ =
         fVar308 * (fVar359 * auVar315._24_4_ + auVar132._8_4_ * fVar308) +
         auVar315._24_4_ * fVar367;
    auVar147._28_4_ = fVar213 + auVar18._28_4_ + fVar237;
    auVar18 = vperm2f128_avx(local_98,local_98,1);
    auVar18 = vshufps_avx(auVar18,local_98,0x30);
    auVar106 = vshufps_avx(local_98,auVar18,0x29);
    auVar249._0_4_ =
         auVar315._0_4_ * (auVar83._0_4_ * auVar315._0_4_ + fVar370 * fVar186) + fVar370 * fVar331;
    auVar249._4_4_ =
         auVar315._4_4_ * (auVar83._4_4_ * auVar315._4_4_ + fVar302 * fVar188) + fVar302 * fVar332;
    auVar249._8_4_ =
         auVar315._8_4_ * (auVar83._8_4_ * auVar315._8_4_ + fVar304 * fVar209) + fVar304 * fVar333;
    auVar249._12_4_ =
         auVar315._12_4_ * (auVar83._12_4_ * auVar315._12_4_ + fVar305 * fVar235) +
         fVar305 * fVar338;
    auVar249._16_4_ =
         auVar315._16_4_ * (auVar83._0_4_ * auVar315._16_4_ + fVar306 * fVar186) + fVar306 * fVar345
    ;
    auVar249._20_4_ =
         auVar315._20_4_ * (auVar83._4_4_ * auVar315._20_4_ + fVar307 * fVar188) + fVar307 * fVar346
    ;
    auVar249._24_4_ =
         auVar315._24_4_ * (auVar83._8_4_ * auVar315._24_4_ + fVar308 * fVar209) + fVar308 * fVar347
    ;
    auVar249._28_4_ = fVar334 + fVar348 + auVar248._28_4_;
    auVar290._0_4_ =
         fVar370 * fVar356 + auVar315._0_4_ * (auVar315._0_4_ * auVar183._0_4_ + fVar370 * fVar187);
    auVar290._4_4_ =
         fVar302 * fVar358 + auVar315._4_4_ * (auVar315._4_4_ * auVar183._4_4_ + fVar302 * fVar208);
    auVar290._8_4_ =
         fVar304 * fVar364 + auVar315._8_4_ * (auVar315._8_4_ * auVar183._8_4_ + fVar304 * fVar211);
    auVar290._12_4_ =
         fVar305 * fVar369 + auVar315._12_4_ * (auVar315._12_4_ * fVar237 + fVar305 * fVar236);
    auVar290._16_4_ =
         fVar306 * fVar360 +
         auVar315._16_4_ * (auVar315._16_4_ * auVar183._0_4_ + fVar306 * fVar187);
    auVar290._20_4_ =
         fVar307 * fVar365 +
         auVar315._20_4_ * (auVar315._20_4_ * auVar183._4_4_ + fVar307 * fVar208);
    auVar290._24_4_ =
         fVar308 * fVar367 +
         auVar315._24_4_ * (auVar315._24_4_ * auVar183._8_4_ + fVar308 * fVar211);
    auVar290._28_4_ = fVar348 + fVar366 + fVar237 + fVar236;
    auVar281._0_4_ = fVar370 * auVar108._0_4_ + auVar315._0_4_ * auVar249._0_4_;
    auVar281._4_4_ = fVar302 * auVar108._4_4_ + auVar315._4_4_ * auVar249._4_4_;
    auVar281._8_4_ = fVar304 * auVar108._8_4_ + auVar315._8_4_ * auVar249._8_4_;
    auVar281._12_4_ = fVar305 * auVar108._12_4_ + auVar315._12_4_ * auVar249._12_4_;
    auVar281._16_4_ = fVar306 * auVar108._16_4_ + auVar315._16_4_ * auVar249._16_4_;
    auVar281._20_4_ = fVar307 * auVar108._20_4_ + auVar315._20_4_ * auVar249._20_4_;
    auVar281._24_4_ = fVar308 * auVar108._24_4_ + auVar315._24_4_ * auVar249._24_4_;
    auVar281._28_4_ = fVar334 + fVar237 + fVar236;
    auVar300._0_4_ = fVar370 * auVar147._0_4_ + auVar315._0_4_ * auVar290._0_4_;
    auVar300._4_4_ = fVar302 * auVar147._4_4_ + auVar315._4_4_ * auVar290._4_4_;
    auVar300._8_4_ = fVar304 * auVar147._8_4_ + auVar315._8_4_ * auVar290._8_4_;
    auVar300._12_4_ = fVar305 * auVar147._12_4_ + auVar315._12_4_ * auVar290._12_4_;
    auVar300._16_4_ = fVar306 * auVar147._16_4_ + auVar315._16_4_ * auVar290._16_4_;
    auVar300._20_4_ = fVar307 * auVar147._20_4_ + auVar315._20_4_ * auVar290._20_4_;
    auVar300._24_4_ = fVar308 * auVar147._24_4_ + auVar315._24_4_ * auVar290._24_4_;
    auVar300._28_4_ = auVar16._28_4_ + auVar315._28_4_;
    auVar20 = vsubps_avx(auVar249,auVar108);
    auVar18 = vsubps_avx(auVar290,auVar147);
    local_118 = local_538 * auVar20._0_4_ * 3.0;
    fStack_114 = fStack_534 * auVar20._4_4_ * 3.0;
    auVar16._4_4_ = fStack_114;
    auVar16._0_4_ = local_118;
    fStack_110 = fStack_530 * auVar20._8_4_ * 3.0;
    auVar16._8_4_ = fStack_110;
    fStack_10c = fStack_52c * auVar20._12_4_ * 3.0;
    auVar16._12_4_ = fStack_10c;
    fStack_108 = local_538 * auVar20._16_4_ * 3.0;
    auVar16._16_4_ = fStack_108;
    fStack_104 = fStack_534 * auVar20._20_4_ * 3.0;
    auVar16._20_4_ = fStack_104;
    fStack_100 = fStack_530 * auVar20._24_4_ * 3.0;
    auVar16._24_4_ = fStack_100;
    auVar16._28_4_ = auVar20._28_4_;
    local_138 = local_538 * auVar18._0_4_ * 3.0;
    fStack_134 = fStack_534 * auVar18._4_4_ * 3.0;
    auVar21._4_4_ = fStack_134;
    auVar21._0_4_ = local_138;
    fStack_130 = fStack_530 * auVar18._8_4_ * 3.0;
    auVar21._8_4_ = fStack_130;
    fStack_12c = fStack_52c * auVar18._12_4_ * 3.0;
    auVar21._12_4_ = fStack_12c;
    fStack_128 = local_538 * auVar18._16_4_ * 3.0;
    auVar21._16_4_ = fStack_128;
    fStack_124 = fStack_534 * auVar18._20_4_ * 3.0;
    auVar21._20_4_ = fStack_124;
    fStack_120 = fStack_530 * auVar18._24_4_ * 3.0;
    auVar21._24_4_ = fStack_120;
    auVar21._28_4_ = auVar249._28_4_;
    auVar18 = vperm2f128_avx(auVar281,auVar281,1);
    auVar18 = vshufps_avx(auVar18,auVar281,0x30);
    auVar107 = vshufps_avx(auVar281,auVar18,0x29);
    auVar16 = vsubps_avx(auVar281,auVar16);
    auVar18 = vperm2f128_avx(auVar16,auVar16,1);
    auVar18 = vshufps_avx(auVar18,auVar16,0x30);
    auVar18 = vshufps_avx(auVar16,auVar18,0x29);
    auVar21 = vsubps_avx(auVar300,auVar21);
    auVar16 = vperm2f128_avx(auVar21,auVar21,1);
    auVar16 = vshufps_avx(auVar16,auVar21,0x30);
    auVar21 = vshufps_avx(auVar21,auVar16,0x29);
    auVar22 = vsubps_avx(auVar281,local_98);
    auVar108 = vsubps_avx(auVar107,auVar106);
    fVar186 = auVar108._0_4_ + auVar22._0_4_;
    fVar187 = auVar108._4_4_ + auVar22._4_4_;
    fVar188 = auVar108._8_4_ + auVar22._8_4_;
    fVar208 = auVar108._12_4_ + auVar22._12_4_;
    fVar209 = auVar108._16_4_ + auVar22._16_4_;
    fVar211 = auVar108._20_4_ + auVar22._20_4_;
    fVar213 = auVar108._24_4_ + auVar22._24_4_;
    auVar16 = vperm2f128_avx(auVar207,auVar207,1);
    auVar16 = vshufps_avx(auVar16,auVar207,0x30);
    local_b8 = vshufps_avx(auVar207,auVar16,0x29);
    auVar16 = vperm2f128_avx(auVar300,auVar300,1);
    auVar16 = vshufps_avx(auVar16,auVar300,0x30);
    local_78 = vshufps_avx(auVar300,auVar16,0x29);
    auVar16 = vsubps_avx(auVar300,auVar207);
    auVar147 = vsubps_avx(local_78,local_b8);
    fVar235 = auVar147._0_4_ + auVar16._0_4_;
    fVar236 = auVar147._4_4_ + auVar16._4_4_;
    fVar237 = auVar147._8_4_ + auVar16._8_4_;
    fVar331 = auVar147._12_4_ + auVar16._12_4_;
    fVar332 = auVar147._16_4_ + auVar16._16_4_;
    fVar333 = auVar147._20_4_ + auVar16._20_4_;
    fVar338 = auVar147._24_4_ + auVar16._24_4_;
    auVar23._4_4_ = fVar187 * auVar207._4_4_;
    auVar23._0_4_ = fVar186 * auVar207._0_4_;
    auVar23._8_4_ = fVar188 * auVar207._8_4_;
    auVar23._12_4_ = fVar208 * auVar207._12_4_;
    auVar23._16_4_ = fVar209 * auVar207._16_4_;
    auVar23._20_4_ = fVar211 * auVar207._20_4_;
    auVar23._24_4_ = fVar213 * auVar207._24_4_;
    auVar23._28_4_ = auVar16._28_4_;
    auVar24._4_4_ = fVar236 * local_98._4_4_;
    auVar24._0_4_ = fVar235 * local_98._0_4_;
    auVar24._8_4_ = fVar237 * local_98._8_4_;
    auVar24._12_4_ = fVar331 * local_98._12_4_;
    auVar24._16_4_ = fVar332 * local_98._16_4_;
    auVar24._20_4_ = fVar333 * local_98._20_4_;
    auVar24._24_4_ = fVar338 * local_98._24_4_;
    auVar24._28_4_ = fVar334;
    auVar23 = vsubps_avx(auVar23,auVar24);
    local_d8 = local_98._0_4_ + local_d8;
    fStack_d4 = local_98._4_4_ + fStack_d4;
    fStack_d0 = local_98._8_4_ + fStack_d0;
    fStack_cc = local_98._12_4_ + fStack_cc;
    fStack_c8 = local_98._16_4_ + fStack_c8;
    fStack_c4 = local_98._20_4_ + fStack_c4;
    fStack_c0 = local_98._24_4_ + fStack_c0;
    fStack_bc = local_98._28_4_ + auVar17._28_4_;
    local_f8 = local_f8 + auVar207._0_4_;
    fStack_f4 = fStack_f4 + auVar207._4_4_;
    fStack_f0 = fStack_f0 + auVar207._8_4_;
    fStack_ec = fStack_ec + auVar207._12_4_;
    fStack_e8 = fStack_e8 + auVar207._16_4_;
    fStack_e4 = fStack_e4 + auVar207._20_4_;
    fStack_e0 = fStack_e0 + auVar207._24_4_;
    fStack_dc = fVar337 + auVar207._28_4_;
    auVar17._4_4_ = fVar187 * fStack_f4;
    auVar17._0_4_ = fVar186 * local_f8;
    auVar17._8_4_ = fVar188 * fStack_f0;
    auVar17._12_4_ = fVar208 * fStack_ec;
    auVar17._16_4_ = fVar209 * fStack_e8;
    auVar17._20_4_ = fVar211 * fStack_e4;
    auVar17._24_4_ = fVar213 * fStack_e0;
    auVar17._28_4_ = fVar337;
    auVar25._4_4_ = fVar236 * fStack_d4;
    auVar25._0_4_ = fVar235 * local_d8;
    auVar25._8_4_ = fVar237 * fStack_d0;
    auVar25._12_4_ = fVar331 * fStack_cc;
    auVar25._16_4_ = fVar332 * fStack_c8;
    auVar25._20_4_ = fVar333 * fStack_c4;
    auVar25._24_4_ = fVar338 * fStack_c0;
    auVar25._28_4_ = fVar337 + auVar207._28_4_;
    auVar17 = vsubps_avx(auVar17,auVar25);
    local_4f8 = auVar19._0_4_;
    fStack_4f4 = auVar19._4_4_;
    fStack_4f0 = auVar19._8_4_;
    fStack_4ec = auVar19._12_4_;
    fStack_4e8 = auVar19._16_4_;
    fStack_4e4 = auVar19._20_4_;
    fStack_4e0 = auVar19._24_4_;
    auVar26._4_4_ = fVar187 * fStack_4f4;
    auVar26._0_4_ = fVar186 * local_4f8;
    auVar26._8_4_ = fVar188 * fStack_4f0;
    auVar26._12_4_ = fVar208 * fStack_4ec;
    auVar26._16_4_ = fVar209 * fStack_4e8;
    auVar26._20_4_ = fVar211 * fStack_4e4;
    auVar26._24_4_ = fVar213 * fStack_4e0;
    auVar26._28_4_ = fVar337;
    local_558 = auVar105._0_4_;
    fStack_554 = auVar105._4_4_;
    fStack_550 = auVar105._8_4_;
    fStack_54c = auVar105._12_4_;
    fStack_548 = auVar105._16_4_;
    fStack_544 = auVar105._20_4_;
    fStack_540 = auVar105._24_4_;
    auVar27._4_4_ = fVar236 * fStack_554;
    auVar27._0_4_ = fVar235 * local_558;
    auVar27._8_4_ = fVar237 * fStack_550;
    auVar27._12_4_ = fVar331 * fStack_54c;
    auVar27._16_4_ = fVar332 * fStack_548;
    auVar27._20_4_ = fVar333 * fStack_544;
    auVar27._24_4_ = fVar338 * fStack_540;
    auVar27._28_4_ = local_98._28_4_;
    auVar24 = vsubps_avx(auVar26,auVar27);
    auVar28._4_4_ = local_b8._4_4_ * fVar187;
    auVar28._0_4_ = local_b8._0_4_ * fVar186;
    auVar28._8_4_ = local_b8._8_4_ * fVar188;
    auVar28._12_4_ = local_b8._12_4_ * fVar208;
    auVar28._16_4_ = local_b8._16_4_ * fVar209;
    auVar28._20_4_ = local_b8._20_4_ * fVar211;
    auVar28._24_4_ = local_b8._24_4_ * fVar213;
    auVar28._28_4_ = fVar337;
    auVar29._4_4_ = auVar106._4_4_ * fVar236;
    auVar29._0_4_ = auVar106._0_4_ * fVar235;
    auVar29._8_4_ = auVar106._8_4_ * fVar237;
    auVar29._12_4_ = auVar106._12_4_ * fVar331;
    auVar29._16_4_ = auVar106._16_4_ * fVar332;
    auVar29._20_4_ = auVar106._20_4_ * fVar333;
    auVar29._24_4_ = auVar106._24_4_ * fVar338;
    auVar29._28_4_ = local_b8._28_4_;
    local_538 = auVar18._0_4_;
    fStack_534 = auVar18._4_4_;
    fStack_530 = auVar18._8_4_;
    fStack_52c = auVar18._12_4_;
    fStack_528 = auVar18._16_4_;
    fStack_524 = auVar18._20_4_;
    fStack_520 = auVar18._24_4_;
    auVar25 = vsubps_avx(auVar28,auVar29);
    auVar30._4_4_ = auVar300._4_4_ * fVar187;
    auVar30._0_4_ = auVar300._0_4_ * fVar186;
    auVar30._8_4_ = auVar300._8_4_ * fVar188;
    auVar30._12_4_ = auVar300._12_4_ * fVar208;
    auVar30._16_4_ = auVar300._16_4_ * fVar209;
    auVar30._20_4_ = auVar300._20_4_ * fVar211;
    auVar30._24_4_ = auVar300._24_4_ * fVar213;
    auVar30._28_4_ = fVar337;
    auVar31._4_4_ = fVar236 * auVar281._4_4_;
    auVar31._0_4_ = fVar235 * auVar281._0_4_;
    auVar31._8_4_ = fVar237 * auVar281._8_4_;
    auVar31._12_4_ = fVar331 * auVar281._12_4_;
    auVar31._16_4_ = fVar332 * auVar281._16_4_;
    auVar31._20_4_ = fVar333 * auVar281._20_4_;
    auVar31._24_4_ = fVar338 * auVar281._24_4_;
    auVar31._28_4_ = fStack_bc;
    auVar26 = vsubps_avx(auVar30,auVar31);
    local_118 = auVar281._0_4_ + local_118;
    fStack_114 = auVar281._4_4_ + fStack_114;
    fStack_110 = auVar281._8_4_ + fStack_110;
    fStack_10c = auVar281._12_4_ + fStack_10c;
    fStack_108 = auVar281._16_4_ + fStack_108;
    fStack_104 = auVar281._20_4_ + fStack_104;
    fStack_100 = auVar281._24_4_ + fStack_100;
    fStack_fc = auVar281._28_4_ + auVar20._28_4_;
    local_138 = auVar300._0_4_ + local_138;
    fStack_134 = auVar300._4_4_ + fStack_134;
    fStack_130 = auVar300._8_4_ + fStack_130;
    fStack_12c = auVar300._12_4_ + fStack_12c;
    fStack_128 = auVar300._16_4_ + fStack_128;
    fStack_124 = auVar300._20_4_ + fStack_124;
    fStack_120 = auVar300._24_4_ + fStack_120;
    fStack_11c = auVar300._28_4_ + auVar249._28_4_;
    auVar20._4_4_ = fVar187 * fStack_134;
    auVar20._0_4_ = fVar186 * local_138;
    auVar20._8_4_ = fVar188 * fStack_130;
    auVar20._12_4_ = fVar208 * fStack_12c;
    auVar20._16_4_ = fVar209 * fStack_128;
    auVar20._20_4_ = fVar211 * fStack_124;
    auVar20._24_4_ = fVar213 * fStack_120;
    auVar20._28_4_ = auVar300._28_4_ + auVar249._28_4_;
    auVar32._4_4_ = fStack_114 * fVar236;
    auVar32._0_4_ = local_118 * fVar235;
    auVar32._8_4_ = fStack_110 * fVar237;
    auVar32._12_4_ = fStack_10c * fVar331;
    auVar32._16_4_ = fStack_108 * fVar332;
    auVar32._20_4_ = fStack_104 * fVar333;
    auVar32._24_4_ = fStack_100 * fVar338;
    auVar32._28_4_ = fStack_fc;
    auVar20 = vsubps_avx(auVar20,auVar32);
    auVar33._4_4_ = fVar187 * auVar21._4_4_;
    auVar33._0_4_ = fVar186 * auVar21._0_4_;
    auVar33._8_4_ = fVar188 * auVar21._8_4_;
    auVar33._12_4_ = fVar208 * auVar21._12_4_;
    auVar33._16_4_ = fVar209 * auVar21._16_4_;
    auVar33._20_4_ = fVar211 * auVar21._20_4_;
    auVar33._24_4_ = fVar213 * auVar21._24_4_;
    auVar33._28_4_ = fStack_fc;
    auVar34._4_4_ = fVar236 * fStack_534;
    auVar34._0_4_ = fVar235 * local_538;
    auVar34._8_4_ = fVar237 * fStack_530;
    auVar34._12_4_ = fVar331 * fStack_52c;
    auVar34._16_4_ = fVar332 * fStack_528;
    auVar34._20_4_ = fVar333 * fStack_524;
    auVar34._24_4_ = fVar338 * fStack_520;
    auVar34._28_4_ = auVar21._28_4_;
    auVar27 = vsubps_avx(auVar33,auVar34);
    auVar35._4_4_ = fVar187 * local_78._4_4_;
    auVar35._0_4_ = fVar186 * local_78._0_4_;
    auVar35._8_4_ = fVar188 * local_78._8_4_;
    auVar35._12_4_ = fVar208 * local_78._12_4_;
    auVar35._16_4_ = fVar209 * local_78._16_4_;
    auVar35._20_4_ = fVar211 * local_78._20_4_;
    auVar35._24_4_ = fVar213 * local_78._24_4_;
    auVar35._28_4_ = auVar108._28_4_ + auVar22._28_4_;
    auVar22._4_4_ = auVar107._4_4_ * fVar236;
    auVar22._0_4_ = auVar107._0_4_ * fVar235;
    auVar22._8_4_ = auVar107._8_4_ * fVar237;
    auVar22._12_4_ = auVar107._12_4_ * fVar331;
    auVar22._16_4_ = auVar107._16_4_ * fVar332;
    auVar22._20_4_ = auVar107._20_4_ * fVar333;
    auVar22._24_4_ = auVar107._24_4_ * fVar338;
    auVar22._28_4_ = auVar147._28_4_ + auVar16._28_4_;
    auVar22 = vsubps_avx(auVar35,auVar22);
    auVar18 = vminps_avx(auVar23,auVar17);
    auVar105 = vmaxps_avx(auVar23,auVar17);
    auVar19 = vminps_avx(auVar24,auVar25);
    auVar19 = vminps_avx(auVar18,auVar19);
    auVar18 = vmaxps_avx(auVar24,auVar25);
    auVar105 = vmaxps_avx(auVar105,auVar18);
    auVar16 = vminps_avx(auVar26,auVar20);
    auVar18 = vmaxps_avx(auVar26,auVar20);
    auVar17 = vminps_avx(auVar27,auVar22);
    auVar17 = vminps_avx(auVar16,auVar17);
    auVar17 = vminps_avx(auVar19,auVar17);
    auVar19 = vmaxps_avx(auVar27,auVar22);
    auVar18 = vmaxps_avx(auVar18,auVar19);
    auVar18 = vmaxps_avx(auVar105,auVar18);
    auVar105 = vcmpps_avx(auVar17,local_228,2);
    auVar18 = vcmpps_avx(auVar18,local_248,5);
    auVar105 = vandps_avx(auVar18,auVar105);
    auVar18 = local_158 & auVar105;
    if ((((((((auVar18 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar18 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar18 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar18 >> 0x7f,0) != '\0') ||
          (auVar18 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar18 >> 0xbf,0) != '\0') ||
        (auVar18 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar18[0x1f] < '\0')
    {
      auVar18 = vsubps_avx(auVar106,local_98);
      auVar19 = vsubps_avx(auVar107,auVar281);
      fVar187 = auVar18._0_4_ + auVar19._0_4_;
      fVar188 = auVar18._4_4_ + auVar19._4_4_;
      fVar208 = auVar18._8_4_ + auVar19._8_4_;
      fVar209 = auVar18._12_4_ + auVar19._12_4_;
      fVar211 = auVar18._16_4_ + auVar19._16_4_;
      fVar213 = auVar18._20_4_ + auVar19._20_4_;
      fVar235 = auVar18._24_4_ + auVar19._24_4_;
      auVar17 = vsubps_avx(local_b8,auVar207);
      auVar20 = vsubps_avx(local_78,auVar300);
      fVar236 = auVar17._0_4_ + auVar20._0_4_;
      fVar237 = auVar17._4_4_ + auVar20._4_4_;
      fVar331 = auVar17._8_4_ + auVar20._8_4_;
      fVar332 = auVar17._12_4_ + auVar20._12_4_;
      fVar333 = auVar17._16_4_ + auVar20._16_4_;
      fVar338 = auVar17._20_4_ + auVar20._20_4_;
      fVar345 = auVar17._24_4_ + auVar20._24_4_;
      fVar186 = auVar20._28_4_;
      auVar36._4_4_ = auVar207._4_4_ * fVar188;
      auVar36._0_4_ = auVar207._0_4_ * fVar187;
      auVar36._8_4_ = auVar207._8_4_ * fVar208;
      auVar36._12_4_ = auVar207._12_4_ * fVar209;
      auVar36._16_4_ = auVar207._16_4_ * fVar211;
      auVar36._20_4_ = auVar207._20_4_ * fVar213;
      auVar36._24_4_ = auVar207._24_4_ * fVar235;
      auVar36._28_4_ = auVar207._28_4_;
      auVar37._4_4_ = local_98._4_4_ * fVar237;
      auVar37._0_4_ = local_98._0_4_ * fVar236;
      auVar37._8_4_ = local_98._8_4_ * fVar331;
      auVar37._12_4_ = local_98._12_4_ * fVar332;
      auVar37._16_4_ = local_98._16_4_ * fVar333;
      auVar37._20_4_ = local_98._20_4_ * fVar338;
      auVar37._24_4_ = local_98._24_4_ * fVar345;
      auVar37._28_4_ = local_98._28_4_;
      auVar20 = vsubps_avx(auVar36,auVar37);
      auVar38._4_4_ = fVar188 * fStack_f4;
      auVar38._0_4_ = fVar187 * local_f8;
      auVar38._8_4_ = fVar208 * fStack_f0;
      auVar38._12_4_ = fVar209 * fStack_ec;
      auVar38._16_4_ = fVar211 * fStack_e8;
      auVar38._20_4_ = fVar213 * fStack_e4;
      auVar38._24_4_ = fVar235 * fStack_e0;
      auVar38._28_4_ = auVar207._28_4_;
      auVar39._4_4_ = fVar237 * fStack_d4;
      auVar39._0_4_ = fVar236 * local_d8;
      auVar39._8_4_ = fVar331 * fStack_d0;
      auVar39._12_4_ = fVar332 * fStack_cc;
      auVar39._16_4_ = fVar333 * fStack_c8;
      auVar39._20_4_ = fVar338 * fStack_c4;
      auVar39._24_4_ = fVar345 * fStack_c0;
      auVar39._28_4_ = fVar186;
      auVar22 = vsubps_avx(auVar38,auVar39);
      auVar40._4_4_ = fVar188 * fStack_4f4;
      auVar40._0_4_ = fVar187 * local_4f8;
      auVar40._8_4_ = fVar208 * fStack_4f0;
      auVar40._12_4_ = fVar209 * fStack_4ec;
      auVar40._16_4_ = fVar211 * fStack_4e8;
      auVar40._20_4_ = fVar213 * fStack_4e4;
      auVar40._24_4_ = fVar235 * fStack_4e0;
      auVar40._28_4_ = fVar186;
      auVar41._4_4_ = fVar237 * fStack_554;
      auVar41._0_4_ = fVar236 * local_558;
      auVar41._8_4_ = fVar331 * fStack_550;
      auVar41._12_4_ = fVar332 * fStack_54c;
      auVar41._16_4_ = fVar333 * fStack_548;
      auVar41._20_4_ = fVar338 * fStack_544;
      auVar41._24_4_ = fVar345 * fStack_540;
      auVar41._28_4_ = auVar16._28_4_;
      auVar108 = vsubps_avx(auVar40,auVar41);
      auVar42._4_4_ = local_b8._4_4_ * fVar188;
      auVar42._0_4_ = local_b8._0_4_ * fVar187;
      auVar42._8_4_ = local_b8._8_4_ * fVar208;
      auVar42._12_4_ = local_b8._12_4_ * fVar209;
      auVar42._16_4_ = local_b8._16_4_ * fVar211;
      auVar42._20_4_ = local_b8._20_4_ * fVar213;
      auVar42._24_4_ = local_b8._24_4_ * fVar235;
      auVar42._28_4_ = auVar16._28_4_;
      auVar43._4_4_ = auVar106._4_4_ * fVar237;
      auVar43._0_4_ = auVar106._0_4_ * fVar236;
      auVar43._8_4_ = auVar106._8_4_ * fVar331;
      auVar43._12_4_ = auVar106._12_4_ * fVar332;
      auVar43._16_4_ = auVar106._16_4_ * fVar333;
      auVar43._20_4_ = auVar106._20_4_ * fVar338;
      uVar3 = auVar106._28_4_;
      auVar43._24_4_ = auVar106._24_4_ * fVar345;
      auVar43._28_4_ = uVar3;
      auVar106 = vsubps_avx(auVar42,auVar43);
      auVar44._4_4_ = auVar300._4_4_ * fVar188;
      auVar44._0_4_ = auVar300._0_4_ * fVar187;
      auVar44._8_4_ = auVar300._8_4_ * fVar208;
      auVar44._12_4_ = auVar300._12_4_ * fVar209;
      auVar44._16_4_ = auVar300._16_4_ * fVar211;
      auVar44._20_4_ = auVar300._20_4_ * fVar213;
      auVar44._24_4_ = auVar300._24_4_ * fVar235;
      auVar44._28_4_ = uVar3;
      auVar45._4_4_ = auVar281._4_4_ * fVar237;
      auVar45._0_4_ = auVar281._0_4_ * fVar236;
      auVar45._8_4_ = auVar281._8_4_ * fVar331;
      auVar45._12_4_ = auVar281._12_4_ * fVar332;
      auVar45._16_4_ = auVar281._16_4_ * fVar333;
      auVar45._20_4_ = auVar281._20_4_ * fVar338;
      auVar45._24_4_ = auVar281._24_4_ * fVar345;
      auVar45._28_4_ = auVar281._28_4_;
      auVar147 = vsubps_avx(auVar44,auVar45);
      auVar46._4_4_ = fVar188 * fStack_134;
      auVar46._0_4_ = fVar187 * local_138;
      auVar46._8_4_ = fVar208 * fStack_130;
      auVar46._12_4_ = fVar209 * fStack_12c;
      auVar46._16_4_ = fVar211 * fStack_128;
      auVar46._20_4_ = fVar213 * fStack_124;
      auVar46._24_4_ = fVar235 * fStack_120;
      auVar46._28_4_ = uVar3;
      auVar47._4_4_ = fVar237 * fStack_114;
      auVar47._0_4_ = fVar236 * local_118;
      auVar47._8_4_ = fVar331 * fStack_110;
      auVar47._12_4_ = fVar332 * fStack_10c;
      auVar47._16_4_ = fVar333 * fStack_108;
      auVar47._20_4_ = fVar338 * fStack_104;
      auVar47._24_4_ = fVar345 * fStack_100;
      auVar47._28_4_ = auVar300._28_4_;
      auVar23 = vsubps_avx(auVar46,auVar47);
      auVar48._4_4_ = fVar188 * auVar21._4_4_;
      auVar48._0_4_ = fVar187 * auVar21._0_4_;
      auVar48._8_4_ = fVar208 * auVar21._8_4_;
      auVar48._12_4_ = fVar209 * auVar21._12_4_;
      auVar48._16_4_ = fVar211 * auVar21._16_4_;
      auVar48._20_4_ = fVar213 * auVar21._20_4_;
      auVar48._24_4_ = fVar235 * auVar21._24_4_;
      auVar48._28_4_ = auVar300._28_4_;
      auVar49._4_4_ = fStack_534 * fVar237;
      auVar49._0_4_ = local_538 * fVar236;
      auVar49._8_4_ = fStack_530 * fVar331;
      auVar49._12_4_ = fStack_52c * fVar332;
      auVar49._16_4_ = fStack_528 * fVar333;
      auVar49._20_4_ = fStack_524 * fVar338;
      auVar49._24_4_ = fStack_520 * fVar345;
      auVar49._28_4_ = local_b8._28_4_;
      auVar21 = vsubps_avx(auVar48,auVar49);
      auVar50._4_4_ = local_78._4_4_ * fVar188;
      auVar50._0_4_ = local_78._0_4_ * fVar187;
      auVar50._8_4_ = local_78._8_4_ * fVar208;
      auVar50._12_4_ = local_78._12_4_ * fVar209;
      auVar50._16_4_ = local_78._16_4_ * fVar211;
      auVar50._20_4_ = local_78._20_4_ * fVar213;
      auVar50._24_4_ = local_78._24_4_ * fVar235;
      auVar50._28_4_ = auVar18._28_4_ + auVar19._28_4_;
      auVar51._4_4_ = auVar107._4_4_ * fVar237;
      auVar51._0_4_ = auVar107._0_4_ * fVar236;
      auVar51._8_4_ = auVar107._8_4_ * fVar331;
      auVar51._12_4_ = auVar107._12_4_ * fVar332;
      auVar51._16_4_ = auVar107._16_4_ * fVar333;
      auVar51._20_4_ = auVar107._20_4_ * fVar338;
      auVar51._24_4_ = auVar107._24_4_ * fVar345;
      auVar51._28_4_ = auVar17._28_4_ + fVar186;
      auVar107 = vsubps_avx(auVar50,auVar51);
      auVar19 = vminps_avx(auVar20,auVar22);
      auVar18 = vmaxps_avx(auVar20,auVar22);
      auVar16 = vminps_avx(auVar108,auVar106);
      auVar16 = vminps_avx(auVar19,auVar16);
      auVar19 = vmaxps_avx(auVar108,auVar106);
      auVar18 = vmaxps_avx(auVar18,auVar19);
      auVar17 = vminps_avx(auVar147,auVar23);
      auVar19 = vmaxps_avx(auVar147,auVar23);
      auVar106 = vminps_avx(auVar21,auVar107);
      auVar17 = vminps_avx(auVar17,auVar106);
      auVar17 = vminps_avx(auVar16,auVar17);
      auVar16 = vmaxps_avx(auVar21,auVar107);
      auVar19 = vmaxps_avx(auVar19,auVar16);
      auVar19 = vmaxps_avx(auVar18,auVar19);
      auVar18 = vcmpps_avx(auVar17,local_228,2);
      auVar19 = vcmpps_avx(auVar19,local_248,5);
      auVar18 = vandps_avx(auVar19,auVar18);
      auVar105 = vandps_avx(local_158,auVar105);
      auVar19 = auVar105 & auVar18;
      if ((((((((auVar19 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar19 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar19 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar19 >> 0x7f,0) != '\0') ||
            (auVar19 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar19 >> 0xbf,0) != '\0') ||
          (auVar19 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar19[0x1f] < '\0') {
        auVar105 = vandps_avx(auVar18,auVar105);
        uVar70 = vmovmskps_avx(auVar105);
        if (uVar70 != 0) {
          uVar67 = (ulong)uVar71;
          auStack_388[uVar67] = uVar70 & 0xff;
          uVar4 = vmovlps_avx(auVar113);
          *(undefined8 *)(afStack_208 + uVar67 * 2) = uVar4;
          uVar65 = vmovlps_avx(auVar74);
          auStack_58[uVar67] = uVar65;
          uVar71 = uVar71 + 1;
        }
      }
    }
    if (uVar71 != 0) {
      do {
        uVar67 = (ulong)(uVar71 - 1);
        uVar70 = auStack_388[uVar67];
        fVar186 = afStack_208[uVar67 * 2];
        fVar187 = afStack_208[uVar67 * 2 + 1];
        auVar317._8_8_ = 0;
        auVar317._0_8_ = auStack_58[uVar67];
        auVar323 = ZEXT1664(auVar317);
        uVar65 = 0;
        if (uVar70 != 0) {
          for (; (uVar70 >> uVar65 & 1) == 0; uVar65 = uVar65 + 1) {
          }
        }
        uVar70 = uVar70 - 1 & uVar70;
        auStack_388[uVar67] = uVar70;
        if (uVar70 == 0) {
          uVar71 = uVar71 - 1;
        }
        fVar208 = (float)(uVar65 + 1) * 0.14285715;
        fVar188 = (1.0 - (float)uVar65 * 0.14285715) * fVar186 +
                  fVar187 * (float)uVar65 * 0.14285715;
        fVar186 = (1.0 - fVar208) * fVar186 + fVar187 * fVar208;
        fVar187 = fVar186 - fVar188;
        if (0.16666667 <= fVar187) {
          auVar83 = vinsertps_avx(ZEXT416((uint)fVar188),ZEXT416((uint)fVar186),0x10);
          auVar363 = ZEXT1664(auVar83);
          goto LAB_00f86099;
        }
        auVar83 = vshufps_avx(auVar317,auVar317,0x50);
        auVar130._8_4_ = 0x3f800000;
        auVar130._0_8_ = 0x3f8000003f800000;
        auVar130._12_4_ = 0x3f800000;
        auVar119 = vsubps_avx(auVar130,auVar83);
        fVar208 = auVar83._0_4_;
        fVar209 = auVar83._4_4_;
        fVar211 = auVar83._8_4_;
        fVar213 = auVar83._12_4_;
        fVar235 = auVar119._0_4_;
        fVar236 = auVar119._4_4_;
        fVar237 = auVar119._8_4_;
        fVar331 = auVar119._12_4_;
        auVar167._0_4_ = fVar208 * auVar287._0_4_ + fVar235 * fVar252;
        auVar167._4_4_ = fVar209 * auVar287._4_4_ + fVar236 * fVar212;
        auVar167._8_4_ = fVar211 * auVar287._0_4_ + fVar237 * fVar252;
        auVar167._12_4_ = fVar213 * auVar287._4_4_ + fVar331 * fVar212;
        auVar223._0_4_ = fVar208 * auVar295._0_4_ + fVar235 * auVar351._0_4_;
        auVar223._4_4_ = fVar209 * auVar295._4_4_ + fVar236 * auVar351._4_4_;
        auVar223._8_4_ = fVar211 * auVar295._0_4_ + fVar237 * auVar351._0_4_;
        auVar223._12_4_ = fVar213 * auVar295._4_4_ + fVar331 * auVar351._4_4_;
        auVar242._0_4_ = fVar208 * auVar311._0_4_ + auVar343._0_4_ * fVar235;
        auVar242._4_4_ = fVar209 * auVar311._4_4_ + auVar343._4_4_ * fVar236;
        auVar242._8_4_ = fVar211 * auVar311._0_4_ + auVar343._0_4_ * fVar237;
        auVar242._12_4_ = fVar213 * auVar311._4_4_ + auVar343._4_4_ * fVar331;
        auVar90._0_4_ = auVar88._0_4_ * fVar208 + auVar129._0_4_ * fVar235;
        auVar90._4_4_ = auVar88._4_4_ * fVar209 + auVar129._4_4_ * fVar236;
        auVar90._8_4_ = auVar88._0_4_ * fVar211 + auVar129._0_4_ * fVar237;
        auVar90._12_4_ = auVar88._4_4_ * fVar213 + auVar129._4_4_ * fVar331;
        auVar148._16_16_ = auVar167;
        auVar148._0_16_ = auVar167;
        auVar184._16_16_ = auVar223;
        auVar184._0_16_ = auVar223;
        auVar234._16_16_ = auVar242;
        auVar234._0_16_ = auVar242;
        auVar105 = ZEXT2032(CONCAT416(fVar186,ZEXT416((uint)fVar188)));
        auVar105 = vshufps_avx(auVar105,auVar105,0);
        auVar18 = vsubps_avx(auVar184,auVar148);
        fVar208 = auVar105._0_4_;
        fVar209 = auVar105._4_4_;
        fVar211 = auVar105._8_4_;
        fVar213 = auVar105._12_4_;
        fVar235 = auVar105._16_4_;
        fVar236 = auVar105._20_4_;
        fVar237 = auVar105._24_4_;
        auVar149._0_4_ = auVar167._0_4_ + auVar18._0_4_ * fVar208;
        auVar149._4_4_ = auVar167._4_4_ + auVar18._4_4_ * fVar209;
        auVar149._8_4_ = auVar167._8_4_ + auVar18._8_4_ * fVar211;
        auVar149._12_4_ = auVar167._12_4_ + auVar18._12_4_ * fVar213;
        auVar149._16_4_ = auVar167._0_4_ + auVar18._16_4_ * fVar235;
        auVar149._20_4_ = auVar167._4_4_ + auVar18._20_4_ * fVar236;
        auVar149._24_4_ = auVar167._8_4_ + auVar18._24_4_ * fVar237;
        auVar149._28_4_ = auVar167._12_4_ + auVar18._28_4_;
        auVar105 = vsubps_avx(auVar234,auVar184);
        auVar185._0_4_ = auVar223._0_4_ + auVar105._0_4_ * fVar208;
        auVar185._4_4_ = auVar223._4_4_ + auVar105._4_4_ * fVar209;
        auVar185._8_4_ = auVar223._8_4_ + auVar105._8_4_ * fVar211;
        auVar185._12_4_ = auVar223._12_4_ + auVar105._12_4_ * fVar213;
        auVar185._16_4_ = auVar223._0_4_ + auVar105._16_4_ * fVar235;
        auVar185._20_4_ = auVar223._4_4_ + auVar105._20_4_ * fVar236;
        auVar185._24_4_ = auVar223._8_4_ + auVar105._24_4_ * fVar237;
        auVar185._28_4_ = auVar223._12_4_ + auVar105._28_4_;
        auVar83 = vsubps_avx(auVar90,auVar242);
        auVar109._0_4_ = auVar242._0_4_ + auVar83._0_4_ * fVar208;
        auVar109._4_4_ = auVar242._4_4_ + auVar83._4_4_ * fVar209;
        auVar109._8_4_ = auVar242._8_4_ + auVar83._8_4_ * fVar211;
        auVar109._12_4_ = auVar242._12_4_ + auVar83._12_4_ * fVar213;
        auVar109._16_4_ = auVar242._0_4_ + auVar83._0_4_ * fVar235;
        auVar109._20_4_ = auVar242._4_4_ + auVar83._4_4_ * fVar236;
        auVar109._24_4_ = auVar242._8_4_ + auVar83._8_4_ * fVar237;
        auVar109._28_4_ = auVar242._12_4_ + auVar83._12_4_;
        auVar105 = vsubps_avx(auVar185,auVar149);
        auVar150._0_4_ = auVar149._0_4_ + fVar208 * auVar105._0_4_;
        auVar150._4_4_ = auVar149._4_4_ + fVar209 * auVar105._4_4_;
        auVar150._8_4_ = auVar149._8_4_ + fVar211 * auVar105._8_4_;
        auVar150._12_4_ = auVar149._12_4_ + fVar213 * auVar105._12_4_;
        auVar150._16_4_ = auVar149._16_4_ + fVar235 * auVar105._16_4_;
        auVar150._20_4_ = auVar149._20_4_ + fVar236 * auVar105._20_4_;
        auVar150._24_4_ = auVar149._24_4_ + fVar237 * auVar105._24_4_;
        auVar150._28_4_ = auVar149._28_4_ + auVar105._28_4_;
        auVar105 = vsubps_avx(auVar109,auVar185);
        auVar110._0_4_ = auVar185._0_4_ + fVar208 * auVar105._0_4_;
        auVar110._4_4_ = auVar185._4_4_ + fVar209 * auVar105._4_4_;
        auVar110._8_4_ = auVar185._8_4_ + fVar211 * auVar105._8_4_;
        auVar110._12_4_ = auVar185._12_4_ + fVar213 * auVar105._12_4_;
        auVar110._16_4_ = auVar185._16_4_ + fVar235 * auVar105._16_4_;
        auVar110._20_4_ = auVar185._20_4_ + fVar236 * auVar105._20_4_;
        auVar110._24_4_ = auVar185._24_4_ + fVar237 * auVar105._24_4_;
        auVar110._28_4_ = auVar185._28_4_ + auVar105._28_4_;
        auVar105 = vsubps_avx(auVar110,auVar150);
        auVar257._0_4_ = auVar150._0_4_ + fVar208 * auVar105._0_4_;
        auVar257._4_4_ = auVar150._4_4_ + fVar209 * auVar105._4_4_;
        auVar257._8_4_ = auVar150._8_4_ + fVar211 * auVar105._8_4_;
        auVar257._12_4_ = auVar150._12_4_ + fVar213 * auVar105._12_4_;
        auVar262._16_4_ = auVar150._16_4_ + fVar235 * auVar105._16_4_;
        auVar262._0_16_ = auVar257;
        auVar262._20_4_ = auVar150._20_4_ + fVar236 * auVar105._20_4_;
        auVar262._24_4_ = auVar150._24_4_ + fVar237 * auVar105._24_4_;
        auVar262._28_4_ = auVar150._28_4_ + auVar185._28_4_;
        auVar265 = auVar262._16_16_;
        auVar132 = vshufps_avx(ZEXT416((uint)(fVar187 * 0.33333334)),
                               ZEXT416((uint)(fVar187 * 0.33333334)),0);
        auVar224._0_4_ = auVar257._0_4_ + auVar132._0_4_ * auVar105._0_4_ * 3.0;
        auVar224._4_4_ = auVar257._4_4_ + auVar132._4_4_ * auVar105._4_4_ * 3.0;
        auVar224._8_4_ = auVar257._8_4_ + auVar132._8_4_ * auVar105._8_4_ * 3.0;
        auVar224._12_4_ = auVar257._12_4_ + auVar132._12_4_ * auVar105._12_4_ * 3.0;
        auVar183 = vshufpd_avx(auVar257,auVar257,3);
        auVar143 = vshufpd_avx(auVar265,auVar265,3);
        auVar83 = vsubps_avx(auVar183,auVar257);
        auVar119 = vsubps_avx(auVar143,auVar265);
        auVar91._0_4_ = auVar83._0_4_ + auVar119._0_4_;
        auVar91._4_4_ = auVar83._4_4_ + auVar119._4_4_;
        auVar91._8_4_ = auVar83._8_4_ + auVar119._8_4_;
        auVar91._12_4_ = auVar83._12_4_ + auVar119._12_4_;
        auVar83 = vmovshdup_avx(auVar257);
        auVar119 = vmovshdup_avx(auVar224);
        auVar169 = vshufps_avx(auVar91,auVar91,0);
        auVar82 = vshufps_avx(auVar91,auVar91,0x55);
        fVar208 = auVar82._0_4_;
        fVar209 = auVar82._4_4_;
        fVar211 = auVar82._8_4_;
        fVar213 = auVar82._12_4_;
        fVar235 = auVar169._0_4_;
        fVar236 = auVar169._4_4_;
        fVar237 = auVar169._8_4_;
        fVar331 = auVar169._12_4_;
        auVar92._0_4_ = fVar235 * auVar257._0_4_ + auVar83._0_4_ * fVar208;
        auVar92._4_4_ = fVar236 * auVar257._4_4_ + auVar83._4_4_ * fVar209;
        auVar92._8_4_ = fVar237 * auVar257._8_4_ + auVar83._8_4_ * fVar211;
        auVar92._12_4_ = fVar331 * auVar257._12_4_ + auVar83._12_4_ * fVar213;
        auVar318._0_4_ = fVar235 * auVar224._0_4_ + auVar119._0_4_ * fVar208;
        auVar318._4_4_ = fVar236 * auVar224._4_4_ + auVar119._4_4_ * fVar209;
        auVar318._8_4_ = fVar237 * auVar224._8_4_ + auVar119._8_4_ * fVar211;
        auVar318._12_4_ = fVar331 * auVar224._12_4_ + auVar119._12_4_ * fVar213;
        auVar119 = vshufps_avx(auVar92,auVar92,0xe8);
        auVar169 = vshufps_avx(auVar318,auVar318,0xe8);
        auVar83 = vcmpps_avx(auVar119,auVar169,1);
        uVar70 = vextractps_avx(auVar83,0);
        auVar82 = auVar318;
        if ((uVar70 & 1) == 0) {
          auVar82 = auVar92;
        }
        auVar131._0_4_ = auVar132._0_4_ * auVar105._16_4_ * 3.0;
        auVar131._4_4_ = auVar132._4_4_ * auVar105._20_4_ * 3.0;
        auVar131._8_4_ = auVar132._8_4_ * auVar105._24_4_ * 3.0;
        auVar131._12_4_ = auVar132._12_4_ * 0.0;
        auVar73 = vsubps_avx(auVar265,auVar131);
        auVar132 = vmovshdup_avx(auVar73);
        auVar265 = vmovshdup_avx(auVar265);
        fVar332 = auVar73._0_4_;
        fVar333 = auVar73._4_4_;
        auVar243._0_4_ = fVar332 * fVar235 + auVar132._0_4_ * fVar208;
        auVar243._4_4_ = fVar333 * fVar236 + auVar132._4_4_ * fVar209;
        auVar243._8_4_ = auVar73._8_4_ * fVar237 + auVar132._8_4_ * fVar211;
        auVar243._12_4_ = auVar73._12_4_ * fVar331 + auVar132._12_4_ * fVar213;
        auVar362._0_4_ = fVar235 * auVar262._16_4_ + auVar265._0_4_ * fVar208;
        auVar362._4_4_ = fVar236 * auVar262._20_4_ + auVar265._4_4_ * fVar209;
        auVar362._8_4_ = fVar237 * auVar262._24_4_ + auVar265._8_4_ * fVar211;
        auVar362._12_4_ = fVar331 * auVar262._28_4_ + auVar265._12_4_ * fVar213;
        auVar265 = vshufps_avx(auVar243,auVar243,0xe8);
        auVar72 = vshufps_avx(auVar362,auVar362,0xe8);
        auVar132 = vcmpps_avx(auVar265,auVar72,1);
        uVar70 = vextractps_avx(auVar132,0);
        auVar74 = auVar362;
        if ((uVar70 & 1) == 0) {
          auVar74 = auVar243;
        }
        auVar82 = vmaxss_avx(auVar74,auVar82);
        auVar119 = vminps_avx(auVar119,auVar169);
        auVar169 = vminps_avx(auVar265,auVar72);
        auVar169 = vminps_avx(auVar119,auVar169);
        auVar83 = vshufps_avx(auVar83,auVar83,0x55);
        auVar83 = vblendps_avx(auVar83,auVar132,2);
        auVar132 = vpslld_avx(auVar83,0x1f);
        auVar83 = vshufpd_avx(auVar318,auVar318,1);
        auVar83 = vinsertps_avx(auVar83,auVar362,0x9c);
        auVar119 = vshufpd_avx(auVar92,auVar92,1);
        auVar119 = vinsertps_avx(auVar119,auVar243,0x9c);
        auVar83 = vblendvps_avx(auVar119,auVar83,auVar132);
        auVar119 = vmovshdup_avx(auVar83);
        auVar83 = vmaxss_avx(auVar119,auVar83);
        fVar211 = auVar169._0_4_;
        auVar119 = vmovshdup_avx(auVar169);
        fVar209 = auVar83._0_4_;
        fVar213 = auVar119._0_4_;
        fVar208 = auVar82._0_4_;
        if ((0.0001 <= fVar211) || (fVar209 <= -0.0001)) {
          if ((fVar213 < 0.0001 && -0.0001 < fVar208) || (fVar211 < 0.0001 && -0.0001 < fVar208))
          goto LAB_00f86a9f;
          auVar132 = vcmpps_avx(SUB6416(ZEXT464(0xb8d1b717),0),auVar83,1);
          auVar119 = vcmpps_avx(auVar119,SUB6416(ZEXT464(0x38d1b717),0),1);
          auVar119 = vandps_avx(auVar119,auVar132);
          if ((auVar119 & (undefined1  [16])0x1) != (undefined1  [16])0x0) goto LAB_00f86a9f;
        }
        else {
LAB_00f86a9f:
          auVar132 = vcmpps_avx(auVar169,_DAT_01f7aa10,1);
          auVar119 = vcmpss_avx(auVar82,ZEXT416(0) << 0x20,1);
          auVar168._8_4_ = 0x3f800000;
          auVar168._0_8_ = 0x3f8000003f800000;
          auVar168._12_4_ = 0x3f800000;
          auVar225._8_4_ = 0xbf800000;
          auVar225._0_8_ = 0xbf800000bf800000;
          auVar225._12_4_ = 0xbf800000;
          auVar119 = vblendvps_avx(auVar168,auVar225,auVar119);
          auVar132 = vblendvps_avx(auVar168,auVar225,auVar132);
          auVar169 = vcmpss_avx(auVar132,auVar119,4);
          auVar169 = vpshufd_avx(ZEXT416(auVar169._0_4_ & 1),0x50);
          auVar169 = vpslld_avx(auVar169,0x1f);
          auVar169 = vpsrad_avx(auVar169,0x1f);
          auVar169 = vpandn_avx(auVar169,_DAT_01fafeb0);
          auVar82 = vmovshdup_avx(auVar132);
          fVar235 = auVar82._0_4_;
          if ((auVar132._0_4_ != fVar235) || (NAN(auVar132._0_4_) || NAN(fVar235))) {
            if ((fVar213 != fVar211) || (NAN(fVar213) || NAN(fVar211))) {
              fVar211 = -fVar211 / (fVar213 - fVar211);
              auVar132 = vmovsldup_avx(ZEXT416((uint)((1.0 - fVar211) * 0.0 + fVar211)));
            }
            else {
              auVar132 = ZEXT816(0x3f80000000000000);
              if ((fVar211 != 0.0) || (NAN(fVar211))) {
                auVar132 = ZEXT816(0xff8000007f800000);
              }
            }
            auVar265 = vcmpps_avx(auVar169,auVar132,1);
            auVar82 = vblendps_avx(auVar169,auVar132,2);
            auVar132 = vblendps_avx(auVar132,auVar169,2);
            auVar169 = vblendvps_avx(auVar132,auVar82,auVar265);
          }
          auVar83 = vcmpss_avx(auVar83,ZEXT416(0) << 0x20,1);
          auVar170._8_4_ = 0x3f800000;
          auVar170._0_8_ = 0x3f8000003f800000;
          auVar170._12_4_ = 0x3f800000;
          auVar226._8_4_ = 0xbf800000;
          auVar226._0_8_ = 0xbf800000bf800000;
          auVar226._12_4_ = 0xbf800000;
          auVar83 = vblendvps_avx(auVar170,auVar226,auVar83);
          fVar211 = auVar83._0_4_;
          if ((auVar119._0_4_ != fVar211) || (NAN(auVar119._0_4_) || NAN(fVar211))) {
            if ((fVar209 != fVar208) || (NAN(fVar209) || NAN(fVar208))) {
              fVar208 = -fVar208 / (fVar209 - fVar208);
              auVar83 = vmovsldup_avx(ZEXT416((uint)((1.0 - fVar208) * 0.0 + fVar208)));
            }
            else {
              auVar83 = ZEXT816(0x3f80000000000000);
              if ((fVar208 != 0.0) || (NAN(fVar208))) {
                auVar83 = ZEXT816(0xff8000007f800000);
              }
            }
            auVar132 = vcmpps_avx(auVar169,auVar83,1);
            auVar119 = vblendps_avx(auVar169,auVar83,2);
            auVar83 = vblendps_avx(auVar83,auVar169,2);
            auVar169 = vblendvps_avx(auVar83,auVar119,auVar132);
          }
          if ((fVar235 != fVar211) || (NAN(fVar235) || NAN(fVar211))) {
            auVar93._8_4_ = 0x3f800000;
            auVar93._0_8_ = 0x3f8000003f800000;
            auVar93._12_4_ = 0x3f800000;
            auVar83 = vcmpps_avx(auVar169,auVar93,1);
            auVar119 = vinsertps_avx(auVar169,SUB6416(ZEXT464(0x3f800000),0),0x10);
            auVar171._4_12_ = auVar169._4_12_;
            auVar171._0_4_ = 0x3f800000;
            auVar169 = vblendvps_avx(auVar171,auVar119,auVar83);
          }
          auVar83 = vcmpps_avx(auVar169,_DAT_01f7b6f0,1);
          auVar54._12_4_ = 0;
          auVar54._0_12_ = auVar169._4_12_;
          auVar119 = vinsertps_avx(auVar169,ZEXT416(0x3f800000),0x10);
          auVar83 = vblendvps_avx(auVar119,auVar54 << 0x20,auVar83);
          auVar119 = vmovshdup_avx(auVar83);
          if (auVar83._0_4_ <= auVar119._0_4_) {
            auVar94._0_4_ = auVar83._0_4_ + -0.1;
            auVar94._4_4_ = auVar83._4_4_ + 0.1;
            auVar94._8_4_ = auVar83._8_4_ + 0.0;
            auVar94._12_4_ = auVar83._12_4_ + 0.0;
            auVar132 = vshufpd_avx(auVar224,auVar224,3);
            auVar258._8_8_ = 0x3f80000000000000;
            auVar258._0_8_ = 0x3f80000000000000;
            auVar83 = vcmpps_avx(auVar94,auVar258,1);
            auVar52._12_4_ = 0;
            auVar52._0_12_ = auVar94._4_12_;
            auVar119 = vinsertps_avx(auVar94,SUB6416(ZEXT464(0x3f800000),0),0x10);
            auVar83 = vblendvps_avx(auVar119,auVar52 << 0x20,auVar83);
            auVar119 = vshufpd_avx(auVar73,auVar73,3);
            auVar169 = vshufps_avx(auVar83,auVar83,0x50);
            auVar259._8_4_ = 0x3f800000;
            auVar259._0_8_ = 0x3f8000003f800000;
            auVar259._12_4_ = 0x3f800000;
            auVar82 = vsubps_avx(auVar259,auVar169);
            local_518._0_4_ = auVar183._0_4_;
            local_518._4_4_ = auVar183._4_4_;
            fStack_510 = auVar183._8_4_;
            fStack_50c = auVar183._12_4_;
            fVar208 = auVar169._0_4_;
            fVar209 = auVar169._4_4_;
            fVar211 = auVar169._8_4_;
            fVar213 = auVar169._12_4_;
            local_588 = auVar143._0_4_;
            fStack_584 = auVar143._4_4_;
            fStack_580 = auVar143._8_4_;
            fStack_57c = auVar143._12_4_;
            fVar235 = auVar82._0_4_;
            fVar236 = auVar82._4_4_;
            fVar237 = auVar82._8_4_;
            fVar331 = auVar82._12_4_;
            auVar95._0_4_ = fVar208 * (float)local_518._0_4_ + fVar235 * auVar257._0_4_;
            auVar95._4_4_ = fVar209 * (float)local_518._4_4_ + fVar236 * auVar257._4_4_;
            auVar95._8_4_ = fVar211 * fStack_510 + fVar237 * auVar257._0_4_;
            auVar95._12_4_ = fVar213 * fStack_50c + fVar331 * auVar257._4_4_;
            auVar244._0_4_ = auVar132._0_4_ * fVar208 + fVar235 * auVar224._0_4_;
            auVar244._4_4_ = auVar132._4_4_ * fVar209 + fVar236 * auVar224._4_4_;
            auVar244._8_4_ = auVar132._8_4_ * fVar211 + fVar237 * auVar224._0_4_;
            auVar244._12_4_ = auVar132._12_4_ * fVar213 + fVar331 * auVar224._4_4_;
            auVar279._0_4_ = auVar119._0_4_ * fVar208 + fVar235 * fVar332;
            auVar279._4_4_ = auVar119._4_4_ * fVar209 + fVar236 * fVar333;
            auVar279._8_4_ = auVar119._8_4_ * fVar211 + fVar237 * fVar332;
            auVar279._12_4_ = auVar119._12_4_ * fVar213 + fVar331 * fVar333;
            auVar312._0_4_ = fVar208 * local_588 + fVar235 * auVar262._16_4_;
            auVar312._4_4_ = fVar209 * fStack_584 + fVar236 * auVar262._20_4_;
            auVar312._8_4_ = fVar211 * fStack_580 + fVar237 * auVar262._16_4_;
            auVar312._12_4_ = fVar213 * fStack_57c + fVar331 * auVar262._20_4_;
            auVar143 = vsubps_avx(auVar259,auVar83);
            auVar119 = vmovshdup_avx(auVar317);
            auVar183 = vmovsldup_avx(auVar317);
            auVar260._0_4_ = auVar143._0_4_ * auVar183._0_4_ + auVar83._0_4_ * auVar119._0_4_;
            auVar260._4_4_ = auVar143._4_4_ * auVar183._4_4_ + auVar83._4_4_ * auVar119._4_4_;
            auVar260._8_4_ = auVar143._8_4_ * auVar183._8_4_ + auVar83._8_4_ * auVar119._8_4_;
            auVar260._12_4_ = auVar143._12_4_ * auVar183._12_4_ + auVar83._12_4_ * auVar119._12_4_;
            auVar73 = vmovshdup_avx(auVar260);
            auVar83 = vsubps_avx(auVar244,auVar95);
            auVar172._0_4_ = auVar83._0_4_ * 3.0;
            auVar172._4_4_ = auVar83._4_4_ * 3.0;
            auVar172._8_4_ = auVar83._8_4_ * 3.0;
            auVar172._12_4_ = auVar83._12_4_ * 3.0;
            auVar83 = vsubps_avx(auVar279,auVar244);
            auVar204._0_4_ = auVar83._0_4_ * 3.0;
            auVar204._4_4_ = auVar83._4_4_ * 3.0;
            auVar204._8_4_ = auVar83._8_4_ * 3.0;
            auVar204._12_4_ = auVar83._12_4_ * 3.0;
            auVar83 = vsubps_avx(auVar312,auVar279);
            auVar288._0_4_ = auVar83._0_4_ * 3.0;
            auVar288._4_4_ = auVar83._4_4_ * 3.0;
            auVar288._8_4_ = auVar83._8_4_ * 3.0;
            auVar288._12_4_ = auVar83._12_4_ * 3.0;
            auVar119 = vminps_avx(auVar204,auVar288);
            auVar83 = vmaxps_avx(auVar204,auVar288);
            auVar119 = vminps_avx(auVar172,auVar119);
            auVar83 = vmaxps_avx(auVar172,auVar83);
            auVar183 = vshufpd_avx(auVar119,auVar119,3);
            auVar143 = vshufpd_avx(auVar83,auVar83,3);
            auVar119 = vminps_avx(auVar119,auVar183);
            auVar83 = vmaxps_avx(auVar83,auVar143);
            auVar183 = vshufps_avx(ZEXT416((uint)(1.0 / fVar187)),ZEXT416((uint)(1.0 / fVar187)),0);
            auVar289._0_4_ = auVar183._0_4_ * auVar119._0_4_;
            auVar289._4_4_ = auVar183._4_4_ * auVar119._4_4_;
            auVar289._8_4_ = auVar183._8_4_ * auVar119._8_4_;
            auVar289._12_4_ = auVar183._12_4_ * auVar119._12_4_;
            auVar296._0_4_ = auVar183._0_4_ * auVar83._0_4_;
            auVar296._4_4_ = auVar183._4_4_ * auVar83._4_4_;
            auVar296._8_4_ = auVar183._8_4_ * auVar83._8_4_;
            auVar296._12_4_ = auVar183._12_4_ * auVar83._12_4_;
            auVar82 = ZEXT416((uint)(1.0 / (auVar73._0_4_ - auVar260._0_4_)));
            auVar83 = vshufpd_avx(auVar95,auVar95,3);
            auVar119 = vshufpd_avx(auVar244,auVar244,3);
            auVar183 = vshufpd_avx(auVar279,auVar279,3);
            auVar143 = vshufpd_avx(auVar312,auVar312,3);
            auVar83 = vsubps_avx(auVar83,auVar95);
            auVar132 = vsubps_avx(auVar119,auVar244);
            auVar169 = vsubps_avx(auVar183,auVar279);
            auVar143 = vsubps_avx(auVar143,auVar312);
            auVar119 = vminps_avx(auVar83,auVar132);
            auVar83 = vmaxps_avx(auVar83,auVar132);
            auVar183 = vminps_avx(auVar169,auVar143);
            auVar183 = vminps_avx(auVar119,auVar183);
            auVar119 = vmaxps_avx(auVar169,auVar143);
            auVar83 = vmaxps_avx(auVar83,auVar119);
            auVar119 = vshufps_avx(auVar82,auVar82,0);
            auVar344._0_4_ = auVar119._0_4_ * auVar183._0_4_;
            auVar344._4_4_ = auVar119._4_4_ * auVar183._4_4_;
            auVar344._8_4_ = auVar119._8_4_ * auVar183._8_4_;
            auVar344._12_4_ = auVar119._12_4_ * auVar183._12_4_;
            auVar353._0_4_ = auVar119._0_4_ * auVar83._0_4_;
            auVar353._4_4_ = auVar119._4_4_ * auVar83._4_4_;
            auVar353._8_4_ = auVar119._8_4_ * auVar83._8_4_;
            auVar353._12_4_ = auVar119._12_4_ * auVar83._12_4_;
            auVar83 = vmovsldup_avx(auVar260);
            auVar313._4_12_ = auVar83._4_12_;
            auVar313._0_4_ = fVar188;
            auVar319._4_12_ = auVar260._4_12_;
            auVar319._0_4_ = fVar186;
            auVar205._0_4_ = (fVar188 + fVar186) * 0.5;
            auVar205._4_4_ = (auVar83._4_4_ + auVar260._4_4_) * 0.5;
            auVar205._8_4_ = (auVar83._8_4_ + auVar260._8_4_) * 0.5;
            auVar205._12_4_ = (auVar83._12_4_ + auVar260._12_4_) * 0.5;
            auVar83 = vshufps_avx(auVar205,auVar205,0);
            fVar208 = auVar83._0_4_;
            fVar209 = auVar83._4_4_;
            fVar211 = auVar83._8_4_;
            fVar213 = auVar83._12_4_;
            local_5c8._0_4_ = auVar14._0_4_;
            local_5c8._4_4_ = auVar14._4_4_;
            fStack_5c0 = auVar14._8_4_;
            fStack_5bc = auVar14._12_4_;
            auVar133._0_4_ = fVar208 * (float)local_258._0_4_ + (float)local_5c8._0_4_;
            auVar133._4_4_ = fVar209 * (float)local_258._4_4_ + (float)local_5c8._4_4_;
            auVar133._8_4_ = fVar211 * fStack_250 + fStack_5c0;
            auVar133._12_4_ = fVar213 * fStack_24c + fStack_5bc;
            local_5d8 = auVar15._0_4_;
            fStack_5d4 = auVar15._4_4_;
            fStack_5d0 = auVar15._8_4_;
            fStack_5cc = auVar15._12_4_;
            auVar173._0_4_ = fVar208 * (float)local_268._0_4_ + local_5d8;
            auVar173._4_4_ = fVar209 * (float)local_268._4_4_ + fStack_5d4;
            auVar173._8_4_ = fVar211 * fStack_260 + fStack_5d0;
            auVar173._12_4_ = fVar213 * fStack_25c + fStack_5cc;
            local_4d8 = auVar200._0_4_;
            fStack_4d4 = auVar200._4_4_;
            fStack_4d0 = auVar200._8_4_;
            fStack_4cc = auVar200._12_4_;
            auVar245._0_4_ = fVar208 * (float)local_278._0_4_ + local_4d8;
            auVar245._4_4_ = fVar209 * (float)local_278._4_4_ + fStack_4d4;
            auVar245._8_4_ = fVar211 * fStack_270 + fStack_4d0;
            auVar245._12_4_ = fVar213 * fStack_26c + fStack_4cc;
            auVar83 = vsubps_avx(auVar173,auVar133);
            auVar134._0_4_ = auVar133._0_4_ + fVar208 * auVar83._0_4_;
            auVar134._4_4_ = auVar133._4_4_ + fVar209 * auVar83._4_4_;
            auVar134._8_4_ = auVar133._8_4_ + fVar211 * auVar83._8_4_;
            auVar134._12_4_ = auVar133._12_4_ + fVar213 * auVar83._12_4_;
            auVar83 = vsubps_avx(auVar245,auVar173);
            auVar174._0_4_ = auVar173._0_4_ + fVar208 * auVar83._0_4_;
            auVar174._4_4_ = auVar173._4_4_ + fVar209 * auVar83._4_4_;
            auVar174._8_4_ = auVar173._8_4_ + fVar211 * auVar83._8_4_;
            auVar174._12_4_ = auVar173._12_4_ + fVar213 * auVar83._12_4_;
            auVar83 = vsubps_avx(auVar174,auVar134);
            fVar208 = auVar134._0_4_ + fVar208 * auVar83._0_4_;
            fVar209 = auVar134._4_4_ + fVar209 * auVar83._4_4_;
            auVar96._0_8_ = CONCAT44(fVar209,fVar208);
            auVar96._8_4_ = auVar134._8_4_ + fVar211 * auVar83._8_4_;
            auVar96._12_4_ = auVar134._12_4_ + fVar213 * auVar83._12_4_;
            fVar211 = auVar83._0_4_ * 3.0;
            fVar213 = auVar83._4_4_ * 3.0;
            auVar135._0_8_ = CONCAT44(fVar213,fVar211);
            auVar135._8_4_ = auVar83._8_4_ * 3.0;
            auVar135._12_4_ = auVar83._12_4_ * 3.0;
            auVar175._8_8_ = auVar96._0_8_;
            auVar175._0_8_ = auVar96._0_8_;
            auVar83 = vshufpd_avx(auVar96,auVar96,3);
            auVar119 = vshufps_avx(auVar205,auVar205,0x55);
            auVar169 = vsubps_avx(auVar83,auVar175);
            auVar329._0_4_ = auVar169._0_4_ * auVar119._0_4_ + fVar208;
            auVar329._4_4_ = auVar169._4_4_ * auVar119._4_4_ + fVar209;
            auVar329._8_4_ = auVar169._8_4_ * auVar119._8_4_ + fVar208;
            auVar329._12_4_ = auVar169._12_4_ * auVar119._12_4_ + fVar209;
            auVar176._8_8_ = auVar135._0_8_;
            auVar176._0_8_ = auVar135._0_8_;
            auVar83 = vshufpd_avx(auVar135,auVar135,1);
            auVar83 = vsubps_avx(auVar83,auVar176);
            auVar136._0_4_ = auVar83._0_4_ * auVar119._0_4_ + fVar211;
            auVar136._4_4_ = auVar83._4_4_ * auVar119._4_4_ + fVar213;
            auVar136._8_4_ = auVar83._8_4_ * auVar119._8_4_ + fVar211;
            auVar136._12_4_ = auVar83._12_4_ * auVar119._12_4_ + fVar213;
            auVar119 = vmovshdup_avx(auVar136);
            auVar246._0_8_ = auVar119._0_8_ ^ 0x8000000080000000;
            auVar246._8_4_ = auVar119._8_4_ ^ 0x80000000;
            auVar246._12_4_ = auVar119._12_4_ ^ 0x80000000;
            auVar183 = vmovshdup_avx(auVar169);
            auVar83 = vunpcklps_avx(auVar183,auVar246);
            auVar143 = vshufps_avx(auVar83,auVar246,4);
            auVar97._0_8_ = auVar169._0_8_ ^ 0x8000000080000000;
            auVar97._8_4_ = -auVar169._8_4_;
            auVar97._12_4_ = -auVar169._12_4_;
            auVar83 = vmovlhps_avx(auVar97,auVar136);
            auVar132 = vshufps_avx(auVar83,auVar136,8);
            auVar83 = ZEXT416((uint)(auVar136._0_4_ * auVar183._0_4_ -
                                    auVar169._0_4_ * auVar119._0_4_));
            auVar119 = vshufps_avx(auVar83,auVar83,0);
            auVar83 = vdivps_avx(auVar143,auVar119);
            auVar119 = vdivps_avx(auVar132,auVar119);
            auVar132 = vinsertps_avx(auVar289,auVar344,0x1c);
            auVar169 = vinsertps_avx(auVar296,auVar353,0x1c);
            auVar82 = vinsertps_avx(auVar344,auVar289,0x4c);
            auVar265 = vinsertps_avx(auVar353,auVar296,0x4c);
            auVar183 = vmovsldup_avx(auVar83);
            auVar177._0_4_ = auVar183._0_4_ * auVar132._0_4_;
            auVar177._4_4_ = auVar183._4_4_ * auVar132._4_4_;
            auVar177._8_4_ = auVar183._8_4_ * auVar132._8_4_;
            auVar177._12_4_ = auVar183._12_4_ * auVar132._12_4_;
            auVar137._0_4_ = auVar169._0_4_ * auVar183._0_4_;
            auVar137._4_4_ = auVar169._4_4_ * auVar183._4_4_;
            auVar137._8_4_ = auVar169._8_4_ * auVar183._8_4_;
            auVar137._12_4_ = auVar169._12_4_ * auVar183._12_4_;
            auVar143 = vminps_avx(auVar177,auVar137);
            auVar183 = vmaxps_avx(auVar137,auVar177);
            auVar72 = vmovsldup_avx(auVar119);
            auVar354._0_4_ = auVar82._0_4_ * auVar72._0_4_;
            auVar354._4_4_ = auVar82._4_4_ * auVar72._4_4_;
            auVar354._8_4_ = auVar82._8_4_ * auVar72._8_4_;
            auVar354._12_4_ = auVar82._12_4_ * auVar72._12_4_;
            auVar178._0_4_ = auVar265._0_4_ * auVar72._0_4_;
            auVar178._4_4_ = auVar265._4_4_ * auVar72._4_4_;
            auVar178._8_4_ = auVar265._8_4_ * auVar72._8_4_;
            auVar178._12_4_ = auVar265._12_4_ * auVar72._12_4_;
            auVar72 = vminps_avx(auVar354,auVar178);
            auVar227._0_4_ = auVar143._0_4_ + auVar72._0_4_;
            auVar227._4_4_ = auVar143._4_4_ + auVar72._4_4_;
            auVar227._8_4_ = auVar143._8_4_ + auVar72._8_4_;
            auVar227._12_4_ = auVar143._12_4_ + auVar72._12_4_;
            auVar143 = vmaxps_avx(auVar178,auVar354);
            auVar72 = vsubps_avx(auVar313,auVar205);
            auVar74 = vsubps_avx(auVar319,auVar205);
            auVar138._0_4_ = auVar183._0_4_ + auVar143._0_4_;
            auVar138._4_4_ = auVar183._4_4_ + auVar143._4_4_;
            auVar138._8_4_ = auVar183._8_4_ + auVar143._8_4_;
            auVar138._12_4_ = auVar183._12_4_ + auVar143._12_4_;
            auVar179._8_8_ = 0x3f800000;
            auVar179._0_8_ = 0x3f800000;
            auVar183 = vsubps_avx(auVar179,auVar138);
            auVar143 = vsubps_avx(auVar179,auVar227);
            fVar237 = auVar72._0_4_;
            auVar228._0_4_ = fVar237 * auVar183._0_4_;
            fVar331 = auVar72._4_4_;
            auVar228._4_4_ = fVar331 * auVar183._4_4_;
            fVar332 = auVar72._8_4_;
            auVar228._8_4_ = fVar332 * auVar183._8_4_;
            fVar333 = auVar72._12_4_;
            auVar228._12_4_ = fVar333 * auVar183._12_4_;
            fVar211 = auVar74._0_4_;
            auVar139._0_4_ = fVar211 * auVar183._0_4_;
            fVar213 = auVar74._4_4_;
            auVar139._4_4_ = fVar213 * auVar183._4_4_;
            fVar235 = auVar74._8_4_;
            auVar139._8_4_ = fVar235 * auVar183._8_4_;
            fVar236 = auVar74._12_4_;
            auVar139._12_4_ = fVar236 * auVar183._12_4_;
            auVar320._0_4_ = fVar237 * auVar143._0_4_;
            auVar320._4_4_ = fVar331 * auVar143._4_4_;
            auVar320._8_4_ = fVar332 * auVar143._8_4_;
            auVar320._12_4_ = fVar333 * auVar143._12_4_;
            auVar180._0_4_ = fVar211 * auVar143._0_4_;
            auVar180._4_4_ = fVar213 * auVar143._4_4_;
            auVar180._8_4_ = fVar235 * auVar143._8_4_;
            auVar180._12_4_ = fVar236 * auVar143._12_4_;
            auVar183 = vminps_avx(auVar228,auVar320);
            auVar143 = vminps_avx(auVar139,auVar180);
            auVar72 = vminps_avx(auVar183,auVar143);
            auVar183 = vmaxps_avx(auVar320,auVar228);
            auVar143 = vmaxps_avx(auVar180,auVar139);
            auVar74 = vshufps_avx(auVar205,auVar205,0x54);
            auVar143 = vmaxps_avx(auVar143,auVar183);
            auVar113 = vshufps_avx(auVar329,auVar329,0);
            auVar114 = vshufps_avx(auVar329,auVar329,0x55);
            auVar183 = vhaddps_avx(auVar72,auVar72);
            auVar143 = vhaddps_avx(auVar143,auVar143);
            auVar206._0_4_ = auVar113._0_4_ * auVar83._0_4_ + auVar114._0_4_ * auVar119._0_4_;
            auVar206._4_4_ = auVar113._4_4_ * auVar83._4_4_ + auVar114._4_4_ * auVar119._4_4_;
            auVar206._8_4_ = auVar113._8_4_ * auVar83._8_4_ + auVar114._8_4_ * auVar119._8_4_;
            auVar206._12_4_ = auVar113._12_4_ * auVar83._12_4_ + auVar114._12_4_ * auVar119._12_4_;
            auVar72 = vsubps_avx(auVar74,auVar206);
            fVar208 = auVar72._0_4_ + auVar183._0_4_;
            fVar209 = auVar72._0_4_ + auVar143._0_4_;
            auVar183 = vmaxss_avx(ZEXT416((uint)fVar188),ZEXT416((uint)fVar208));
            auVar143 = vminss_avx(ZEXT416((uint)fVar209),ZEXT416((uint)fVar186));
            if (auVar183._0_4_ <= auVar143._0_4_) {
              auVar183 = vmovshdup_avx(auVar83);
              auVar98._0_4_ = auVar183._0_4_ * auVar132._0_4_;
              auVar98._4_4_ = auVar183._4_4_ * auVar132._4_4_;
              auVar98._8_4_ = auVar183._8_4_ * auVar132._8_4_;
              auVar98._12_4_ = auVar183._12_4_ * auVar132._12_4_;
              auVar140._0_4_ = auVar169._0_4_ * auVar183._0_4_;
              auVar140._4_4_ = auVar169._4_4_ * auVar183._4_4_;
              auVar140._8_4_ = auVar169._8_4_ * auVar183._8_4_;
              auVar140._12_4_ = auVar169._12_4_ * auVar183._12_4_;
              auVar143 = vminps_avx(auVar98,auVar140);
              auVar183 = vmaxps_avx(auVar140,auVar98);
              auVar132 = vmovshdup_avx(auVar119);
              auVar229._0_4_ = auVar82._0_4_ * auVar132._0_4_;
              auVar229._4_4_ = auVar82._4_4_ * auVar132._4_4_;
              auVar229._8_4_ = auVar82._8_4_ * auVar132._8_4_;
              auVar229._12_4_ = auVar82._12_4_ * auVar132._12_4_;
              auVar141._0_4_ = auVar265._0_4_ * auVar132._0_4_;
              auVar141._4_4_ = auVar265._4_4_ * auVar132._4_4_;
              auVar141._8_4_ = auVar265._8_4_ * auVar132._8_4_;
              auVar141._12_4_ = auVar265._12_4_ * auVar132._12_4_;
              auVar132 = vminps_avx(auVar229,auVar141);
              auVar181._0_4_ = auVar143._0_4_ + auVar132._0_4_;
              auVar181._4_4_ = auVar143._4_4_ + auVar132._4_4_;
              auVar181._8_4_ = auVar143._8_4_ + auVar132._8_4_;
              auVar181._12_4_ = auVar143._12_4_ + auVar132._12_4_;
              auVar143 = vmaxps_avx(auVar141,auVar229);
              auVar99._0_4_ = auVar183._0_4_ + auVar143._0_4_;
              auVar99._4_4_ = auVar183._4_4_ + auVar143._4_4_;
              auVar99._8_4_ = auVar183._8_4_ + auVar143._8_4_;
              auVar99._12_4_ = auVar183._12_4_ + auVar143._12_4_;
              auVar183 = vsubps_avx(auVar258,auVar99);
              auVar143 = vsubps_avx(auVar258,auVar181);
              auVar182._0_4_ = fVar237 * auVar183._0_4_;
              auVar182._4_4_ = fVar331 * auVar183._4_4_;
              auVar182._8_4_ = fVar332 * auVar183._8_4_;
              auVar182._12_4_ = fVar333 * auVar183._12_4_;
              auVar230._0_4_ = fVar237 * auVar143._0_4_;
              auVar230._4_4_ = fVar331 * auVar143._4_4_;
              auVar230._8_4_ = fVar332 * auVar143._8_4_;
              auVar230._12_4_ = fVar333 * auVar143._12_4_;
              auVar100._0_4_ = fVar211 * auVar183._0_4_;
              auVar100._4_4_ = fVar213 * auVar183._4_4_;
              auVar100._8_4_ = fVar235 * auVar183._8_4_;
              auVar100._12_4_ = fVar236 * auVar183._12_4_;
              auVar142._0_4_ = fVar211 * auVar143._0_4_;
              auVar142._4_4_ = fVar213 * auVar143._4_4_;
              auVar142._8_4_ = fVar235 * auVar143._8_4_;
              auVar142._12_4_ = fVar236 * auVar143._12_4_;
              auVar183 = vminps_avx(auVar182,auVar230);
              auVar143 = vminps_avx(auVar100,auVar142);
              auVar183 = vminps_avx(auVar183,auVar143);
              auVar143 = vmaxps_avx(auVar230,auVar182);
              auVar132 = vmaxps_avx(auVar142,auVar100);
              auVar183 = vhaddps_avx(auVar183,auVar183);
              auVar143 = vmaxps_avx(auVar132,auVar143);
              auVar143 = vhaddps_avx(auVar143,auVar143);
              auVar132 = vmovshdup_avx(auVar72);
              auVar169 = ZEXT416((uint)(auVar132._0_4_ + auVar183._0_4_));
              auVar183 = vmaxss_avx(auVar260,auVar169);
              auVar132 = ZEXT416((uint)(auVar132._0_4_ + auVar143._0_4_));
              auVar143 = vminss_avx(auVar132,auVar73);
              if (auVar183._0_4_ <= auVar143._0_4_) {
                bVar69 = 0;
                if ((fVar188 < fVar208) && (fVar209 < fVar186)) {
                  auVar183 = vcmpps_avx(auVar132,auVar73,1);
                  auVar143 = vcmpps_avx(auVar260,auVar169,1);
                  auVar183 = vandps_avx(auVar143,auVar183);
                  bVar69 = auVar183[0];
                }
                auVar323 = ZEXT1664(auVar260);
                if ((uVar71 < 4 && 0.001 <= fVar187) && (bVar69 & 1) == 0) goto LAB_00f877fc;
                lVar66 = 200;
                do {
                  fVar187 = auVar72._0_4_;
                  fVar186 = 1.0 - fVar187;
                  auVar183 = ZEXT416((uint)(fVar186 * fVar186 * fVar186));
                  auVar183 = vshufps_avx(auVar183,auVar183,0);
                  auVar143 = ZEXT416((uint)(fVar187 * 3.0 * fVar186 * fVar186));
                  auVar143 = vshufps_avx(auVar143,auVar143,0);
                  auVar132 = ZEXT416((uint)(fVar186 * fVar187 * fVar187 * 3.0));
                  auVar132 = vshufps_avx(auVar132,auVar132,0);
                  auVar169 = ZEXT416((uint)(fVar187 * fVar187 * fVar187));
                  auVar169 = vshufps_avx(auVar169,auVar169,0);
                  local_448 = auVar120._0_4_;
                  fStack_444 = auVar120._4_4_;
                  fStack_440 = auVar120._8_4_;
                  fStack_43c = auVar120._12_4_;
                  fVar186 = auVar183._0_4_ * (float)local_5c8._0_4_ +
                            auVar143._0_4_ * local_5d8 +
                            auVar169._0_4_ * local_448 + auVar132._0_4_ * local_4d8;
                  fVar187 = auVar183._4_4_ * (float)local_5c8._4_4_ +
                            auVar143._4_4_ * fStack_5d4 +
                            auVar169._4_4_ * fStack_444 + auVar132._4_4_ * fStack_4d4;
                  auVar101._0_8_ = CONCAT44(fVar187,fVar186);
                  auVar101._8_4_ =
                       auVar183._8_4_ * fStack_5c0 +
                       auVar143._8_4_ * fStack_5d0 +
                       auVar169._8_4_ * fStack_440 + auVar132._8_4_ * fStack_4d0;
                  auVar101._12_4_ =
                       auVar183._12_4_ * fStack_5bc +
                       auVar143._12_4_ * fStack_5cc +
                       auVar169._12_4_ * fStack_43c + auVar132._12_4_ * fStack_4cc;
                  auVar144._8_8_ = auVar101._0_8_;
                  auVar144._0_8_ = auVar101._0_8_;
                  auVar143 = vshufpd_avx(auVar101,auVar101,1);
                  auVar183 = vmovshdup_avx(auVar72);
                  auVar143 = vsubps_avx(auVar143,auVar144);
                  auVar102._0_4_ = auVar183._0_4_ * auVar143._0_4_ + fVar186;
                  auVar102._4_4_ = auVar183._4_4_ * auVar143._4_4_ + fVar187;
                  auVar102._8_4_ = auVar183._8_4_ * auVar143._8_4_ + fVar186;
                  auVar102._12_4_ = auVar183._12_4_ * auVar143._12_4_ + fVar187;
                  auVar183 = vshufps_avx(auVar102,auVar102,0);
                  auVar143 = vshufps_avx(auVar102,auVar102,0x55);
                  auVar145._0_4_ = auVar83._0_4_ * auVar183._0_4_ + auVar119._0_4_ * auVar143._0_4_;
                  auVar145._4_4_ = auVar83._4_4_ * auVar183._4_4_ + auVar119._4_4_ * auVar143._4_4_;
                  auVar145._8_4_ = auVar83._8_4_ * auVar183._8_4_ + auVar119._8_4_ * auVar143._8_4_;
                  auVar145._12_4_ =
                       auVar83._12_4_ * auVar183._12_4_ + auVar119._12_4_ * auVar143._12_4_;
                  auVar72 = vsubps_avx(auVar72,auVar145);
                  auVar146._8_4_ = 0x7fffffff;
                  auVar146._0_8_ = 0x7fffffff7fffffff;
                  auVar146._12_4_ = 0x7fffffff;
                  auVar183 = vandps_avx(auVar102,auVar146);
                  auVar143 = vshufps_avx(auVar183,auVar183,0xf5);
                  auVar183 = vmaxss_avx(auVar143,auVar183);
                  if (auVar183._0_4_ < fVar151) {
                    fVar186 = auVar72._0_4_;
                    if ((0.0 <= fVar186) && (fVar186 <= 1.0)) {
                      auVar83 = vmovshdup_avx(auVar72);
                      fVar187 = auVar83._0_4_;
                      if ((0.0 <= fVar187) && (fVar187 <= 1.0)) {
                        auVar83 = vinsertps_avx(ZEXT416((uint)pre->ray_space[k].vx.field_0.m128[2]),
                                                ZEXT416((uint)pre->ray_space[k].vy.field_0.m128[2]),
                                                0x1c);
                        auVar265 = vinsertps_avx(auVar83,ZEXT416((uint)pre->ray_space[k].vz.field_0.
                                                                       m128[2]),0x28);
                        auVar83 = vdpps_avx(auVar265,local_288,0x7f);
                        auVar119 = vdpps_avx(auVar265,local_298,0x7f);
                        auVar183 = vdpps_avx(auVar265,local_2a8,0x7f);
                        auVar143 = vdpps_avx(auVar265,local_2b8,0x7f);
                        auVar132 = vdpps_avx(auVar265,local_2c8,0x7f);
                        auVar169 = vdpps_avx(auVar265,local_2d8,0x7f);
                        auVar82 = vdpps_avx(auVar265,local_2e8,0x7f);
                        auVar265 = vdpps_avx(auVar265,local_2f8,0x7f);
                        fVar213 = 1.0 - fVar187;
                        fVar235 = 1.0 - fVar186;
                        fVar188 = auVar72._4_4_;
                        fVar208 = auVar72._8_4_;
                        fVar209 = auVar72._12_4_;
                        fVar211 = fVar235 * fVar186 * fVar186 * 3.0;
                        auVar280._0_4_ = fVar186 * fVar186 * fVar186;
                        auVar280._4_4_ = fVar188 * fVar188 * fVar188;
                        auVar280._8_4_ = fVar208 * fVar208 * fVar208;
                        auVar280._12_4_ = fVar209 * fVar209 * fVar209;
                        fVar208 = fVar235 * fVar235 * fVar186 * 3.0;
                        fVar209 = fVar235 * fVar235 * fVar235;
                        fVar188 = fVar209 * (fVar213 * auVar83._0_4_ + fVar187 * auVar132._0_4_) +
                                  (fVar213 * auVar119._0_4_ + auVar169._0_4_ * fVar187) * fVar208 +
                                  fVar211 * (auVar82._0_4_ * fVar187 + fVar213 * auVar183._0_4_) +
                                  auVar280._0_4_ *
                                  (fVar213 * auVar143._0_4_ + fVar187 * auVar265._0_4_);
                        auVar83 = ZEXT416((uint)fVar188);
                        if (((fVar112 <= fVar188) &&
                            (fVar213 = *(float *)(ray + k * 4 + 0x80), fVar188 <= fVar213)) &&
                           (pGVar7 = (context->scene->geometries).items[uVar64].ptr,
                           (pGVar7->mask & *(uint *)(ray + k * 4 + 0x90)) != 0)) {
                          local_1a8 = vshufps_avx(auVar72,auVar72,0x55);
                          auVar297._8_4_ = 0x3f800000;
                          auVar297._0_8_ = 0x3f8000003f800000;
                          auVar297._12_4_ = 0x3f800000;
                          auVar119 = vsubps_avx(auVar297,local_1a8);
                          fVar236 = local_1a8._0_4_;
                          fVar237 = local_1a8._4_4_;
                          fVar331 = local_1a8._8_4_;
                          fVar332 = local_1a8._12_4_;
                          fVar333 = auVar119._0_4_;
                          fVar338 = auVar119._4_4_;
                          fVar345 = auVar119._8_4_;
                          fVar346 = auVar119._12_4_;
                          auVar314._0_4_ = fVar236 * fVar250 + fVar333 * (float)local_398._0_4_;
                          auVar314._4_4_ = fVar237 * fVar210 + fVar338 * (float)local_398._4_4_;
                          auVar314._8_4_ = fVar331 * fVar291 + fVar345 * fStack_390;
                          auVar314._12_4_ = fVar332 * fVar303 + fVar346 * fStack_38c;
                          auVar321._0_4_ = fVar236 * (float)local_3c8._0_4_ + fVar333 * fVar238;
                          auVar321._4_4_ = fVar237 * (float)local_3c8._4_4_ + fVar338 * fVar324;
                          auVar321._8_4_ = fVar331 * fStack_3c0 + fVar345 * fVar264;
                          auVar321._12_4_ = fVar332 * fStack_3bc + fVar346 * fVar301;
                          auVar330._0_4_ = fVar236 * fVar251 + fVar333 * (float)local_3a8._0_4_;
                          auVar330._4_4_ = fVar237 * fVar263 + fVar338 * (float)local_3a8._4_4_;
                          auVar330._8_4_ = fVar331 * fVar111 + fVar345 * fStack_3a0;
                          auVar330._12_4_ = fVar332 * fVar325 + fVar346 * fStack_39c;
                          auVar298._0_4_ = fVar236 * local_3d8 + fVar333 * (float)local_3b8._0_4_;
                          auVar298._4_4_ = fVar237 * fStack_3d4 + fVar338 * (float)local_3b8._4_4_;
                          auVar298._8_4_ = fVar331 * fStack_3d0 + fVar345 * fStack_3b0;
                          auVar298._12_4_ = fVar332 * fStack_3cc + fVar346 * fStack_3ac;
                          auVar132 = vsubps_avx(auVar321,auVar314);
                          auVar169 = vsubps_avx(auVar330,auVar321);
                          auVar82 = vsubps_avx(auVar298,auVar330);
                          local_1b8 = vshufps_avx(auVar72,auVar72,0);
                          fVar332 = local_1b8._0_4_;
                          fVar333 = local_1b8._4_4_;
                          fVar338 = local_1b8._8_4_;
                          fVar345 = local_1b8._12_4_;
                          auVar119 = vshufps_avx(ZEXT416((uint)fVar235),ZEXT416((uint)fVar235),0);
                          fVar235 = auVar119._0_4_;
                          fVar236 = auVar119._4_4_;
                          fVar237 = auVar119._8_4_;
                          fVar331 = auVar119._12_4_;
                          auVar119 = vshufps_avx(auVar280,auVar280,0);
                          auVar183 = vshufps_avx(ZEXT416((uint)fVar211),ZEXT416((uint)fVar211),0);
                          auVar143 = vshufps_avx(ZEXT416((uint)fVar208),ZEXT416((uint)fVar208),0);
                          auVar261._0_4_ =
                               (fVar235 * (fVar235 * auVar132._0_4_ + fVar332 * auVar169._0_4_) +
                               fVar332 * (fVar235 * auVar169._0_4_ + fVar332 * auVar82._0_4_)) * 3.0
                          ;
                          auVar261._4_4_ =
                               (fVar236 * (fVar236 * auVar132._4_4_ + fVar333 * auVar169._4_4_) +
                               fVar333 * (fVar236 * auVar169._4_4_ + fVar333 * auVar82._4_4_)) * 3.0
                          ;
                          auVar261._8_4_ =
                               (fVar237 * (fVar237 * auVar132._8_4_ + fVar338 * auVar169._8_4_) +
                               fVar338 * (fVar237 * auVar169._8_4_ + fVar338 * auVar82._8_4_)) * 3.0
                          ;
                          auVar261._12_4_ =
                               (fVar331 * (fVar331 * auVar132._12_4_ + fVar345 * auVar169._12_4_) +
                               fVar345 * (fVar331 * auVar169._12_4_ + fVar345 * auVar82._12_4_)) *
                               3.0;
                          auVar132 = vshufps_avx(ZEXT416((uint)fVar209),ZEXT416((uint)fVar209),0);
                          auVar231._0_4_ =
                               auVar132._0_4_ * (float)local_318._0_4_ +
                               auVar143._0_4_ * (float)local_328._0_4_ +
                               auVar119._0_4_ * (float)local_348._0_4_ +
                               auVar183._0_4_ * (float)local_338._0_4_;
                          auVar231._4_4_ =
                               auVar132._4_4_ * (float)local_318._4_4_ +
                               auVar143._4_4_ * (float)local_328._4_4_ +
                               auVar119._4_4_ * (float)local_348._4_4_ +
                               auVar183._4_4_ * (float)local_338._4_4_;
                          auVar231._8_4_ =
                               auVar132._8_4_ * fStack_310 +
                               auVar143._8_4_ * fStack_320 +
                               auVar119._8_4_ * fStack_340 + auVar183._8_4_ * fStack_330;
                          auVar231._12_4_ =
                               auVar132._12_4_ * fStack_30c +
                               auVar143._12_4_ * fStack_31c +
                               auVar119._12_4_ * fStack_33c + auVar183._12_4_ * fStack_32c;
                          auVar119 = vshufps_avx(auVar261,auVar261,0xc9);
                          auVar247._0_4_ = auVar231._0_4_ * auVar119._0_4_;
                          auVar247._4_4_ = auVar231._4_4_ * auVar119._4_4_;
                          auVar247._8_4_ = auVar231._8_4_ * auVar119._8_4_;
                          auVar247._12_4_ = auVar231._12_4_ * auVar119._12_4_;
                          auVar119 = vshufps_avx(auVar231,auVar231,0xc9);
                          auVar232._0_4_ = auVar261._0_4_ * auVar119._0_4_;
                          auVar232._4_4_ = auVar261._4_4_ * auVar119._4_4_;
                          auVar232._8_4_ = auVar261._8_4_ * auVar119._8_4_;
                          auVar232._12_4_ = auVar261._12_4_ * auVar119._12_4_;
                          auVar119 = vsubps_avx(auVar232,auVar247);
                          if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                             (pGVar7->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                            *(float *)(ray + k * 4 + 0x80) = fVar188;
                            uVar3 = vextractps_avx(auVar119,1);
                            *(undefined4 *)(ray + k * 4 + 0xc0) = uVar3;
                            uVar3 = vextractps_avx(auVar119,2);
                            *(undefined4 *)(ray + k * 4 + 0xd0) = uVar3;
                            *(int *)(ray + k * 4 + 0xe0) = auVar119._0_4_;
                            *(float *)(ray + k * 4 + 0xf0) = fVar186;
                            *(float *)(ray + k * 4 + 0x100) = fVar187;
                            *(uint *)(ray + k * 4 + 0x110) = uVar6;
                            *(uint *)(ray + k * 4 + 0x120) = uVar64;
                            *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                            *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
                          }
                          else {
                            auVar183 = vshufps_avx(auVar119,auVar119,0x55);
                            auVar143 = vshufps_avx(auVar119,auVar119,0xaa);
                            local_1c8 = vshufps_avx(auVar119,auVar119,0);
                            local_1e8[0] = (RTCHitN)auVar183[0];
                            local_1e8[1] = (RTCHitN)auVar183[1];
                            local_1e8[2] = (RTCHitN)auVar183[2];
                            local_1e8[3] = (RTCHitN)auVar183[3];
                            local_1e8[4] = (RTCHitN)auVar183[4];
                            local_1e8[5] = (RTCHitN)auVar183[5];
                            local_1e8[6] = (RTCHitN)auVar183[6];
                            local_1e8[7] = (RTCHitN)auVar183[7];
                            local_1e8[8] = (RTCHitN)auVar183[8];
                            local_1e8[9] = (RTCHitN)auVar183[9];
                            local_1e8[10] = (RTCHitN)auVar183[10];
                            local_1e8[0xb] = (RTCHitN)auVar183[0xb];
                            local_1e8[0xc] = (RTCHitN)auVar183[0xc];
                            local_1e8[0xd] = (RTCHitN)auVar183[0xd];
                            local_1e8[0xe] = (RTCHitN)auVar183[0xe];
                            local_1e8[0xf] = (RTCHitN)auVar183[0xf];
                            local_1d8 = auVar143;
                            local_198 = local_378._0_8_;
                            uStack_190 = local_378._8_8_;
                            local_188 = local_368._0_8_;
                            uStack_180 = local_368._8_8_;
                            vcmpps_avx(ZEXT832(0) << 0x20,ZEXT832(0) << 0x20,0xf);
                            uStack_174 = context->user->instID[0];
                            local_178 = uStack_174;
                            uStack_170 = uStack_174;
                            uStack_16c = uStack_174;
                            uStack_168 = context->user->instPrimID[0];
                            uStack_164 = uStack_168;
                            uStack_160 = uStack_168;
                            uStack_15c = uStack_168;
                            *(float *)(ray + k * 4 + 0x80) = fVar188;
                            local_438 = *local_420;
                            local_408.valid = (int *)local_438;
                            local_408.geometryUserPtr = pGVar7->userPtr;
                            local_408.context = context->user;
                            local_408.hit = local_1e8;
                            local_408.N = 4;
                            local_408.ray = (RTCRayN *)ray;
                            if (pGVar7->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                              (*pGVar7->intersectionFilterN)(&local_408);
                              auVar323._8_56_ = extraout_var;
                              auVar323._0_8_ = extraout_XMM1_Qa;
                              auVar83 = auVar323._0_16_;
                            }
                            if (local_438 == (undefined1  [16])0x0) {
                              auVar119 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01f7aa10);
                              auVar83 = vpcmpeqd_avx(auVar83,auVar83);
                              auVar119 = auVar119 ^ auVar83;
                            }
                            else {
                              p_Var10 = context->args->filter;
                              auVar83 = vpcmpeqd_avx(auVar143,auVar143);
                              if ((p_Var10 != (RTCFilterFunctionN)0x0) &&
                                 (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER
                                   ) != RTC_RAY_QUERY_FLAG_INCOHERENT ||
                                  (((pGVar7->field_8).field_0x2 & 0x40) != 0)))) {
                                (*p_Var10)(&local_408);
                                auVar83 = vpcmpeqd_avx(auVar83,auVar83);
                              }
                              auVar183 = vpcmpeqd_avx(local_438,_DAT_01f7aa10);
                              auVar119 = auVar183 ^ auVar83;
                              if (local_438 != (undefined1  [16])0x0) {
                                auVar183 = auVar183 ^ auVar83;
                                auVar83 = vmaskmovps_avx(auVar183,*(undefined1 (*) [16])
                                                                   local_408.hit);
                                *(undefined1 (*) [16])(local_408.ray + 0xc0) = auVar83;
                                auVar83 = vmaskmovps_avx(auVar183,*(undefined1 (*) [16])
                                                                   (local_408.hit + 0x10));
                                *(undefined1 (*) [16])(local_408.ray + 0xd0) = auVar83;
                                auVar83 = vmaskmovps_avx(auVar183,*(undefined1 (*) [16])
                                                                   (local_408.hit + 0x20));
                                *(undefined1 (*) [16])(local_408.ray + 0xe0) = auVar83;
                                auVar83 = vmaskmovps_avx(auVar183,*(undefined1 (*) [16])
                                                                   (local_408.hit + 0x30));
                                *(undefined1 (*) [16])(local_408.ray + 0xf0) = auVar83;
                                auVar83 = vmaskmovps_avx(auVar183,*(undefined1 (*) [16])
                                                                   (local_408.hit + 0x40));
                                *(undefined1 (*) [16])(local_408.ray + 0x100) = auVar83;
                                auVar83 = vmaskmovps_avx(auVar183,*(undefined1 (*) [16])
                                                                   (local_408.hit + 0x50));
                                *(undefined1 (*) [16])(local_408.ray + 0x110) = auVar83;
                                auVar83 = vmaskmovps_avx(auVar183,*(undefined1 (*) [16])
                                                                   (local_408.hit + 0x60));
                                *(undefined1 (*) [16])(local_408.ray + 0x120) = auVar83;
                                auVar83 = vmaskmovps_avx(auVar183,*(undefined1 (*) [16])
                                                                   (local_408.hit + 0x70));
                                *(undefined1 (*) [16])(local_408.ray + 0x130) = auVar83;
                                auVar83 = vmaskmovps_avx(auVar183,*(undefined1 (*) [16])
                                                                   (local_408.hit + 0x80));
                                *(undefined1 (*) [16])(local_408.ray + 0x140) = auVar83;
                              }
                            }
                            auVar103._8_8_ = 0x100000001;
                            auVar103._0_8_ = 0x100000001;
                            if ((auVar103 & auVar119) == (undefined1  [16])0x0) {
                              *(float *)(ray + k * 4 + 0x80) = fVar213;
                            }
                          }
                        }
                      }
                    }
                    break;
                  }
                  lVar66 = lVar66 + -1;
                } while (lVar66 != 0);
              }
            }
          }
        }
        if (uVar71 == 0) break;
      } while( true );
    }
    uVar3 = *(undefined4 *)(ray + k * 4 + 0x80);
    auVar104._4_4_ = uVar3;
    auVar104._0_4_ = uVar3;
    auVar104._8_4_ = uVar3;
    auVar104._12_4_ = uVar3;
    auVar83 = vcmpps_avx(local_358,auVar104,2);
    uVar64 = vmovmskps_avx(auVar83);
    uVar63 = uVar63 & uVar63 + 0xf & uVar64;
    auVar53 = ZEXT812(0) << 0x20;
    if (uVar63 == 0) {
      return;
    }
  } while( true );
LAB_00f877fc:
  auVar83 = vinsertps_avx(ZEXT416((uint)fVar188),ZEXT416((uint)fVar186),0x10);
  auVar363 = ZEXT1664(auVar83);
  goto LAB_00f86099;
}

Assistant:

static __forceinline void intersect_hn(Precalculations& pre, RayHitK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          const Vec3fa ray_org(ray.org.x[k], ray.org.y[k], ray.org.z[k]);
          const TensorLinearCubicBezierSurface3fa curve = geom->getNormalOrientedHermiteCurve<typename Intersector::SourceCurve3ff, typename Intersector::SourceCurve3fa, TensorLinearCubicBezierSurface3fa>(context, ray_org, primID,ray.time()[k]);
          Intersector().intersect(pre,ray,k,context,geom,primID,curve,Epilog(ray,k,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
      }